

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

void embree::avx::CurveNiIntersectorK<8,8>::
     intersect_t<embree::avx::SweepCurve1IntersectorK<embree::CatmullRomCurveT,8>,embree::avx::Intersect1KEpilog1<8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  undefined4 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  Primitive PVar6;
  Geometry *pGVar7;
  RTCFilterFunctionN p_Var8;
  RTCRayQueryContext *pRVar9;
  uint uVar10;
  long lVar11;
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [16];
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  bool bVar84;
  undefined1 auVar85 [12];
  bool bVar86;
  bool bVar87;
  bool bVar88;
  bool bVar89;
  bool bVar90;
  bool bVar91;
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  uint uVar108;
  uint uVar109;
  uint uVar110;
  long lVar111;
  ulong uVar112;
  ulong uVar113;
  ulong uVar114;
  bool bVar115;
  float fVar116;
  float fVar146;
  float fVar147;
  __m128 a;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  float fVar148;
  float fVar183;
  float fVar185;
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  float fVar189;
  float fVar190;
  float fVar191;
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  float fVar187;
  undefined1 auVar167 [32];
  float fVar184;
  float fVar186;
  float fVar188;
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  float fVar212;
  float fVar230;
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [28];
  float fVar228;
  float fVar229;
  float fVar231;
  float fVar232;
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  float fVar233;
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  float fVar234;
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar244 [28];
  float fVar249;
  float fVar250;
  float fVar251;
  float fVar252;
  float fVar253;
  float fVar254;
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar248 [32];
  float fVar255;
  float fVar272;
  float fVar273;
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  float fVar275;
  float fVar276;
  float fVar278;
  undefined1 auVar263 [32];
  float fVar274;
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  float fVar277;
  float fVar279;
  undefined1 auVar268 [32];
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  undefined1 auVar281 [16];
  float fVar280;
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  float fVar291;
  float fVar292;
  float fVar295;
  float fVar297;
  float fVar299;
  undefined1 auVar284 [32];
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  float fVar293;
  undefined1 auVar287 [32];
  float fVar294;
  float fVar296;
  float fVar298;
  float fVar300;
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  undefined1 auVar290 [64];
  float fVar301;
  float fVar314;
  float fVar315;
  float fVar317;
  float fVar319;
  float fVar321;
  float fVar323;
  undefined1 auVar302 [32];
  undefined1 auVar303 [32];
  undefined1 auVar304 [32];
  undefined1 auVar305 [32];
  undefined1 auVar306 [32];
  undefined1 auVar307 [32];
  float fVar325;
  undefined1 auVar308 [32];
  float fVar316;
  float fVar318;
  float fVar320;
  float fVar322;
  float fVar324;
  undefined1 auVar309 [32];
  undefined1 auVar310 [32];
  undefined1 auVar311 [32];
  undefined1 auVar312 [32];
  undefined1 auVar313 [32];
  float fVar326;
  float fVar327;
  float fVar328;
  float fVar336;
  float fVar339;
  float fVar342;
  float fVar345;
  float fVar348;
  float fVar351;
  undefined1 auVar329 [32];
  undefined1 auVar330 [32];
  float fVar337;
  float fVar338;
  float fVar340;
  float fVar341;
  float fVar343;
  float fVar344;
  float fVar346;
  float fVar347;
  float fVar349;
  float fVar350;
  float fVar352;
  float fVar353;
  float fVar354;
  undefined1 auVar331 [32];
  undefined1 auVar332 [32];
  undefined1 auVar333 [32];
  undefined1 auVar334 [32];
  undefined1 auVar335 [64];
  float fVar355;
  undefined1 auVar359 [16];
  float fVar356;
  float fVar357;
  float fVar358;
  undefined1 auVar360 [28];
  float fVar365;
  float fVar369;
  float fVar377;
  float fVar381;
  undefined1 auVar361 [32];
  undefined1 auVar362 [32];
  float fVar366;
  float fVar367;
  float fVar368;
  float fVar370;
  float fVar371;
  float fVar372;
  float fVar373;
  float fVar374;
  float fVar375;
  float fVar376;
  float fVar378;
  float fVar379;
  float fVar380;
  float fVar382;
  float fVar383;
  float fVar384;
  float fVar385;
  float fVar386;
  float fVar387;
  float fVar388;
  float fVar389;
  float fVar390;
  float fVar391;
  float fVar392;
  undefined1 auVar363 [32];
  undefined1 auVar364 [32];
  float s;
  undefined1 auVar393 [16];
  undefined1 auVar394 [32];
  float fVar398;
  undefined1 auVar395 [32];
  undefined1 auVar396 [32];
  float t;
  undefined1 auVar399 [16];
  undefined1 auVar400 [32];
  undefined1 auVar401 [32];
  float fVar404;
  undefined1 auVar402 [32];
  float fVar405;
  float fVar406;
  float fVar411;
  float fVar413;
  float fVar415;
  float fVar417;
  float fVar419;
  float fVar421;
  float in_register_0000151c;
  undefined1 auVar407 [32];
  float fVar412;
  float fVar414;
  float fVar416;
  float fVar418;
  float fVar420;
  float fVar422;
  undefined1 auVar408 [32];
  undefined1 auVar409 [32];
  undefined1 auVar410 [64];
  float fVar423;
  float fVar424;
  float fVar433;
  undefined1 auVar425 [16];
  undefined1 auVar426 [16];
  float fVar432;
  float fVar434;
  float fVar436;
  float fVar437;
  float fVar438;
  undefined1 auVar427 [32];
  float fVar435;
  undefined1 auVar428 [32];
  undefined1 auVar430 [32];
  undefined1 auVar431 [64];
  float in_register_0000159c;
  undefined1 auVar439 [32];
  undefined1 auVar440 [32];
  undefined1 auVar441 [32];
  float in_register_000015dc;
  undefined1 auVar442 [32];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  vboolx_conflict valid;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  float local_c80;
  undefined1 local_c00 [8];
  float fStack_bf8;
  float fStack_bf4;
  float fStack_bf0;
  float fStack_bec;
  float fStack_be8;
  float fStack_be4;
  uint uStack_b44;
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 local_af0;
  undefined8 uStack_ae8;
  undefined1 local_ae0 [16];
  undefined1 local_ad0 [8];
  float fStack_ac8;
  float fStack_ac4;
  undefined1 local_ac0 [8];
  float fStack_ab8;
  float fStack_ab4;
  undefined1 local_ab0 [8];
  float fStack_aa8;
  float fStack_aa4;
  undefined1 local_aa0 [8];
  float fStack_a98;
  float fStack_a94;
  RTCFilterFunctionNArguments local_a90;
  undefined1 local_a60 [32];
  undefined8 *local_a38;
  undefined8 *local_a30;
  undefined1 (*local_a28) [32];
  undefined1 local_a20 [32];
  undefined1 local_a00 [8];
  float fStack_9f8;
  float fStack_9f4;
  float fStack_9f0;
  float fStack_9ec;
  float fStack_9e8;
  float fStack_9e4;
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [16];
  undefined1 local_970 [8];
  float fStack_968;
  float fStack_964;
  undefined1 local_960 [32];
  undefined1 local_940 [16];
  Primitive *local_930;
  ulong local_928;
  undefined1 local_920 [8];
  float fStack_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float fStack_908;
  float fStack_904;
  undefined1 local_900 [8];
  float fStack_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  float fStack_8e8;
  float fStack_8e4;
  undefined1 local_8e0 [8];
  float fStack_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float fStack_8c8;
  float fStack_8c4;
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [8];
  float fStack_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  float fStack_884;
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  float fStack_864;
  undefined1 local_860 [8];
  float fStack_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  float fStack_844;
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [16];
  undefined1 auStack_7f0 [16];
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  float fStack_7c4;
  ulong local_7c0;
  undefined1 auStack_7b8 [24];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [8];
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  float fStack_744;
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  float local_6a0 [4];
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  float local_680 [4];
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  float fStack_664;
  RTCHitN local_660 [16];
  undefined1 auStack_650 [16];
  undefined1 local_640 [16];
  undefined1 auStack_630 [16];
  undefined1 local_620 [16];
  undefined1 auStack_610 [16];
  undefined1 local_600 [16];
  undefined1 auStack_5f0 [16];
  undefined1 local_5e0 [32];
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  uint local_580;
  uint uStack_57c;
  uint uStack_578;
  uint uStack_574;
  uint uStack_570;
  uint uStack_56c;
  uint uStack_568;
  uint uStack_564;
  uint local_560;
  uint uStack_55c;
  uint uStack_558;
  uint uStack_554;
  uint uStack_550;
  uint uStack_54c;
  uint uStack_548;
  uint uStack_544;
  undefined1 local_540 [32];
  float local_520;
  float fStack_51c;
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined1 local_300 [32];
  undefined1 local_2e0 [8];
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  undefined1 local_1a0 [8];
  float fStack_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  undefined4 uStack_184;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  float afStack_140 [2];
  uint auStack_138 [66];
  undefined1 auVar397 [64];
  undefined1 auVar403 [64];
  undefined1 auVar429 [32];
  
  PVar6 = prim[1];
  uVar113 = (ulong)(byte)PVar6;
  lVar111 = uVar113 * 5;
  auVar151 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x10);
  auVar151 = vinsertps_avx(auVar151,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar18 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar18 = vinsertps_avx(auVar18,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  fVar212 = *(float *)(prim + uVar113 * 0x19 + 0x12);
  auVar151 = vsubps_avx(auVar151,*(undefined1 (*) [16])(prim + uVar113 * 0x19 + 6));
  auVar149._0_4_ = fVar212 * auVar151._0_4_;
  auVar149._4_4_ = fVar212 * auVar151._4_4_;
  auVar149._8_4_ = fVar212 * auVar151._8_4_;
  auVar149._12_4_ = fVar212 * auVar151._12_4_;
  auVar151 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar113 * 4 + 6)));
  auVar236 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar113 * 4 + 10)));
  auVar256._0_4_ = fVar212 * auVar18._0_4_;
  auVar256._4_4_ = fVar212 * auVar18._4_4_;
  auVar256._8_4_ = fVar212 * auVar18._8_4_;
  auVar256._12_4_ = fVar212 * auVar18._12_4_;
  auVar128._16_16_ = auVar236;
  auVar128._0_16_ = auVar151;
  auVar151 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar111 + 6)));
  auVar128 = vcvtdq2ps_avx(auVar128);
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar111 + 10)));
  auVar202._16_16_ = auVar18;
  auVar202._0_16_ = auVar151;
  auVar136 = vcvtdq2ps_avx(auVar202);
  auVar151 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar113 * 6 + 6)));
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar113 * 6 + 10)));
  auVar220._16_16_ = auVar18;
  auVar220._0_16_ = auVar151;
  auVar151 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar113 * 0xb + 6)));
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar113 * 0xb + 10)));
  auVar12 = vcvtdq2ps_avx(auVar220);
  auVar221._16_16_ = auVar18;
  auVar221._0_16_ = auVar151;
  auVar13 = vcvtdq2ps_avx(auVar221);
  uVar112 = (ulong)((uint)(byte)PVar6 * 0xc);
  auVar151 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar112 + 6)));
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar112 + 10)));
  auVar284._16_16_ = auVar18;
  auVar284._0_16_ = auVar151;
  auVar151 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar112 + uVar113 + 6)));
  auVar14 = vcvtdq2ps_avx(auVar284);
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar112 + uVar113 + 10)));
  auVar302._16_16_ = auVar18;
  auVar302._0_16_ = auVar151;
  lVar11 = uVar113 * 9;
  uVar112 = (ulong)(uint)((int)lVar11 * 2);
  auVar151 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar112 + 6)));
  auVar15 = vcvtdq2ps_avx(auVar302);
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar112 + 10)));
  auVar303._16_16_ = auVar18;
  auVar303._0_16_ = auVar151;
  auVar364 = vcvtdq2ps_avx(auVar303);
  auVar151 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar112 + uVar113 + 6)));
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar112 + uVar113 + 10)));
  auVar361._16_16_ = auVar18;
  auVar361._0_16_ = auVar151;
  uVar112 = (ulong)(uint)((int)lVar111 << 2);
  auVar151 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar112 + 6)));
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar112 + 10)));
  auVar16 = vcvtdq2ps_avx(auVar361);
  auVar394._16_16_ = auVar18;
  auVar394._0_16_ = auVar151;
  auVar17 = vcvtdq2ps_avx(auVar394);
  auVar151 = vshufps_avx(auVar256,auVar256,0);
  auVar18 = vshufps_avx(auVar256,auVar256,0x55);
  auVar236 = vshufps_avx(auVar256,auVar256,0xaa);
  fVar212 = auVar236._0_4_;
  fVar228 = auVar236._4_4_;
  fVar229 = auVar236._8_4_;
  fVar230 = auVar236._12_4_;
  fVar231 = auVar18._0_4_;
  fVar232 = auVar18._4_4_;
  fVar233 = auVar18._8_4_;
  fVar234 = auVar18._12_4_;
  fVar249 = auVar151._0_4_;
  fVar250 = auVar151._4_4_;
  fVar251 = auVar151._8_4_;
  fVar252 = auVar151._12_4_;
  auVar407._0_4_ = fVar249 * auVar128._0_4_ + fVar231 * auVar136._0_4_ + fVar212 * auVar12._0_4_;
  auVar407._4_4_ = fVar250 * auVar128._4_4_ + fVar232 * auVar136._4_4_ + fVar228 * auVar12._4_4_;
  auVar407._8_4_ = fVar251 * auVar128._8_4_ + fVar233 * auVar136._8_4_ + fVar229 * auVar12._8_4_;
  auVar407._12_4_ = fVar252 * auVar128._12_4_ + fVar234 * auVar136._12_4_ + fVar230 * auVar12._12_4_
  ;
  auVar407._16_4_ = fVar249 * auVar128._16_4_ + fVar231 * auVar136._16_4_ + fVar212 * auVar12._16_4_
  ;
  auVar407._20_4_ = fVar250 * auVar128._20_4_ + fVar232 * auVar136._20_4_ + fVar228 * auVar12._20_4_
  ;
  auVar407._24_4_ = fVar251 * auVar128._24_4_ + fVar233 * auVar136._24_4_ + fVar229 * auVar12._24_4_
  ;
  auVar407._28_4_ = fVar234 + in_register_000015dc + in_register_0000151c;
  auVar400._0_4_ = fVar249 * auVar13._0_4_ + fVar231 * auVar14._0_4_ + auVar15._0_4_ * fVar212;
  auVar400._4_4_ = fVar250 * auVar13._4_4_ + fVar232 * auVar14._4_4_ + auVar15._4_4_ * fVar228;
  auVar400._8_4_ = fVar251 * auVar13._8_4_ + fVar233 * auVar14._8_4_ + auVar15._8_4_ * fVar229;
  auVar400._12_4_ = fVar252 * auVar13._12_4_ + fVar234 * auVar14._12_4_ + auVar15._12_4_ * fVar230;
  auVar400._16_4_ = fVar249 * auVar13._16_4_ + fVar231 * auVar14._16_4_ + auVar15._16_4_ * fVar212;
  auVar400._20_4_ = fVar250 * auVar13._20_4_ + fVar232 * auVar14._20_4_ + auVar15._20_4_ * fVar228;
  auVar400._24_4_ = fVar251 * auVar13._24_4_ + fVar233 * auVar14._24_4_ + auVar15._24_4_ * fVar229;
  auVar400._28_4_ = fVar234 + in_register_000015dc + in_register_0000159c;
  auVar263._0_4_ = fVar249 * auVar364._0_4_ + fVar231 * auVar16._0_4_ + auVar17._0_4_ * fVar212;
  auVar263._4_4_ = fVar250 * auVar364._4_4_ + fVar232 * auVar16._4_4_ + auVar17._4_4_ * fVar228;
  auVar263._8_4_ = fVar251 * auVar364._8_4_ + fVar233 * auVar16._8_4_ + auVar17._8_4_ * fVar229;
  auVar263._12_4_ = fVar252 * auVar364._12_4_ + fVar234 * auVar16._12_4_ + auVar17._12_4_ * fVar230;
  auVar263._16_4_ = fVar249 * auVar364._16_4_ + fVar231 * auVar16._16_4_ + auVar17._16_4_ * fVar212;
  auVar263._20_4_ = fVar250 * auVar364._20_4_ + fVar232 * auVar16._20_4_ + auVar17._20_4_ * fVar228;
  auVar263._24_4_ = fVar251 * auVar364._24_4_ + fVar233 * auVar16._24_4_ + auVar17._24_4_ * fVar229;
  auVar263._28_4_ = fVar252 + fVar234 + fVar230;
  auVar151 = vshufps_avx(auVar149,auVar149,0);
  auVar18 = vshufps_avx(auVar149,auVar149,0x55);
  auVar236 = vshufps_avx(auVar149,auVar149,0xaa);
  fVar228 = auVar236._0_4_;
  fVar229 = auVar236._4_4_;
  fVar230 = auVar236._8_4_;
  fVar231 = auVar236._12_4_;
  fVar250 = auVar18._0_4_;
  fVar251 = auVar18._4_4_;
  fVar252 = auVar18._8_4_;
  fVar253 = auVar18._12_4_;
  fVar232 = auVar151._0_4_;
  fVar233 = auVar151._4_4_;
  fVar234 = auVar151._8_4_;
  fVar249 = auVar151._12_4_;
  fVar212 = auVar128._28_4_;
  auVar285._0_4_ = fVar232 * auVar128._0_4_ + fVar250 * auVar136._0_4_ + fVar228 * auVar12._0_4_;
  auVar285._4_4_ = fVar233 * auVar128._4_4_ + fVar251 * auVar136._4_4_ + fVar229 * auVar12._4_4_;
  auVar285._8_4_ = fVar234 * auVar128._8_4_ + fVar252 * auVar136._8_4_ + fVar230 * auVar12._8_4_;
  auVar285._12_4_ = fVar249 * auVar128._12_4_ + fVar253 * auVar136._12_4_ + fVar231 * auVar12._12_4_
  ;
  auVar285._16_4_ = fVar232 * auVar128._16_4_ + fVar250 * auVar136._16_4_ + fVar228 * auVar12._16_4_
  ;
  auVar285._20_4_ = fVar233 * auVar128._20_4_ + fVar251 * auVar136._20_4_ + fVar229 * auVar12._20_4_
  ;
  auVar285._24_4_ = fVar234 * auVar128._24_4_ + fVar252 * auVar136._24_4_ + fVar230 * auVar12._24_4_
  ;
  auVar285._28_4_ = fVar212 + auVar136._28_4_ + auVar12._28_4_;
  auVar163._0_4_ = fVar232 * auVar13._0_4_ + auVar15._0_4_ * fVar228 + fVar250 * auVar14._0_4_;
  auVar163._4_4_ = fVar233 * auVar13._4_4_ + auVar15._4_4_ * fVar229 + fVar251 * auVar14._4_4_;
  auVar163._8_4_ = fVar234 * auVar13._8_4_ + auVar15._8_4_ * fVar230 + fVar252 * auVar14._8_4_;
  auVar163._12_4_ = fVar249 * auVar13._12_4_ + auVar15._12_4_ * fVar231 + fVar253 * auVar14._12_4_;
  auVar163._16_4_ = fVar232 * auVar13._16_4_ + auVar15._16_4_ * fVar228 + fVar250 * auVar14._16_4_;
  auVar163._20_4_ = fVar233 * auVar13._20_4_ + auVar15._20_4_ * fVar229 + fVar251 * auVar14._20_4_;
  auVar163._24_4_ = fVar234 * auVar13._24_4_ + auVar15._24_4_ * fVar230 + fVar252 * auVar14._24_4_;
  auVar163._28_4_ = fVar212 + auVar15._28_4_ + auVar12._28_4_;
  auVar304._8_4_ = 0x7fffffff;
  auVar304._0_8_ = 0x7fffffff7fffffff;
  auVar304._12_4_ = 0x7fffffff;
  auVar304._16_4_ = 0x7fffffff;
  auVar304._20_4_ = 0x7fffffff;
  auVar304._24_4_ = 0x7fffffff;
  auVar304._28_4_ = 0x7fffffff;
  auVar362._8_4_ = 0x219392ef;
  auVar362._0_8_ = 0x219392ef219392ef;
  auVar362._12_4_ = 0x219392ef;
  auVar362._16_4_ = 0x219392ef;
  auVar362._20_4_ = 0x219392ef;
  auVar362._24_4_ = 0x219392ef;
  auVar362._28_4_ = 0x219392ef;
  auVar128 = vandps_avx(auVar407,auVar304);
  auVar128 = vcmpps_avx(auVar128,auVar362,1);
  auVar136 = vblendvps_avx(auVar407,auVar362,auVar128);
  auVar128 = vandps_avx(auVar400,auVar304);
  auVar128 = vcmpps_avx(auVar128,auVar362,1);
  auVar12 = vblendvps_avx(auVar400,auVar362,auVar128);
  auVar128 = vandps_avx(auVar263,auVar304);
  auVar128 = vcmpps_avx(auVar128,auVar362,1);
  auVar128 = vblendvps_avx(auVar263,auVar362,auVar128);
  auVar203._0_4_ = fVar250 * auVar16._0_4_ + auVar17._0_4_ * fVar228 + fVar232 * auVar364._0_4_;
  auVar203._4_4_ = fVar251 * auVar16._4_4_ + auVar17._4_4_ * fVar229 + fVar233 * auVar364._4_4_;
  auVar203._8_4_ = fVar252 * auVar16._8_4_ + auVar17._8_4_ * fVar230 + fVar234 * auVar364._8_4_;
  auVar203._12_4_ = fVar253 * auVar16._12_4_ + auVar17._12_4_ * fVar231 + fVar249 * auVar364._12_4_;
  auVar203._16_4_ = fVar250 * auVar16._16_4_ + auVar17._16_4_ * fVar228 + fVar232 * auVar364._16_4_;
  auVar203._20_4_ = fVar251 * auVar16._20_4_ + auVar17._20_4_ * fVar229 + fVar233 * auVar364._20_4_;
  auVar203._24_4_ = fVar252 * auVar16._24_4_ + auVar17._24_4_ * fVar230 + fVar234 * auVar364._24_4_;
  auVar203._28_4_ = auVar14._28_4_ + fVar231 + fVar212;
  auVar13 = vrcpps_avx(auVar136);
  fVar212 = auVar13._0_4_;
  fVar228 = auVar13._4_4_;
  auVar14._4_4_ = auVar136._4_4_ * fVar228;
  auVar14._0_4_ = auVar136._0_4_ * fVar212;
  fVar229 = auVar13._8_4_;
  auVar14._8_4_ = auVar136._8_4_ * fVar229;
  fVar230 = auVar13._12_4_;
  auVar14._12_4_ = auVar136._12_4_ * fVar230;
  fVar231 = auVar13._16_4_;
  auVar14._16_4_ = auVar136._16_4_ * fVar231;
  fVar232 = auVar13._20_4_;
  auVar14._20_4_ = auVar136._20_4_ * fVar232;
  fVar233 = auVar13._24_4_;
  auVar14._24_4_ = auVar136._24_4_ * fVar233;
  auVar14._28_4_ = auVar136._28_4_;
  auVar329._8_4_ = 0x3f800000;
  auVar329._0_8_ = &DAT_3f8000003f800000;
  auVar329._12_4_ = 0x3f800000;
  auVar329._16_4_ = 0x3f800000;
  auVar329._20_4_ = 0x3f800000;
  auVar329._24_4_ = 0x3f800000;
  auVar329._28_4_ = 0x3f800000;
  auVar14 = vsubps_avx(auVar329,auVar14);
  auVar136 = vrcpps_avx(auVar12);
  fVar212 = fVar212 + fVar212 * auVar14._0_4_;
  fVar228 = fVar228 + fVar228 * auVar14._4_4_;
  fVar229 = fVar229 + fVar229 * auVar14._8_4_;
  fVar230 = fVar230 + fVar230 * auVar14._12_4_;
  fVar231 = fVar231 + fVar231 * auVar14._16_4_;
  fVar232 = fVar232 + fVar232 * auVar14._20_4_;
  fVar233 = fVar233 + fVar233 * auVar14._24_4_;
  fVar255 = auVar136._0_4_;
  fVar272 = auVar136._4_4_;
  auVar15._4_4_ = fVar272 * auVar12._4_4_;
  auVar15._0_4_ = fVar255 * auVar12._0_4_;
  fVar273 = auVar136._8_4_;
  auVar15._8_4_ = fVar273 * auVar12._8_4_;
  fVar274 = auVar136._12_4_;
  auVar15._12_4_ = fVar274 * auVar12._12_4_;
  fVar275 = auVar136._16_4_;
  auVar15._16_4_ = fVar275 * auVar12._16_4_;
  fVar276 = auVar136._20_4_;
  auVar15._20_4_ = fVar276 * auVar12._20_4_;
  fVar278 = auVar136._24_4_;
  auVar15._24_4_ = fVar278 * auVar12._24_4_;
  auVar15._28_4_ = auVar13._28_4_;
  auVar136 = vsubps_avx(auVar329,auVar15);
  fVar255 = fVar255 + fVar255 * auVar136._0_4_;
  fVar272 = fVar272 + fVar272 * auVar136._4_4_;
  fVar273 = fVar273 + fVar273 * auVar136._8_4_;
  fVar274 = fVar274 + fVar274 * auVar136._12_4_;
  fVar275 = fVar275 + fVar275 * auVar136._16_4_;
  fVar276 = fVar276 + fVar276 * auVar136._20_4_;
  fVar278 = fVar278 + fVar278 * auVar136._24_4_;
  auVar136 = vrcpps_avx(auVar128);
  fVar234 = auVar136._0_4_;
  fVar249 = auVar136._4_4_;
  auVar364._4_4_ = fVar249 * auVar128._4_4_;
  auVar364._0_4_ = fVar234 * auVar128._0_4_;
  fVar250 = auVar136._8_4_;
  auVar364._8_4_ = fVar250 * auVar128._8_4_;
  fVar251 = auVar136._12_4_;
  auVar364._12_4_ = fVar251 * auVar128._12_4_;
  fVar252 = auVar136._16_4_;
  auVar364._16_4_ = fVar252 * auVar128._16_4_;
  fVar253 = auVar136._20_4_;
  auVar364._20_4_ = fVar253 * auVar128._20_4_;
  fVar254 = auVar136._24_4_;
  auVar364._24_4_ = fVar254 * auVar128._24_4_;
  auVar364._28_4_ = auVar12._28_4_;
  auVar128 = vsubps_avx(auVar329,auVar364);
  fVar234 = fVar234 + fVar234 * auVar128._0_4_;
  fVar249 = fVar249 + fVar249 * auVar128._4_4_;
  fVar250 = fVar250 + fVar250 * auVar128._8_4_;
  fVar251 = fVar251 + fVar251 * auVar128._12_4_;
  fVar252 = fVar252 + fVar252 * auVar128._16_4_;
  fVar253 = fVar253 + fVar253 * auVar128._20_4_;
  fVar254 = fVar254 + fVar254 * auVar128._24_4_;
  auVar151._8_8_ = 0;
  auVar151._0_8_ = *(ulong *)(prim + uVar113 * 7 + 6);
  auVar151 = vpmovsxwd_avx(auVar151);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar113 * 7 + 0xe);
  auVar18 = vpmovsxwd_avx(auVar18);
  auVar129._16_16_ = auVar18;
  auVar129._0_16_ = auVar151;
  auVar128 = vcvtdq2ps_avx(auVar129);
  auVar128 = vsubps_avx(auVar128,auVar285);
  auVar117._0_4_ = fVar212 * auVar128._0_4_;
  auVar117._4_4_ = fVar228 * auVar128._4_4_;
  auVar117._8_4_ = fVar229 * auVar128._8_4_;
  auVar117._12_4_ = fVar230 * auVar128._12_4_;
  auVar12._16_4_ = fVar231 * auVar128._16_4_;
  auVar12._0_16_ = auVar117;
  auVar12._20_4_ = fVar232 * auVar128._20_4_;
  auVar12._24_4_ = fVar233 * auVar128._24_4_;
  auVar12._28_4_ = auVar128._28_4_;
  auVar236._8_8_ = 0;
  auVar236._0_8_ = *(ulong *)(prim + lVar11 + 6);
  auVar151 = vpmovsxwd_avx(auVar236);
  auVar214._8_8_ = 0;
  auVar214._0_8_ = *(ulong *)(prim + lVar11 + 0xe);
  auVar18 = vpmovsxwd_avx(auVar214);
  auVar305._16_16_ = auVar18;
  auVar305._0_16_ = auVar151;
  auVar128 = vcvtdq2ps_avx(auVar305);
  auVar128 = vsubps_avx(auVar128,auVar285);
  auVar213._0_4_ = fVar212 * auVar128._0_4_;
  auVar213._4_4_ = fVar228 * auVar128._4_4_;
  auVar213._8_4_ = fVar229 * auVar128._8_4_;
  auVar213._12_4_ = fVar230 * auVar128._12_4_;
  auVar16._16_4_ = fVar231 * auVar128._16_4_;
  auVar16._0_16_ = auVar213;
  auVar16._20_4_ = fVar232 * auVar128._20_4_;
  auVar16._24_4_ = fVar233 * auVar128._24_4_;
  auVar16._28_4_ = auVar13._28_4_ + auVar14._28_4_;
  lVar111 = (ulong)(byte)PVar6 * 0x10;
  auVar156._8_8_ = 0;
  auVar156._0_8_ = *(ulong *)(prim + lVar111 + 6);
  auVar151 = vpmovsxwd_avx(auVar156);
  auVar120._8_8_ = 0;
  auVar120._0_8_ = *(ulong *)(prim + lVar111 + 0xe);
  auVar18 = vpmovsxwd_avx(auVar120);
  lVar111 = lVar111 + uVar113 * -2;
  auVar194._8_8_ = 0;
  auVar194._0_8_ = *(ulong *)(prim + lVar111 + 6);
  auVar236 = vpmovsxwd_avx(auVar194);
  auVar152._8_8_ = 0;
  auVar152._0_8_ = *(ulong *)(prim + lVar111 + 0xe);
  auVar214 = vpmovsxwd_avx(auVar152);
  auVar286._16_16_ = auVar214;
  auVar286._0_16_ = auVar236;
  auVar128 = vcvtdq2ps_avx(auVar286);
  auVar128 = vsubps_avx(auVar128,auVar163);
  auVar281._0_4_ = fVar255 * auVar128._0_4_;
  auVar281._4_4_ = fVar272 * auVar128._4_4_;
  auVar281._8_4_ = fVar273 * auVar128._8_4_;
  auVar281._12_4_ = fVar274 * auVar128._12_4_;
  auVar13._16_4_ = fVar275 * auVar128._16_4_;
  auVar13._0_16_ = auVar281;
  auVar13._20_4_ = fVar276 * auVar128._20_4_;
  auVar13._24_4_ = fVar278 * auVar128._24_4_;
  auVar13._28_4_ = auVar128._28_4_;
  auVar306._16_16_ = auVar18;
  auVar306._0_16_ = auVar151;
  auVar128 = vcvtdq2ps_avx(auVar306);
  auVar128 = vsubps_avx(auVar128,auVar163);
  auVar150._0_4_ = fVar255 * auVar128._0_4_;
  auVar150._4_4_ = fVar272 * auVar128._4_4_;
  auVar150._8_4_ = fVar273 * auVar128._8_4_;
  auVar150._12_4_ = fVar274 * auVar128._12_4_;
  auVar17._16_4_ = fVar275 * auVar128._16_4_;
  auVar17._0_16_ = auVar150;
  auVar17._20_4_ = fVar276 * auVar128._20_4_;
  auVar17._24_4_ = fVar278 * auVar128._24_4_;
  auVar17._28_4_ = auVar128._28_4_;
  auVar155._8_8_ = 0;
  auVar155._0_8_ = *(ulong *)(prim + uVar112 + uVar113 + 6);
  auVar151 = vpmovsxwd_avx(auVar155);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(ulong *)(prim + uVar112 + uVar113 + 0xe);
  auVar18 = vpmovsxwd_avx(auVar3);
  auVar264._16_16_ = auVar18;
  auVar264._0_16_ = auVar151;
  auVar128 = vcvtdq2ps_avx(auVar264);
  auVar128 = vsubps_avx(auVar128,auVar203);
  auVar257._0_4_ = fVar234 * auVar128._0_4_;
  auVar257._4_4_ = fVar249 * auVar128._4_4_;
  auVar257._8_4_ = fVar250 * auVar128._8_4_;
  auVar257._12_4_ = fVar251 * auVar128._12_4_;
  auVar27._16_4_ = fVar252 * auVar128._16_4_;
  auVar27._0_16_ = auVar257;
  auVar27._20_4_ = fVar253 * auVar128._20_4_;
  auVar27._24_4_ = fVar254 * auVar128._24_4_;
  auVar27._28_4_ = auVar128._28_4_;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)(prim + uVar113 * 0x17 + 6);
  auVar151 = vpmovsxwd_avx(auVar4);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + uVar113 * 0x17 + 0xe);
  auVar18 = vpmovsxwd_avx(auVar5);
  auVar307._16_16_ = auVar18;
  auVar307._0_16_ = auVar151;
  auVar128 = vcvtdq2ps_avx(auVar307);
  auVar128 = vsubps_avx(auVar128,auVar203);
  auVar192._0_4_ = fVar234 * auVar128._0_4_;
  auVar192._4_4_ = fVar249 * auVar128._4_4_;
  auVar192._8_4_ = fVar250 * auVar128._8_4_;
  auVar192._12_4_ = fVar251 * auVar128._12_4_;
  auVar28._16_4_ = fVar252 * auVar128._16_4_;
  auVar28._0_16_ = auVar192;
  auVar28._20_4_ = fVar253 * auVar128._20_4_;
  auVar28._24_4_ = fVar254 * auVar128._24_4_;
  auVar28._28_4_ = auVar128._28_4_;
  auVar151 = vpminsd_avx(auVar12._16_16_,auVar16._16_16_);
  auVar18 = vpminsd_avx(auVar117,auVar213);
  auVar330._16_16_ = auVar151;
  auVar330._0_16_ = auVar18;
  auVar151 = vpminsd_avx(auVar13._16_16_,auVar17._16_16_);
  auVar18 = vpminsd_avx(auVar281,auVar150);
  auVar401._16_16_ = auVar151;
  auVar401._0_16_ = auVar18;
  auVar128 = vmaxps_avx(auVar330,auVar401);
  auVar151 = vpminsd_avx(auVar27._16_16_,auVar28._16_16_);
  auVar18 = vpminsd_avx(auVar257,auVar192);
  auVar427._16_16_ = auVar151;
  auVar427._0_16_ = auVar18;
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar439._4_4_ = uVar1;
  auVar439._0_4_ = uVar1;
  auVar439._8_4_ = uVar1;
  auVar439._12_4_ = uVar1;
  auVar439._16_4_ = uVar1;
  auVar439._20_4_ = uVar1;
  auVar439._24_4_ = uVar1;
  auVar439._28_4_ = uVar1;
  auVar136 = vmaxps_avx(auVar427,auVar439);
  auVar128 = vmaxps_avx(auVar128,auVar136);
  local_280._4_4_ = auVar128._4_4_ * 0.99999964;
  local_280._0_4_ = auVar128._0_4_ * 0.99999964;
  local_280._8_4_ = auVar128._8_4_ * 0.99999964;
  local_280._12_4_ = auVar128._12_4_ * 0.99999964;
  local_280._16_4_ = auVar128._16_4_ * 0.99999964;
  local_280._20_4_ = auVar128._20_4_ * 0.99999964;
  local_280._24_4_ = auVar128._24_4_ * 0.99999964;
  local_280._28_4_ = auVar128._28_4_;
  auVar151 = vpmaxsd_avx(auVar12._16_16_,auVar16._16_16_);
  auVar18 = vpmaxsd_avx(auVar117,auVar213);
  auVar130._16_16_ = auVar151;
  auVar130._0_16_ = auVar18;
  auVar151 = vpmaxsd_avx(auVar13._16_16_,auVar17._16_16_);
  auVar18 = vpmaxsd_avx(auVar281,auVar150);
  auVar164._16_16_ = auVar151;
  auVar164._0_16_ = auVar18;
  auVar128 = vminps_avx(auVar130,auVar164);
  auVar151 = vpmaxsd_avx(auVar27._16_16_,auVar28._16_16_);
  auVar18 = vpmaxsd_avx(auVar257,auVar192);
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar222._4_4_ = uVar1;
  auVar222._0_4_ = uVar1;
  auVar222._8_4_ = uVar1;
  auVar222._12_4_ = uVar1;
  auVar222._16_4_ = uVar1;
  auVar222._20_4_ = uVar1;
  auVar222._24_4_ = uVar1;
  auVar222._28_4_ = uVar1;
  auVar165._16_16_ = auVar151;
  auVar165._0_16_ = auVar18;
  auVar136 = vminps_avx(auVar165,auVar222);
  auVar128 = vminps_avx(auVar128,auVar136);
  auVar136._4_4_ = auVar128._4_4_ * 1.0000004;
  auVar136._0_4_ = auVar128._0_4_ * 1.0000004;
  auVar136._8_4_ = auVar128._8_4_ * 1.0000004;
  auVar136._12_4_ = auVar128._12_4_ * 1.0000004;
  auVar136._16_4_ = auVar128._16_4_ * 1.0000004;
  auVar136._20_4_ = auVar128._20_4_ * 1.0000004;
  auVar136._24_4_ = auVar128._24_4_ * 1.0000004;
  auVar136._28_4_ = auVar128._28_4_;
  auVar128 = vcmpps_avx(local_280,auVar136,2);
  auVar151 = vpshufd_avx(ZEXT116((byte)PVar6),0);
  auVar166._16_16_ = auVar151;
  auVar166._0_16_ = auVar151;
  auVar136 = vcvtdq2ps_avx(auVar166);
  auVar136 = vcmpps_avx(_DAT_02020f40,auVar136,1);
  auVar128 = vandps_avx(auVar128,auVar136);
  uVar108 = vmovmskps_avx(auVar128);
  if (uVar108 == 0) {
    return;
  }
  uVar108 = uVar108 & 0xff;
  auVar131._16_16_ = mm_lookupmask_ps._240_16_;
  auVar131._0_16_ = mm_lookupmask_ps._240_16_;
  local_4a0 = vblendps_avx(auVar131,ZEXT832(0) << 0x20,0x80);
  local_a28 = (undefined1 (*) [32])&local_580;
  uVar109 = 1 << ((byte)k & 0x1f);
  local_a30 = (undefined8 *)(mm_lookupmask_ps + ((uVar109 & 0xf) << 4));
  local_a38 = (undefined8 *)(mm_lookupmask_ps + (long)((int)uVar109 >> 4) * 0x10);
  local_930 = prim;
LAB_0115189c:
  local_928 = (ulong)uVar108;
  lVar111 = 0;
  if (local_928 != 0) {
    for (; (uVar108 >> lVar111 & 1) == 0; lVar111 = lVar111 + 1) {
    }
  }
  local_928 = local_928 - 1 & local_928;
  uVar108 = *(uint *)(local_930 + 2);
  uVar109 = *(uint *)(local_930 + lVar111 * 4 + 6);
  pGVar7 = (context->scene->geometries).items[uVar108].ptr;
  uVar113 = (ulong)*(uint *)(*(long *)&pGVar7->field_0x58 +
                            pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                            _M_i * (ulong)uVar109);
  p_Var8 = pGVar7[1].intersectionFilterN;
  lVar111 = *(long *)&pGVar7[1].time_range.upper;
  auVar151 = *(undefined1 (*) [16])(lVar111 + (long)p_Var8 * uVar113);
  auVar18 = *(undefined1 (*) [16])(lVar111 + (uVar113 + 1) * (long)p_Var8);
  lVar11 = 0;
  if (local_928 != 0) {
    for (; (local_928 >> lVar11 & 1) == 0; lVar11 = lVar11 + 1) {
    }
  }
  if (((local_928 != 0) && (uVar112 = local_928 - 1 & local_928, uVar112 != 0)) &&
     (lVar11 = 0, uVar112 != 0)) {
    for (; (uVar112 >> lVar11 & 1) == 0; lVar11 = lVar11 + 1) {
    }
  }
  auVar236 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x1c);
  auVar214 = vinsertps_avx(auVar236,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  fVar212 = *(float *)(ray + k * 4 + 0x80);
  auVar359._4_4_ = fVar212;
  auVar359._0_4_ = fVar212;
  auVar359._8_4_ = fVar212;
  auVar359._12_4_ = fVar212;
  fStack_850 = fVar212;
  _local_860 = auVar359;
  fStack_84c = fVar212;
  fStack_848 = fVar212;
  fStack_844 = fVar212;
  fVar228 = *(float *)(ray + k * 4 + 0xa0);
  auVar393._4_4_ = fVar228;
  auVar393._0_4_ = fVar228;
  auVar393._8_4_ = fVar228;
  auVar393._12_4_ = fVar228;
  fStack_870 = fVar228;
  _local_880 = auVar393;
  fStack_86c = fVar228;
  fStack_868 = fVar228;
  fStack_864 = fVar228;
  auVar397 = ZEXT3264(_local_880);
  auVar236 = vunpcklps_avx(auVar359,auVar393);
  fVar229 = *(float *)(ray + k * 4 + 0xc0);
  auVar399._4_4_ = fVar229;
  auVar399._0_4_ = fVar229;
  auVar399._8_4_ = fVar229;
  auVar399._12_4_ = fVar229;
  fStack_890 = fVar229;
  _local_8a0 = auVar399;
  fStack_88c = fVar229;
  fStack_888 = fVar229;
  fStack_884 = fVar229;
  auVar403 = ZEXT3264(_local_8a0);
  _local_970 = vinsertps_avx(auVar236,auVar399,0x28);
  auVar410 = ZEXT1664(_local_970);
  auVar118._0_4_ = (auVar151._0_4_ + auVar18._0_4_) * 0.5;
  auVar118._4_4_ = (auVar151._4_4_ + auVar18._4_4_) * 0.5;
  auVar118._8_4_ = (auVar151._8_4_ + auVar18._8_4_) * 0.5;
  auVar118._12_4_ = (auVar151._12_4_ + auVar18._12_4_) * 0.5;
  auVar236 = vsubps_avx(auVar118,auVar214);
  auVar236 = vdpps_avx(auVar236,_local_970,0x7f);
  local_980 = vdpps_avx(_local_970,_local_970,0x7f);
  auVar431 = ZEXT1664(local_980);
  auVar156 = vrcpss_avx(local_980,local_980);
  fVar230 = auVar236._0_4_ * auVar156._0_4_ * (2.0 - local_980._0_4_ * auVar156._0_4_);
  auVar156 = vshufps_avx(ZEXT416((uint)fVar230),ZEXT416((uint)fVar230),0);
  auVar258._0_4_ = auVar214._0_4_ + local_970._0_4_ * auVar156._0_4_;
  auVar258._4_4_ = auVar214._4_4_ + local_970._4_4_ * auVar156._4_4_;
  auVar258._8_4_ = auVar214._8_4_ + local_970._8_4_ * auVar156._8_4_;
  auVar258._12_4_ = auVar214._12_4_ + local_970._12_4_ * auVar156._12_4_;
  auVar236 = vblendps_avx(auVar258,_DAT_01feba10,8);
  _local_aa0 = vsubps_avx(auVar151,auVar236);
  _local_ab0 = vsubps_avx(*(undefined1 (*) [16])(lVar111 + (uVar113 + 2) * (long)p_Var8),auVar236);
  _local_ac0 = vsubps_avx(auVar18,auVar236);
  auVar335 = ZEXT1664(_local_ac0);
  _local_ad0 = vsubps_avx(*(undefined1 (*) [16])(lVar111 + (uVar113 + 3) * (long)p_Var8),auVar236);
  auVar151 = vshufps_avx(_local_aa0,_local_aa0,0);
  register0x00001250 = auVar151;
  _local_340 = auVar151;
  auVar151 = vshufps_avx(_local_aa0,_local_aa0,0x55);
  register0x00001250 = auVar151;
  _local_1a0 = auVar151;
  auVar151 = vshufps_avx(_local_aa0,_local_aa0,0xaa);
  register0x00001250 = auVar151;
  _local_1c0 = auVar151;
  auVar151 = vshufps_avx(_local_aa0,_local_aa0,0xff);
  register0x00001290 = auVar151;
  _local_1e0 = auVar151;
  auVar151 = vshufps_avx(_local_ac0,_local_ac0,0);
  register0x00001290 = auVar151;
  _local_360 = auVar151;
  auVar151 = vshufps_avx(_local_ac0,_local_ac0,0x55);
  register0x00001290 = auVar151;
  _local_380 = auVar151;
  auVar151 = vshufps_avx(_local_ac0,_local_ac0,0xaa);
  register0x00001290 = auVar151;
  _local_3a0 = auVar151;
  auVar151 = vshufps_avx(_local_ac0,_local_ac0,0xff);
  register0x00001290 = auVar151;
  _local_200 = auVar151;
  auVar151 = vshufps_avx(_local_ab0,_local_ab0,0);
  register0x00001290 = auVar151;
  _local_3c0 = auVar151;
  auVar151 = vshufps_avx(_local_ab0,_local_ab0,0x55);
  register0x00001290 = auVar151;
  _local_3e0 = auVar151;
  auVar151 = vshufps_avx(_local_ab0,_local_ab0,0xaa);
  register0x00001290 = auVar151;
  _local_400 = auVar151;
  auVar151 = vshufps_avx(_local_ab0,_local_ab0,0xff);
  register0x00001290 = auVar151;
  _local_420 = auVar151;
  auVar151 = vshufps_avx(_local_ad0,_local_ad0,0);
  register0x00001290 = auVar151;
  _local_440 = auVar151;
  auVar151 = vshufps_avx(_local_ad0,_local_ad0,0x55);
  register0x00001290 = auVar151;
  _local_460 = auVar151;
  auVar151 = vshufps_avx(_local_ad0,_local_ad0,0xaa);
  register0x00001290 = auVar151;
  _local_480 = auVar151;
  auVar151 = vshufps_avx(_local_ad0,_local_ad0,0xff);
  register0x00001290 = auVar151;
  _local_220 = auVar151;
  auVar151 = ZEXT416((uint)(fVar212 * fVar212 + fVar228 * fVar228 + fVar229 * fVar229));
  auVar151 = vshufps_avx(auVar151,auVar151,0);
  local_240._16_16_ = auVar151;
  local_240._0_16_ = auVar151;
  fVar212 = *(float *)(ray + k * 4 + 0x60);
  local_940 = ZEXT416((uint)fVar230);
  auVar151 = vshufps_avx(ZEXT416((uint)(fVar212 - fVar230)),ZEXT416((uint)(fVar212 - fVar230)),0);
  local_260._16_16_ = auVar151;
  local_260._0_16_ = auVar151;
  auVar151 = vshufps_avx(ZEXT416(uVar108),ZEXT416(uVar108),0);
  local_4e0._16_16_ = auVar151;
  local_4e0._0_16_ = auVar151;
  auVar151 = vshufps_avx(ZEXT416(uVar109),ZEXT416(uVar109),0);
  local_500._16_16_ = auVar151;
  local_500._0_16_ = auVar151;
  register0x000013d0 = auVar156;
  _local_a00 = auVar156;
  uVar113 = 1;
  uVar112 = 0;
  auVar132._8_4_ = 0x7fffffff;
  auVar132._0_8_ = 0x7fffffff7fffffff;
  auVar132._12_4_ = 0x7fffffff;
  auVar132._16_4_ = 0x7fffffff;
  auVar132._20_4_ = 0x7fffffff;
  auVar132._24_4_ = 0x7fffffff;
  auVar132._28_4_ = 0x7fffffff;
  local_4c0 = vandps_avx(local_240,auVar132);
  auVar151 = vsqrtss_avx(local_980,local_980);
  auVar18 = vsqrtss_avx(local_980,local_980);
  auVar290 = ZEXT1664(ZEXT816(0x3f80000000000000));
  auVar245._8_4_ = 0x3f800000;
  auVar245._0_8_ = &DAT_3f8000003f800000;
  auVar245._12_4_ = 0x3f800000;
  auVar245._16_4_ = 0x3f800000;
  auVar245._20_4_ = 0x3f800000;
  auVar245._24_4_ = 0x3f800000;
  auVar245._28_4_ = 0x3f800000;
  do {
    local_ae0 = auVar290._0_16_;
    auVar236 = vmovshdup_avx(local_ae0);
    fVar250 = auVar236._0_4_ - auVar290._0_4_;
    auVar236 = vshufps_avx(local_ae0,local_ae0,0);
    local_9c0._16_16_ = auVar236;
    local_9c0._0_16_ = auVar236;
    auVar214 = vshufps_avx(ZEXT416((uint)fVar250),ZEXT416((uint)fVar250),0);
    local_9e0._16_16_ = auVar214;
    local_9e0._0_16_ = auVar214;
    fVar148 = auVar214._0_4_;
    fVar183 = auVar214._4_4_;
    fVar185 = auVar214._8_4_;
    fVar187 = auVar214._12_4_;
    fVar116 = auVar236._0_4_;
    auVar223._0_4_ = fVar116 + fVar148 * 0.0;
    fVar146 = auVar236._4_4_;
    auVar223._4_4_ = fVar146 + fVar183 * 0.14285715;
    fVar147 = auVar236._8_4_;
    auVar223._8_4_ = fVar147 + fVar185 * 0.2857143;
    fStack_be4 = auVar236._12_4_;
    auVar223._12_4_ = fStack_be4 + fVar187 * 0.42857146;
    auVar223._16_4_ = fVar116 + fVar148 * 0.5714286;
    auVar223._20_4_ = fVar146 + fVar183 * 0.71428573;
    auVar223._24_4_ = fVar147 + fVar185 * 0.8571429;
    auVar223._28_4_ = fStack_be4 + fVar187;
    auVar128 = vsubps_avx(auVar245,auVar223);
    local_c00._4_4_ = auVar223._4_4_ * auVar223._4_4_;
    local_c00._0_4_ = auVar223._0_4_ * auVar223._0_4_;
    fStack_bf8 = auVar223._8_4_ * auVar223._8_4_;
    fStack_bf4 = auVar223._12_4_ * auVar223._12_4_;
    fStack_bf0 = auVar223._16_4_ * auVar223._16_4_;
    fStack_bec = auVar223._20_4_ * auVar223._20_4_;
    fStack_be8 = auVar223._24_4_ * auVar223._24_4_;
    fVar252 = auVar223._0_4_ * 3.0;
    fVar253 = auVar223._4_4_ * 3.0;
    fVar254 = auVar223._8_4_ * 3.0;
    fVar255 = auVar223._12_4_ * 3.0;
    fVar272 = auVar223._16_4_ * 3.0;
    fVar273 = auVar223._20_4_ * 3.0;
    fVar274 = auVar223._24_4_ * 3.0;
    fVar229 = auVar128._0_4_;
    auVar290._0_4_ = fVar229 * fVar229;
    fVar230 = auVar128._4_4_;
    auVar290._4_4_ = fVar230 * fVar230;
    fVar231 = auVar128._8_4_;
    auVar290._8_4_ = fVar231 * fVar231;
    fVar232 = auVar128._12_4_;
    auVar290._12_4_ = fVar232 * fVar232;
    fVar233 = auVar128._16_4_;
    auVar290._16_4_ = fVar233 * fVar233;
    fVar234 = auVar128._20_4_;
    auVar290._20_4_ = fVar234 * fVar234;
    fVar249 = auVar128._24_4_;
    auVar290._28_36_ = auVar335._28_36_;
    auVar290._24_4_ = fVar249 * fVar249;
    fVar251 = auVar128._28_4_;
    fVar275 = (auVar290._0_4_ * (fVar229 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar276 = (auVar290._4_4_ * (fVar230 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar278 = (auVar290._8_4_ * (fVar231 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar293 = (auVar290._12_4_ * (fVar232 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar295 = (auVar290._16_4_ * (fVar233 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar297 = (auVar290._20_4_ * (fVar234 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar299 = (auVar290._24_4_ * (fVar249 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar355 = -fVar229 * auVar223._0_4_ * auVar223._0_4_ * 0.5;
    fVar365 = -fVar230 * auVar223._4_4_ * auVar223._4_4_ * 0.5;
    fVar369 = -fVar231 * auVar223._8_4_ * auVar223._8_4_ * 0.5;
    fVar373 = -fVar232 * auVar223._12_4_ * auVar223._12_4_ * 0.5;
    fVar377 = -fVar233 * auVar223._16_4_ * auVar223._16_4_ * 0.5;
    fVar381 = -fVar234 * auVar223._20_4_ * auVar223._20_4_ * 0.5;
    fVar385 = -fVar249 * auVar223._24_4_ * auVar223._24_4_ * 0.5;
    fVar228 = auVar431._28_4_;
    fVar398 = auVar397._28_4_ + fVar228;
    fVar404 = auVar403._28_4_ + fVar228;
    fVar423 = (auVar223._0_4_ * auVar223._0_4_ * (fVar252 + -5.0) + 2.0) * 0.5;
    fVar432 = (auVar223._4_4_ * auVar223._4_4_ * (fVar253 + -5.0) + 2.0) * 0.5;
    fVar434 = (auVar223._8_4_ * auVar223._8_4_ * (fVar254 + -5.0) + 2.0) * 0.5;
    fVar435 = (auVar223._12_4_ * auVar223._12_4_ * (fVar255 + -5.0) + 2.0) * 0.5;
    fVar436 = (auVar223._16_4_ * auVar223._16_4_ * (fVar272 + -5.0) + 2.0) * 0.5;
    fVar437 = (auVar223._20_4_ * auVar223._20_4_ * (fVar273 + -5.0) + 2.0) * 0.5;
    fVar438 = (auVar223._24_4_ * auVar223._24_4_ * (fVar274 + -5.0) + 2.0) * 0.5;
    fVar405 = -auVar223._0_4_ * fVar229 * fVar229 * 0.5;
    fVar411 = -auVar223._4_4_ * fVar230 * fVar230 * 0.5;
    fVar413 = -auVar223._8_4_ * fVar231 * fVar231 * 0.5;
    fVar415 = -auVar223._12_4_ * fVar232 * fVar232 * 0.5;
    fVar417 = -auVar223._16_4_ * fVar233 * fVar233 * 0.5;
    fVar419 = -auVar223._20_4_ * fVar234 * fVar234 * 0.5;
    fVar421 = -auVar223._24_4_ * fVar249 * fVar249 * 0.5;
    fVar356 = fVar405 * (float)local_340._0_4_ +
              fVar423 * (float)local_360._0_4_ +
              fVar355 * (float)local_440._0_4_ + fVar275 * (float)local_3c0._0_4_;
    fVar366 = fVar411 * (float)local_340._4_4_ +
              fVar432 * (float)local_360._4_4_ +
              fVar365 * (float)local_440._4_4_ + fVar276 * (float)local_3c0._4_4_;
    fVar370 = fVar413 * fStack_338 +
              fVar434 * fStack_358 + fVar369 * fStack_438 + fVar278 * fStack_3b8;
    fVar374 = fVar415 * fStack_334 +
              fVar435 * fStack_354 + fVar373 * fStack_434 + fVar293 * fStack_3b4;
    fVar378 = fVar417 * fStack_330 +
              fVar436 * fStack_350 + fVar377 * fStack_430 + fVar295 * fStack_3b0;
    fVar382 = fVar419 * fStack_32c +
              fVar437 * fStack_34c + fVar381 * fStack_42c + fVar297 * fStack_3ac;
    fVar386 = fVar421 * fStack_328 +
              fVar438 * fStack_348 + fVar385 * fStack_428 + fVar299 * fStack_3a8;
    fVar390 = fVar228 + 2.0 + -fVar251 + fVar398;
    fVar357 = (float)local_1a0._0_4_ * fVar405 +
              fVar423 * (float)local_380._0_4_ +
              fVar355 * (float)local_460._0_4_ + fVar275 * (float)local_3e0._0_4_;
    fVar367 = (float)local_1a0._4_4_ * fVar411 +
              fVar432 * (float)local_380._4_4_ +
              fVar365 * (float)local_460._4_4_ + fVar276 * (float)local_3e0._4_4_;
    fVar371 = fStack_198 * fVar413 +
              fVar434 * fStack_378 + fVar369 * fStack_458 + fVar278 * fStack_3d8;
    fVar375 = fStack_194 * fVar415 +
              fVar435 * fStack_374 + fVar373 * fStack_454 + fVar293 * fStack_3d4;
    fVar379 = fStack_190 * fVar417 +
              fVar436 * fStack_370 + fVar377 * fStack_450 + fVar295 * fStack_3d0;
    fVar383 = fStack_18c * fVar419 +
              fVar437 * fStack_36c + fVar381 * fStack_44c + fVar297 * fStack_3cc;
    fVar387 = fStack_188 * fVar421 +
              fVar438 * fStack_368 + fVar385 * fStack_448 + fVar299 * fStack_3c8;
    fVar391 = fVar390 + fVar398 + fVar404;
    fVar358 = (float)local_1c0._0_4_ * fVar405 +
              fVar423 * (float)local_3a0._0_4_ +
              fVar355 * (float)local_480._0_4_ + fVar275 * (float)local_400._0_4_;
    fVar368 = (float)local_1c0._4_4_ * fVar411 +
              fVar432 * (float)local_3a0._4_4_ +
              fVar365 * (float)local_480._4_4_ + fVar276 * (float)local_400._4_4_;
    fVar372 = fStack_1b8 * fVar413 +
              fVar434 * fStack_398 + fVar369 * fStack_478 + fVar278 * fStack_3f8;
    fVar376 = fStack_1b4 * fVar415 +
              fVar435 * fStack_394 + fVar373 * fStack_474 + fVar293 * fStack_3f4;
    fVar380 = fStack_1b0 * fVar417 +
              fVar436 * fStack_390 + fVar377 * fStack_470 + fVar295 * fStack_3f0;
    fVar384 = fStack_1ac * fVar419 +
              fVar437 * fStack_38c + fVar381 * fStack_46c + fVar297 * fStack_3ec;
    fVar388 = fStack_1a8 * fVar421 +
              fVar438 * fStack_388 + fVar385 * fStack_468 + fVar299 * fStack_3e8;
    fVar392 = fVar391 + fVar404 + auVar410._28_4_ + fVar228;
    local_840._0_4_ =
         (float)local_1e0._0_4_ * fVar405 +
         (float)local_200._0_4_ * fVar423 +
         fVar355 * (float)local_220._0_4_ + fVar275 * (float)local_420._0_4_;
    local_840._4_4_ =
         (float)local_1e0._4_4_ * fVar411 +
         (float)local_200._4_4_ * fVar432 +
         fVar365 * (float)local_220._4_4_ + fVar276 * (float)local_420._4_4_;
    local_840._8_4_ =
         fStack_1d8 * fVar413 + fStack_1f8 * fVar434 + fVar369 * fStack_218 + fVar278 * fStack_418;
    local_840._12_4_ =
         fStack_1d4 * fVar415 + fStack_1f4 * fVar435 + fVar373 * fStack_214 + fVar293 * fStack_414;
    local_840._16_4_ =
         fStack_1d0 * fVar417 + fStack_1f0 * fVar436 + fVar377 * fStack_210 + fVar295 * fStack_410;
    local_840._20_4_ =
         fStack_1cc * fVar419 + fStack_1ec * fVar437 + fVar381 * fStack_20c + fVar297 * fStack_40c;
    local_840._24_4_ =
         fStack_1c8 * fVar421 + fStack_1e8 * fVar438 + fVar385 * fStack_208 + fVar299 * fStack_408;
    local_840._28_4_ = fVar392 + fVar228 + 2.0 + -fVar251 + -3.0;
    auVar29._4_4_ = (fVar230 + fVar230) * auVar223._4_4_;
    auVar29._0_4_ = (fVar229 + fVar229) * auVar223._0_4_;
    auVar29._8_4_ = (fVar231 + fVar231) * auVar223._8_4_;
    auVar29._12_4_ = (fVar232 + fVar232) * auVar223._12_4_;
    auVar29._16_4_ = (fVar233 + fVar233) * auVar223._16_4_;
    auVar29._20_4_ = (fVar234 + fVar234) * auVar223._20_4_;
    auVar29._24_4_ = (fVar249 + fVar249) * auVar223._24_4_;
    auVar29._28_4_ = auVar223._28_4_ + auVar223._28_4_;
    auVar128 = vsubps_avx(auVar29,auVar290._0_32_);
    fVar299 = auVar245._28_4_ + 2.0;
    auVar30._4_4_ = (fVar230 + fVar230) * (fVar253 + 2.0);
    auVar30._0_4_ = (fVar229 + fVar229) * (fVar252 + 2.0);
    auVar30._8_4_ = (fVar231 + fVar231) * (fVar254 + 2.0);
    auVar30._12_4_ = (fVar232 + fVar232) * (fVar255 + 2.0);
    auVar30._16_4_ = (fVar233 + fVar233) * (fVar272 + 2.0);
    auVar30._20_4_ = (fVar234 + fVar234) * (fVar273 + 2.0);
    auVar30._24_4_ = (fVar249 + fVar249) * (fVar274 + 2.0);
    auVar30._28_4_ = fVar299;
    auVar31._4_4_ = fVar230 * fVar230 * 3.0;
    auVar31._0_4_ = fVar229 * fVar229 * 3.0;
    auVar31._8_4_ = fVar231 * fVar231 * 3.0;
    auVar31._12_4_ = fVar232 * fVar232 * 3.0;
    auVar31._16_4_ = fVar233 * fVar233 * 3.0;
    auVar31._20_4_ = fVar234 * fVar234 * 3.0;
    auVar31._24_4_ = fVar249 * fVar249 * 3.0;
    auVar31._28_4_ = fVar251;
    auVar136 = vsubps_avx(auVar30,auVar31);
    auVar12 = vsubps_avx(_local_c00,auVar29);
    fVar377 = auVar128._0_4_ * 0.5;
    fVar381 = auVar128._4_4_ * 0.5;
    fVar385 = auVar128._8_4_ * 0.5;
    fVar398 = auVar128._12_4_ * 0.5;
    fVar404 = auVar128._16_4_ * 0.5;
    fVar405 = auVar128._20_4_ * 0.5;
    fVar411 = auVar128._24_4_ * 0.5;
    fVar278 = (auVar223._0_4_ * fVar252 + (auVar223._0_4_ + auVar223._0_4_) * (fVar252 + -5.0)) *
              0.5;
    fVar293 = (auVar223._4_4_ * fVar253 + (auVar223._4_4_ + auVar223._4_4_) * (fVar253 + -5.0)) *
              0.5;
    fVar295 = (auVar223._8_4_ * fVar254 + (auVar223._8_4_ + auVar223._8_4_) * (fVar254 + -5.0)) *
              0.5;
    fVar355 = (auVar223._12_4_ * fVar255 + (auVar223._12_4_ + auVar223._12_4_) * (fVar255 + -5.0)) *
              0.5;
    fVar365 = (auVar223._16_4_ * fVar272 + (auVar223._16_4_ + auVar223._16_4_) * (fVar272 + -5.0)) *
              0.5;
    fVar369 = (auVar223._20_4_ * fVar273 + (auVar223._20_4_ + auVar223._20_4_) * (fVar273 + -5.0)) *
              0.5;
    fVar373 = (auVar223._24_4_ * fVar274 + (auVar223._24_4_ + auVar223._24_4_) * (fVar274 + -5.0)) *
              0.5;
    fVar228 = auVar136._0_4_ * 0.5;
    fVar229 = auVar136._4_4_ * 0.5;
    fVar230 = auVar136._8_4_ * 0.5;
    fVar231 = auVar136._12_4_ * 0.5;
    fVar232 = auVar136._16_4_ * 0.5;
    fVar233 = auVar136._20_4_ * 0.5;
    fVar252 = auVar136._24_4_ * 0.5;
    fVar234 = auVar12._0_4_ * 0.5;
    fVar249 = auVar12._4_4_ * 0.5;
    fVar253 = auVar12._8_4_ * 0.5;
    fVar254 = auVar12._12_4_ * 0.5;
    fVar255 = auVar12._16_4_ * 0.5;
    fVar275 = auVar12._20_4_ * 0.5;
    fVar276 = auVar12._24_4_ * 0.5;
    fVar354 = fVar251 + fVar251 + auVar128._28_4_;
    fVar325 = fVar354 + fVar251 + fVar251 + 2.0;
    fVar299 = fVar299 + auVar223._28_4_ + auVar245._28_4_ + -5.0 + auVar136._28_4_ + auVar12._28_4_;
    auVar236 = vpermilps_avx(ZEXT416((uint)(fVar250 * 0.04761905)),0);
    fVar273 = auVar236._0_4_;
    fVar301 = fVar273 * (fVar377 * (float)local_340._0_4_ +
                        fVar278 * (float)local_360._0_4_ +
                        fVar228 * (float)local_3c0._0_4_ + fVar234 * (float)local_440._0_4_);
    fVar274 = auVar236._4_4_;
    fVar314 = fVar274 * (fVar381 * (float)local_340._4_4_ +
                        fVar293 * (float)local_360._4_4_ +
                        fVar229 * (float)local_3c0._4_4_ + fVar249 * (float)local_440._4_4_);
    auVar32._4_4_ = fVar314;
    auVar32._0_4_ = fVar301;
    fVar297 = auVar236._8_4_;
    fVar315 = fVar297 * (fVar385 * fStack_338 +
                        fVar295 * fStack_358 + fVar230 * fStack_3b8 + fVar253 * fStack_438);
    auVar32._8_4_ = fVar315;
    fVar272 = auVar236._12_4_;
    fVar317 = fVar272 * (fVar398 * fStack_334 +
                        fVar355 * fStack_354 + fVar231 * fStack_3b4 + fVar254 * fStack_434);
    auVar32._12_4_ = fVar317;
    fVar319 = fVar273 * (fVar404 * fStack_330 +
                        fVar365 * fStack_350 + fVar232 * fStack_3b0 + fVar255 * fStack_430);
    auVar32._16_4_ = fVar319;
    fVar321 = fVar274 * (fVar405 * fStack_32c +
                        fVar369 * fStack_34c + fVar233 * fStack_3ac + fVar275 * fStack_42c);
    auVar32._20_4_ = fVar321;
    fVar323 = fVar297 * (fVar411 * fStack_328 +
                        fVar373 * fStack_348 + fVar252 * fStack_3a8 + fVar276 * fStack_428);
    auVar32._24_4_ = fVar323;
    auVar32._28_4_ = fVar325;
    fVar326 = fVar273 * ((float)local_1a0._0_4_ * fVar377 +
                        fVar278 * (float)local_380._0_4_ +
                        fVar228 * (float)local_3e0._0_4_ + fVar234 * (float)local_460._0_4_);
    fVar336 = fVar274 * ((float)local_1a0._4_4_ * fVar381 +
                        fVar293 * (float)local_380._4_4_ +
                        fVar229 * (float)local_3e0._4_4_ + fVar249 * (float)local_460._4_4_);
    local_960._4_4_ = fVar336;
    local_960._0_4_ = fVar326;
    fVar339 = fVar297 * (fStack_198 * fVar385 +
                        fVar295 * fStack_378 + fVar230 * fStack_3d8 + fVar253 * fStack_458);
    local_960._8_4_ = fVar339;
    fVar342 = fVar272 * (fStack_194 * fVar398 +
                        fVar355 * fStack_374 + fVar231 * fStack_3d4 + fVar254 * fStack_454);
    local_960._12_4_ = fVar342;
    fVar345 = fVar273 * (fStack_190 * fVar404 +
                        fVar365 * fStack_370 + fVar232 * fStack_3d0 + fVar255 * fStack_450);
    local_960._16_4_ = fVar345;
    fVar348 = fVar274 * (fStack_18c * fVar405 +
                        fVar369 * fStack_36c + fVar233 * fStack_3cc + fVar275 * fStack_44c);
    local_960._20_4_ = fVar348;
    fVar351 = fVar297 * (fStack_188 * fVar411 +
                        fVar373 * fStack_368 + fVar252 * fStack_3c8 + fVar276 * fStack_448);
    local_960._24_4_ = fVar351;
    local_960._28_4_ = fVar354;
    fVar406 = fVar273 * ((float)local_1c0._0_4_ * fVar377 +
                        fVar228 * (float)local_400._0_4_ + fVar234 * (float)local_480._0_4_ +
                        fVar278 * (float)local_3a0._0_4_);
    fVar412 = fVar274 * ((float)local_1c0._4_4_ * fVar381 +
                        fVar229 * (float)local_400._4_4_ + fVar249 * (float)local_480._4_4_ +
                        fVar293 * (float)local_3a0._4_4_);
    auVar33._4_4_ = fVar412;
    auVar33._0_4_ = fVar406;
    fVar414 = fVar297 * (fStack_1b8 * fVar385 +
                        fVar230 * fStack_3f8 + fVar253 * fStack_478 + fVar295 * fStack_398);
    auVar33._8_4_ = fVar414;
    fVar416 = fVar272 * (fStack_1b4 * fVar398 +
                        fVar231 * fStack_3f4 + fVar254 * fStack_474 + fVar355 * fStack_394);
    auVar33._12_4_ = fVar416;
    fVar418 = fVar273 * (fStack_1b0 * fVar404 +
                        fVar232 * fStack_3f0 + fVar255 * fStack_470 + fVar365 * fStack_390);
    auVar33._16_4_ = fVar418;
    fVar420 = fVar274 * (fStack_1ac * fVar405 +
                        fVar233 * fStack_3ec + fVar275 * fStack_46c + fVar369 * fStack_38c);
    auVar33._20_4_ = fVar420;
    fVar422 = fVar297 * (fStack_1a8 * fVar411 +
                        fVar252 * fStack_3e8 + fVar276 * fStack_468 + fVar373 * fStack_388);
    auVar33._24_4_ = fVar422;
    auVar33._28_4_ = -auVar223._28_4_;
    fVar234 = fVar273 * ((float)local_1e0._0_4_ * fVar377 +
                        (float)local_200._0_4_ * fVar278 +
                        fVar228 * (float)local_420._0_4_ + (float)local_220._0_4_ * fVar234);
    fVar249 = fVar274 * ((float)local_1e0._4_4_ * fVar381 +
                        (float)local_200._4_4_ * fVar293 +
                        fVar229 * (float)local_420._4_4_ + (float)local_220._4_4_ * fVar249);
    auVar34._4_4_ = fVar249;
    auVar34._0_4_ = fVar234;
    fVar250 = fVar297 * (fStack_1d8 * fVar385 +
                        fStack_1f8 * fVar295 + fVar230 * fStack_418 + fStack_218 * fVar253);
    auVar34._8_4_ = fVar250;
    fVar272 = fVar272 * (fStack_1d4 * fVar398 +
                        fStack_1f4 * fVar355 + fVar231 * fStack_414 + fStack_214 * fVar254);
    auVar34._12_4_ = fVar272;
    fVar273 = fVar273 * (fStack_1d0 * fVar404 +
                        fStack_1f0 * fVar365 + fVar232 * fStack_410 + fStack_210 * fVar255);
    auVar34._16_4_ = fVar273;
    fVar274 = fVar274 * (fStack_1cc * fVar405 +
                        fStack_1ec * fVar369 + fVar233 * fStack_40c + fStack_20c * fVar275);
    auVar34._20_4_ = fVar274;
    fVar297 = fVar297 * (fStack_1c8 * fVar411 +
                        fStack_1e8 * fVar373 + fVar252 * fStack_408 + fStack_208 * fVar276);
    auVar34._24_4_ = fVar297;
    auVar34._28_4_ = fVar299;
    auVar92._4_4_ = fVar367;
    auVar92._0_4_ = fVar357;
    auVar92._8_4_ = fVar371;
    auVar92._12_4_ = fVar375;
    auVar92._16_4_ = fVar379;
    auVar92._20_4_ = fVar383;
    auVar92._24_4_ = fVar387;
    auVar92._28_4_ = fVar391;
    auVar128 = vperm2f128_avx(auVar92,auVar92,1);
    auVar128 = vshufps_avx(auVar128,auVar92,0x30);
    local_a60 = vshufps_avx(auVar92,auVar128,0x29);
    auVar94._4_4_ = fVar368;
    auVar94._0_4_ = fVar358;
    auVar94._8_4_ = fVar372;
    auVar94._12_4_ = fVar376;
    auVar94._16_4_ = fVar380;
    auVar94._20_4_ = fVar384;
    auVar94._24_4_ = fVar388;
    auVar94._28_4_ = fVar392;
    auVar128 = vperm2f128_avx(auVar94,auVar94,1);
    auVar128 = vshufps_avx(auVar128,auVar94,0x30);
    auVar14 = vshufps_avx(auVar94,auVar128,0x29);
    auVar136 = vsubps_avx(local_840,auVar34);
    auVar128 = vperm2f128_avx(auVar136,auVar136,1);
    auVar128 = vshufps_avx(auVar128,auVar136,0x30);
    auVar15 = vshufps_avx(auVar136,auVar128,0x29);
    auVar12 = vsubps_avx(local_a60,auVar92);
    auVar13 = vsubps_avx(auVar14,auVar94);
    fVar229 = auVar12._0_4_;
    fVar251 = auVar12._4_4_;
    auVar35._4_4_ = fVar412 * fVar251;
    auVar35._0_4_ = fVar406 * fVar229;
    fVar275 = auVar12._8_4_;
    auVar35._8_4_ = fVar414 * fVar275;
    fVar365 = auVar12._12_4_;
    auVar35._12_4_ = fVar416 * fVar365;
    fVar405 = auVar12._16_4_;
    auVar35._16_4_ = fVar418 * fVar405;
    fVar432 = auVar12._20_4_;
    auVar35._20_4_ = fVar420 * fVar432;
    fVar20 = auVar12._24_4_;
    auVar35._24_4_ = fVar422 * fVar20;
    auVar35._28_4_ = auVar136._28_4_;
    fVar230 = auVar13._0_4_;
    fVar252 = auVar13._4_4_;
    auVar36._4_4_ = fVar336 * fVar252;
    auVar36._0_4_ = fVar326 * fVar230;
    fVar276 = auVar13._8_4_;
    auVar36._8_4_ = fVar339 * fVar276;
    fVar369 = auVar13._12_4_;
    auVar36._12_4_ = fVar342 * fVar369;
    fVar411 = auVar13._16_4_;
    auVar36._16_4_ = fVar345 * fVar411;
    fVar434 = auVar13._20_4_;
    auVar36._20_4_ = fVar348 * fVar434;
    fVar21 = auVar13._24_4_;
    auVar36._24_4_ = fVar351 * fVar21;
    auVar36._28_4_ = auVar128._28_4_;
    auVar17 = vsubps_avx(auVar36,auVar35);
    auVar96._4_4_ = fVar366;
    auVar96._0_4_ = fVar356;
    auVar96._8_4_ = fVar370;
    auVar96._12_4_ = fVar374;
    auVar96._16_4_ = fVar378;
    auVar96._20_4_ = fVar382;
    auVar96._24_4_ = fVar386;
    auVar96._28_4_ = fVar390;
    auVar128 = vperm2f128_avx(auVar96,auVar96,1);
    auVar128 = vshufps_avx(auVar128,auVar96,0x30);
    auVar364 = vshufps_avx(auVar96,auVar128,0x29);
    auVar136 = vsubps_avx(auVar364,auVar96);
    auVar37._4_4_ = fVar252 * fVar314;
    auVar37._0_4_ = fVar230 * fVar301;
    auVar37._8_4_ = fVar276 * fVar315;
    auVar37._12_4_ = fVar369 * fVar317;
    auVar37._16_4_ = fVar411 * fVar319;
    auVar37._20_4_ = fVar434 * fVar321;
    auVar37._24_4_ = fVar21 * fVar323;
    auVar37._28_4_ = auVar128._28_4_;
    fVar231 = auVar136._0_4_;
    fVar253 = auVar136._4_4_;
    auVar38._4_4_ = fVar412 * fVar253;
    auVar38._0_4_ = fVar406 * fVar231;
    fVar278 = auVar136._8_4_;
    auVar38._8_4_ = fVar414 * fVar278;
    fVar373 = auVar136._12_4_;
    auVar38._12_4_ = fVar416 * fVar373;
    fVar413 = auVar136._16_4_;
    auVar38._16_4_ = fVar418 * fVar413;
    fVar435 = auVar136._20_4_;
    auVar38._20_4_ = fVar420 * fVar435;
    fVar22 = auVar136._24_4_;
    auVar38._24_4_ = fVar422 * fVar22;
    auVar38._28_4_ = fVar390;
    auVar27 = vsubps_avx(auVar38,auVar37);
    auVar39._4_4_ = fVar336 * fVar253;
    auVar39._0_4_ = fVar326 * fVar231;
    auVar39._8_4_ = fVar339 * fVar278;
    auVar39._12_4_ = fVar342 * fVar373;
    auVar39._16_4_ = fVar345 * fVar413;
    auVar39._20_4_ = fVar348 * fVar435;
    auVar39._24_4_ = fVar351 * fVar22;
    auVar39._28_4_ = fVar390;
    auVar40._4_4_ = fVar251 * fVar314;
    auVar40._0_4_ = fVar229 * fVar301;
    auVar40._8_4_ = fVar275 * fVar315;
    auVar40._12_4_ = fVar365 * fVar317;
    auVar40._16_4_ = fVar405 * fVar319;
    auVar40._20_4_ = fVar432 * fVar321;
    auVar40._24_4_ = fVar20 * fVar323;
    auVar40._28_4_ = fVar392;
    auVar28 = vsubps_avx(auVar40,auVar39);
    fVar228 = auVar28._28_4_;
    fVar355 = auVar27._28_4_ + fVar228;
    auVar224._0_4_ = fVar231 * fVar231 + fVar229 * fVar229 + fVar230 * fVar230;
    auVar224._4_4_ = fVar253 * fVar253 + fVar251 * fVar251 + fVar252 * fVar252;
    auVar224._8_4_ = fVar278 * fVar278 + fVar275 * fVar275 + fVar276 * fVar276;
    auVar224._12_4_ = fVar373 * fVar373 + fVar365 * fVar365 + fVar369 * fVar369;
    auVar224._16_4_ = fVar413 * fVar413 + fVar405 * fVar405 + fVar411 * fVar411;
    auVar224._20_4_ = fVar435 * fVar435 + fVar432 * fVar432 + fVar434 * fVar434;
    auVar224._24_4_ = fVar22 * fVar22 + fVar20 * fVar20 + fVar21 * fVar21;
    auVar224._28_4_ = fVar228 + fVar228 + fVar355;
    auVar128 = vrcpps_avx(auVar224);
    fVar385 = auVar128._0_4_;
    fVar398 = auVar128._4_4_;
    auVar41._4_4_ = fVar398 * auVar224._4_4_;
    auVar41._0_4_ = fVar385 * auVar224._0_4_;
    fVar404 = auVar128._8_4_;
    auVar41._8_4_ = fVar404 * auVar224._8_4_;
    fVar419 = auVar128._12_4_;
    auVar41._12_4_ = fVar419 * auVar224._12_4_;
    fVar421 = auVar128._16_4_;
    auVar41._16_4_ = fVar421 * auVar224._16_4_;
    fVar423 = auVar128._20_4_;
    auVar41._20_4_ = fVar423 * auVar224._20_4_;
    fVar438 = auVar128._24_4_;
    auVar41._24_4_ = fVar438 * auVar224._24_4_;
    auVar41._28_4_ = fVar392;
    auVar133._8_4_ = 0x3f800000;
    auVar133._0_8_ = &DAT_3f8000003f800000;
    auVar133._12_4_ = 0x3f800000;
    auVar133._16_4_ = 0x3f800000;
    auVar133._20_4_ = 0x3f800000;
    auVar133._24_4_ = 0x3f800000;
    auVar133._28_4_ = 0x3f800000;
    auVar129 = vsubps_avx(auVar133,auVar41);
    fVar385 = auVar129._0_4_ * fVar385 + fVar385;
    fVar398 = auVar129._4_4_ * fVar398 + fVar398;
    fVar404 = auVar129._8_4_ * fVar404 + fVar404;
    fVar419 = auVar129._12_4_ * fVar419 + fVar419;
    fVar421 = auVar129._16_4_ * fVar421 + fVar421;
    fVar423 = auVar129._20_4_ * fVar423 + fVar423;
    fVar438 = auVar129._24_4_ * fVar438 + fVar438;
    auVar12 = vperm2f128_avx(local_960,local_960,1);
    auVar12 = vshufps_avx(auVar12,local_960,0x30);
    auVar12 = vshufps_avx(local_960,auVar12,0x29);
    auVar13 = vperm2f128_avx(auVar33,auVar33,1);
    auVar13 = vshufps_avx(auVar13,auVar33,0x30);
    auVar16 = vshufps_avx(auVar33,auVar13,0x29);
    fVar327 = auVar16._0_4_;
    fVar337 = auVar16._4_4_;
    auVar42._4_4_ = fVar337 * fVar251;
    auVar42._0_4_ = fVar327 * fVar229;
    fVar340 = auVar16._8_4_;
    auVar42._8_4_ = fVar340 * fVar275;
    fVar343 = auVar16._12_4_;
    auVar42._12_4_ = fVar343 * fVar365;
    fVar346 = auVar16._16_4_;
    auVar42._16_4_ = fVar346 * fVar405;
    fVar349 = auVar16._20_4_;
    auVar42._20_4_ = fVar349 * fVar432;
    fVar352 = auVar16._24_4_;
    auVar42._24_4_ = fVar352 * fVar20;
    auVar42._28_4_ = auVar13._28_4_;
    fVar232 = auVar12._0_4_;
    fVar254 = auVar12._4_4_;
    auVar43._4_4_ = fVar252 * fVar254;
    auVar43._0_4_ = fVar230 * fVar232;
    fVar293 = auVar12._8_4_;
    auVar43._8_4_ = fVar276 * fVar293;
    fVar377 = auVar12._12_4_;
    auVar43._12_4_ = fVar369 * fVar377;
    fVar415 = auVar12._16_4_;
    auVar43._16_4_ = fVar411 * fVar415;
    fVar436 = auVar12._20_4_;
    auVar43._20_4_ = fVar434 * fVar436;
    fVar23 = auVar12._24_4_;
    auVar43._24_4_ = fVar21 * fVar23;
    auVar43._28_4_ = -auVar223._28_4_;
    auVar13 = vsubps_avx(auVar43,auVar42);
    auVar12 = vperm2f128_avx(auVar32,auVar32,1);
    auVar12 = vshufps_avx(auVar12,auVar32,0x30);
    local_820 = vshufps_avx(auVar32,auVar12,0x29);
    fVar233 = local_820._0_4_;
    fVar255 = local_820._4_4_;
    auVar44._4_4_ = fVar252 * fVar255;
    auVar44._0_4_ = fVar230 * fVar233;
    fVar295 = local_820._8_4_;
    auVar44._8_4_ = fVar276 * fVar295;
    fVar381 = local_820._12_4_;
    auVar44._12_4_ = fVar369 * fVar381;
    fVar417 = local_820._16_4_;
    auVar44._16_4_ = fVar411 * fVar417;
    fVar437 = local_820._20_4_;
    auVar44._20_4_ = fVar434 * fVar437;
    fVar24 = local_820._24_4_;
    auVar44._24_4_ = fVar21 * fVar24;
    auVar44._28_4_ = auVar12._28_4_;
    auVar45._4_4_ = fVar337 * fVar253;
    auVar45._0_4_ = fVar327 * fVar231;
    auVar45._8_4_ = fVar340 * fVar278;
    auVar45._12_4_ = fVar343 * fVar373;
    auVar45._16_4_ = fVar346 * fVar413;
    auVar45._20_4_ = fVar349 * fVar435;
    auVar45._24_4_ = fVar352 * fVar22;
    auVar45._28_4_ = uStack_184;
    auVar130 = vsubps_avx(auVar45,auVar44);
    auVar46._4_4_ = fVar253 * fVar254;
    auVar46._0_4_ = fVar231 * fVar232;
    auVar46._8_4_ = fVar278 * fVar293;
    auVar46._12_4_ = fVar373 * fVar377;
    auVar46._16_4_ = fVar413 * fVar415;
    auVar46._20_4_ = fVar435 * fVar436;
    auVar46._24_4_ = fVar22 * fVar23;
    auVar46._28_4_ = uStack_184;
    auVar47._4_4_ = fVar251 * fVar255;
    auVar47._0_4_ = fVar229 * fVar233;
    auVar47._8_4_ = fVar275 * fVar295;
    auVar47._12_4_ = fVar365 * fVar381;
    auVar47._16_4_ = fVar405 * fVar417;
    auVar47._20_4_ = fVar432 * fVar437;
    auVar47._24_4_ = fVar20 * fVar24;
    auVar47._28_4_ = fStack_1a4;
    auVar12 = vsubps_avx(auVar47,auVar46);
    fVar228 = auVar12._28_4_;
    auVar48._4_4_ =
         (auVar17._4_4_ * auVar17._4_4_ +
         auVar27._4_4_ * auVar27._4_4_ + auVar28._4_4_ * auVar28._4_4_) * fVar398;
    auVar48._0_4_ =
         (auVar17._0_4_ * auVar17._0_4_ +
         auVar27._0_4_ * auVar27._0_4_ + auVar28._0_4_ * auVar28._0_4_) * fVar385;
    auVar48._8_4_ =
         (auVar17._8_4_ * auVar17._8_4_ +
         auVar27._8_4_ * auVar27._8_4_ + auVar28._8_4_ * auVar28._8_4_) * fVar404;
    auVar48._12_4_ =
         (auVar17._12_4_ * auVar17._12_4_ +
         auVar27._12_4_ * auVar27._12_4_ + auVar28._12_4_ * auVar28._12_4_) * fVar419;
    auVar48._16_4_ =
         (auVar17._16_4_ * auVar17._16_4_ +
         auVar27._16_4_ * auVar27._16_4_ + auVar28._16_4_ * auVar28._16_4_) * fVar421;
    auVar48._20_4_ =
         (auVar17._20_4_ * auVar17._20_4_ +
         auVar27._20_4_ * auVar27._20_4_ + auVar28._20_4_ * auVar28._20_4_) * fVar423;
    auVar48._24_4_ =
         (auVar17._24_4_ * auVar17._24_4_ +
         auVar27._24_4_ * auVar27._24_4_ + auVar28._24_4_ * auVar28._24_4_) * fVar438;
    auVar48._28_4_ = auVar17._28_4_ + fVar355;
    auVar49._4_4_ =
         (auVar13._4_4_ * auVar13._4_4_ +
         auVar130._4_4_ * auVar130._4_4_ + auVar12._4_4_ * auVar12._4_4_) * fVar398;
    auVar49._0_4_ =
         (auVar13._0_4_ * auVar13._0_4_ +
         auVar130._0_4_ * auVar130._0_4_ + auVar12._0_4_ * auVar12._0_4_) * fVar385;
    auVar49._8_4_ =
         (auVar13._8_4_ * auVar13._8_4_ +
         auVar130._8_4_ * auVar130._8_4_ + auVar12._8_4_ * auVar12._8_4_) * fVar404;
    auVar49._12_4_ =
         (auVar13._12_4_ * auVar13._12_4_ +
         auVar130._12_4_ * auVar130._12_4_ + auVar12._12_4_ * auVar12._12_4_) * fVar419;
    auVar49._16_4_ =
         (auVar13._16_4_ * auVar13._16_4_ +
         auVar130._16_4_ * auVar130._16_4_ + auVar12._16_4_ * auVar12._16_4_) * fVar421;
    auVar49._20_4_ =
         (auVar13._20_4_ * auVar13._20_4_ +
         auVar130._20_4_ * auVar130._20_4_ + auVar12._20_4_ * auVar12._20_4_) * fVar423;
    auVar49._24_4_ =
         (auVar13._24_4_ * auVar13._24_4_ +
         auVar130._24_4_ * auVar130._24_4_ + auVar12._24_4_ * auVar12._24_4_) * fVar438;
    auVar49._28_4_ = auVar129._28_4_ + auVar128._28_4_;
    auVar128 = vmaxps_avx(auVar48,auVar49);
    auVar12 = vperm2f128_avx(local_840,local_840,1);
    auVar12 = vshufps_avx(auVar12,local_840,0x30);
    auVar17 = vshufps_avx(local_840,auVar12,0x29);
    auVar167._0_4_ = (float)local_840._0_4_ + fVar234;
    auVar167._4_4_ = local_840._4_4_ + fVar249;
    auVar167._8_4_ = local_840._8_4_ + fVar250;
    auVar167._12_4_ = local_840._12_4_ + fVar272;
    auVar167._16_4_ = local_840._16_4_ + fVar273;
    auVar167._20_4_ = local_840._20_4_ + fVar274;
    auVar167._24_4_ = local_840._24_4_ + fVar297;
    auVar167._28_4_ = local_840._28_4_ + fVar299;
    auVar12 = vmaxps_avx(local_840,auVar167);
    auVar13 = vmaxps_avx(auVar15,auVar17);
    auVar12 = vmaxps_avx(auVar12,auVar13);
    auVar13 = vrsqrtps_avx(auVar224);
    fVar234 = auVar13._0_4_;
    fVar249 = auVar13._4_4_;
    fVar250 = auVar13._8_4_;
    fVar272 = auVar13._12_4_;
    fVar273 = auVar13._16_4_;
    fVar274 = auVar13._20_4_;
    fVar297 = auVar13._24_4_;
    auVar50._4_4_ = fVar249 * fVar249 * fVar249 * auVar224._4_4_ * 0.5;
    auVar50._0_4_ = fVar234 * fVar234 * fVar234 * auVar224._0_4_ * 0.5;
    auVar50._8_4_ = fVar250 * fVar250 * fVar250 * auVar224._8_4_ * 0.5;
    auVar50._12_4_ = fVar272 * fVar272 * fVar272 * auVar224._12_4_ * 0.5;
    auVar50._16_4_ = fVar273 * fVar273 * fVar273 * auVar224._16_4_ * 0.5;
    auVar50._20_4_ = fVar274 * fVar274 * fVar274 * auVar224._20_4_ * 0.5;
    auVar50._24_4_ = fVar297 * fVar297 * fVar297 * auVar224._24_4_ * 0.5;
    auVar50._28_4_ = auVar224._28_4_;
    auVar51._4_4_ = fVar249 * 1.5;
    auVar51._0_4_ = fVar234 * 1.5;
    auVar51._8_4_ = fVar250 * 1.5;
    auVar51._12_4_ = fVar272 * 1.5;
    auVar51._16_4_ = fVar273 * 1.5;
    auVar51._20_4_ = fVar274 * 1.5;
    auVar51._24_4_ = fVar297 * 1.5;
    auVar51._28_4_ = auVar13._28_4_;
    auVar27 = vsubps_avx(auVar51,auVar50);
    auVar93._4_4_ = fVar367;
    auVar93._0_4_ = fVar357;
    auVar93._8_4_ = fVar371;
    auVar93._12_4_ = fVar375;
    auVar93._16_4_ = fVar379;
    auVar93._20_4_ = fVar383;
    auVar93._24_4_ = fVar387;
    auVar93._28_4_ = fVar391;
    auVar13 = vsubps_avx(ZEXT832(0) << 0x20,auVar93);
    auVar95._4_4_ = fVar368;
    auVar95._0_4_ = fVar358;
    auVar95._8_4_ = fVar372;
    auVar95._12_4_ = fVar376;
    auVar95._16_4_ = fVar380;
    auVar95._20_4_ = fVar384;
    auVar95._24_4_ = fVar388;
    auVar95._28_4_ = fVar392;
    local_9a0 = vsubps_avx(ZEXT832(0) << 0x20,auVar95);
    fVar234 = local_9a0._0_4_;
    fVar272 = local_9a0._4_4_;
    fVar297 = local_9a0._8_4_;
    fVar385 = local_9a0._12_4_;
    fVar419 = local_9a0._16_4_;
    fVar438 = local_9a0._20_4_;
    fVar25 = local_9a0._24_4_;
    fVar249 = auVar13._0_4_;
    fVar273 = auVar13._4_4_;
    fVar299 = auVar13._8_4_;
    fVar398 = auVar13._12_4_;
    fVar421 = auVar13._16_4_;
    fVar19 = auVar13._20_4_;
    fVar26 = auVar13._24_4_;
    auVar97._4_4_ = fVar366;
    auVar97._0_4_ = fVar356;
    auVar97._8_4_ = fVar370;
    auVar97._12_4_ = fVar374;
    auVar97._16_4_ = fVar378;
    auVar97._20_4_ = fVar382;
    auVar97._24_4_ = fVar386;
    auVar97._28_4_ = fVar390;
    auVar28 = vsubps_avx(ZEXT832(0) << 0x20,auVar97);
    auVar335 = ZEXT3264(auVar28);
    fVar328 = auVar28._0_4_;
    fVar338 = auVar28._4_4_;
    fVar341 = auVar28._8_4_;
    fVar344 = auVar28._12_4_;
    fVar347 = auVar28._16_4_;
    fVar350 = auVar28._20_4_;
    fVar353 = auVar28._24_4_;
    auVar408._0_4_ =
         fVar328 * (float)local_860._0_4_ +
         (float)local_880._0_4_ * fVar249 + (float)local_8a0._0_4_ * fVar234;
    auVar408._4_4_ =
         fVar338 * (float)local_860._4_4_ +
         (float)local_880._4_4_ * fVar273 + (float)local_8a0._4_4_ * fVar272;
    auVar408._8_4_ = fVar341 * fStack_858 + fStack_878 * fVar299 + fStack_898 * fVar297;
    auVar408._12_4_ = fVar344 * fStack_854 + fStack_874 * fVar398 + fStack_894 * fVar385;
    auVar408._16_4_ = fVar347 * fStack_850 + fStack_870 * fVar421 + fStack_890 * fVar419;
    auVar408._20_4_ = fVar350 * fStack_84c + fStack_86c * fVar19 + fStack_88c * fVar438;
    auVar408._24_4_ = fVar353 * fStack_848 + fStack_868 * fVar26 + fStack_888 * fVar25;
    auVar408._28_4_ = fVar228 + fVar228 + auVar130._28_4_ + fVar228;
    auVar428._0_4_ = fVar328 * fVar328 + fVar249 * fVar249 + fVar234 * fVar234;
    auVar428._4_4_ = fVar338 * fVar338 + fVar273 * fVar273 + fVar272 * fVar272;
    auVar428._8_4_ = fVar341 * fVar341 + fVar299 * fVar299 + fVar297 * fVar297;
    auVar428._12_4_ = fVar344 * fVar344 + fVar398 * fVar398 + fVar385 * fVar385;
    auVar428._16_4_ = fVar347 * fVar347 + fVar421 * fVar421 + fVar419 * fVar419;
    auVar428._20_4_ = fVar350 * fVar350 + fVar19 * fVar19 + fVar438 * fVar438;
    auVar428._24_4_ = fVar353 * fVar353 + fVar26 * fVar26 + fVar25 * fVar25;
    auVar428._28_4_ = fStack_1a4 + fStack_1a4 + fVar228;
    fVar250 = auVar27._0_4_;
    fVar274 = auVar27._4_4_;
    fVar355 = auVar27._8_4_;
    fVar404 = auVar27._12_4_;
    fVar423 = auVar27._16_4_;
    fVar277 = auVar27._20_4_;
    fVar279 = auVar27._24_4_;
    local_520 = (float)local_860._0_4_ * fVar231 * fVar250 +
                fVar229 * fVar250 * (float)local_880._0_4_ +
                fVar230 * fVar250 * (float)local_8a0._0_4_;
    fStack_51c = (float)local_860._4_4_ * fVar253 * fVar274 +
                 fVar251 * fVar274 * (float)local_880._4_4_ +
                 fVar252 * fVar274 * (float)local_8a0._4_4_;
    fStack_518 = fStack_858 * fVar278 * fVar355 +
                 fVar275 * fVar355 * fStack_878 + fVar276 * fVar355 * fStack_898;
    fStack_514 = fStack_854 * fVar373 * fVar404 +
                 fVar365 * fVar404 * fStack_874 + fVar369 * fVar404 * fStack_894;
    fStack_510 = fStack_850 * fVar413 * fVar423 +
                 fVar405 * fVar423 * fStack_870 + fVar411 * fVar423 * fStack_890;
    fStack_50c = fStack_84c * fVar435 * fVar277 +
                 fVar432 * fVar277 * fStack_86c + fVar434 * fVar277 * fStack_88c;
    fStack_508 = fStack_848 * fVar22 * fVar279 +
                 fVar20 * fVar279 * fStack_868 + fVar21 * fVar279 * fStack_888;
    fVar228 = fStack_844 + fStack_864 + fStack_884;
    local_540._0_4_ =
         fVar328 * fVar231 * fVar250 + fVar229 * fVar250 * fVar249 + fVar230 * fVar250 * fVar234;
    local_540._4_4_ =
         fVar338 * fVar253 * fVar274 + fVar251 * fVar274 * fVar273 + fVar252 * fVar274 * fVar272;
    local_540._8_4_ =
         fVar341 * fVar278 * fVar355 + fVar275 * fVar355 * fVar299 + fVar276 * fVar355 * fVar297;
    local_540._12_4_ =
         fVar344 * fVar373 * fVar404 + fVar365 * fVar404 * fVar398 + fVar369 * fVar404 * fVar385;
    local_540._16_4_ =
         fVar347 * fVar413 * fVar423 + fVar405 * fVar423 * fVar421 + fVar411 * fVar423 * fVar419;
    local_540._20_4_ =
         fVar350 * fVar435 * fVar277 + fVar432 * fVar277 * fVar19 + fVar434 * fVar277 * fVar438;
    local_540._24_4_ =
         fVar353 * fVar22 * fVar279 + fVar20 * fVar279 * fVar26 + fVar21 * fVar279 * fVar25;
    local_540._28_4_ = fStack_864 + fVar228;
    auVar397 = ZEXT3264(local_540);
    auVar52._4_4_ = fStack_51c * local_540._4_4_;
    auVar52._0_4_ = local_520 * local_540._0_4_;
    auVar52._8_4_ = fStack_518 * local_540._8_4_;
    auVar52._12_4_ = fStack_514 * local_540._12_4_;
    auVar52._16_4_ = fStack_510 * local_540._16_4_;
    auVar52._20_4_ = fStack_50c * local_540._20_4_;
    auVar52._24_4_ = fStack_508 * local_540._24_4_;
    auVar52._28_4_ = fVar228;
    auVar129 = vsubps_avx(auVar408,auVar52);
    auVar53._4_4_ = local_540._4_4_ * local_540._4_4_;
    auVar53._0_4_ = local_540._0_4_ * local_540._0_4_;
    auVar53._8_4_ = local_540._8_4_ * local_540._8_4_;
    auVar53._12_4_ = local_540._12_4_ * local_540._12_4_;
    auVar53._16_4_ = local_540._16_4_ * local_540._16_4_;
    auVar53._20_4_ = local_540._20_4_ * local_540._20_4_;
    auVar53._24_4_ = local_540._24_4_ * local_540._24_4_;
    auVar53._28_4_ = fStack_864;
    auVar130 = vsubps_avx(auVar428,auVar53);
    auVar13 = vsqrtps_avx(auVar128);
    fVar228 = (auVar13._0_4_ + auVar12._0_4_) * 1.0000002;
    fVar184 = (auVar13._4_4_ + auVar12._4_4_) * 1.0000002;
    fVar186 = (auVar13._8_4_ + auVar12._8_4_) * 1.0000002;
    fVar188 = (auVar13._12_4_ + auVar12._12_4_) * 1.0000002;
    fVar189 = (auVar13._16_4_ + auVar12._16_4_) * 1.0000002;
    fVar190 = (auVar13._20_4_ + auVar12._20_4_) * 1.0000002;
    fVar191 = (auVar13._24_4_ + auVar12._24_4_) * 1.0000002;
    auVar54._4_4_ = fVar184 * fVar184;
    auVar54._0_4_ = fVar228 * fVar228;
    auVar54._8_4_ = fVar186 * fVar186;
    auVar54._12_4_ = fVar188 * fVar188;
    auVar54._16_4_ = fVar189 * fVar189;
    auVar54._20_4_ = fVar190 * fVar190;
    auVar54._24_4_ = fVar191 * fVar191;
    auVar54._28_4_ = auVar13._28_4_ + auVar12._28_4_;
    fVar424 = auVar129._0_4_ + auVar129._0_4_;
    fVar433 = auVar129._4_4_ + auVar129._4_4_;
    auVar429._0_8_ = CONCAT44(fVar433,fVar424);
    auVar429._8_4_ = auVar129._8_4_ + auVar129._8_4_;
    auVar429._12_4_ = auVar129._12_4_ + auVar129._12_4_;
    auVar429._16_4_ = auVar129._16_4_ + auVar129._16_4_;
    auVar429._20_4_ = auVar129._20_4_ + auVar129._20_4_;
    auVar429._24_4_ = auVar129._24_4_ + auVar129._24_4_;
    fVar228 = auVar129._28_4_;
    auVar429._28_4_ = fVar228 + fVar228;
    auVar431 = ZEXT3264(auVar429);
    auVar12 = vsubps_avx(auVar130,auVar54);
    local_2a0._4_4_ = fStack_51c * fStack_51c;
    local_2a0._0_4_ = local_520 * local_520;
    local_2a0._8_4_ = fStack_518 * fStack_518;
    local_2a0._12_4_ = fStack_514 * fStack_514;
    local_2a0._16_4_ = fStack_510 * fStack_510;
    local_2a0._20_4_ = fStack_50c * fStack_50c;
    local_2a0._24_4_ = fStack_508 * fStack_508;
    local_2a0._28_4_ = auVar136._28_4_;
    auVar403 = ZEXT3264(local_2a0);
    auVar129 = vsubps_avx(local_240,local_2a0);
    auVar55._4_4_ = fVar433 * fVar433;
    auVar55._0_4_ = fVar424 * fVar424;
    auVar55._8_4_ = auVar429._8_4_ * auVar429._8_4_;
    auVar55._12_4_ = auVar429._12_4_ * auVar429._12_4_;
    auVar55._16_4_ = auVar429._16_4_ * auVar429._16_4_;
    auVar55._20_4_ = auVar429._20_4_ * auVar429._20_4_;
    auVar55._24_4_ = auVar429._24_4_ * auVar429._24_4_;
    auVar55._28_4_ = fVar228;
    fVar184 = auVar129._0_4_;
    fVar186 = auVar129._4_4_;
    fVar188 = auVar129._8_4_;
    fVar189 = auVar129._12_4_;
    fVar190 = auVar129._16_4_;
    fVar191 = auVar129._20_4_;
    fVar389 = auVar129._24_4_;
    auVar56._4_4_ = fVar186 * 4.0 * auVar12._4_4_;
    auVar56._0_4_ = fVar184 * 4.0 * auVar12._0_4_;
    auVar56._8_4_ = fVar188 * 4.0 * auVar12._8_4_;
    auVar56._12_4_ = fVar189 * 4.0 * auVar12._12_4_;
    auVar56._16_4_ = fVar190 * 4.0 * auVar12._16_4_;
    auVar56._20_4_ = fVar191 * 4.0 * auVar12._20_4_;
    auVar56._24_4_ = fVar389 * 4.0 * auVar12._24_4_;
    auVar56._28_4_ = 0x40800000;
    auVar163 = vsubps_avx(auVar55,auVar56);
    auVar410 = ZEXT3264(auVar163);
    auVar128 = vcmpps_avx(auVar163,ZEXT832(0) << 0x20,5);
    fVar228 = auVar129._28_4_;
    if ((((((((auVar128 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar128 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar128 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar128 >> 0x7f,0) == '\0') &&
          (auVar128 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar128 >> 0xbf,0) == '\0') &&
        (auVar128 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar128[0x1f])
    {
      auVar225._8_4_ = 0x7f800000;
      auVar225._0_8_ = 0x7f8000007f800000;
      auVar225._12_4_ = 0x7f800000;
      auVar225._16_4_ = 0x7f800000;
      auVar225._20_4_ = 0x7f800000;
      auVar225._24_4_ = 0x7f800000;
      auVar225._28_4_ = 0x7f800000;
      auVar440._8_4_ = 0xff800000;
      auVar440._0_8_ = 0xff800000ff800000;
      auVar440._12_4_ = 0xff800000;
      auVar440._16_4_ = 0xff800000;
      auVar440._20_4_ = 0xff800000;
      auVar440._24_4_ = 0xff800000;
      auVar440._28_4_ = 0xff800000;
    }
    else {
      auVar166 = vsqrtps_avx(auVar163);
      auVar287._0_4_ = fVar184 + fVar184;
      auVar287._4_4_ = fVar186 + fVar186;
      auVar287._8_4_ = fVar188 + fVar188;
      auVar287._12_4_ = fVar189 + fVar189;
      auVar287._16_4_ = fVar190 + fVar190;
      auVar287._20_4_ = fVar191 + fVar191;
      auVar287._24_4_ = fVar389 + fVar389;
      auVar287._28_4_ = fVar228 + fVar228;
      auVar165 = vrcpps_avx(auVar287);
      auVar164 = vcmpps_avx(auVar163,ZEXT832(0) << 0x20,5);
      auVar410 = ZEXT3264(auVar164);
      fVar280 = auVar165._0_4_;
      fVar291 = auVar165._4_4_;
      auVar57._4_4_ = auVar287._4_4_ * fVar291;
      auVar57._0_4_ = auVar287._0_4_ * fVar280;
      fVar292 = auVar165._8_4_;
      auVar57._8_4_ = auVar287._8_4_ * fVar292;
      fVar294 = auVar165._12_4_;
      auVar57._12_4_ = auVar287._12_4_ * fVar294;
      fVar296 = auVar165._16_4_;
      auVar57._16_4_ = auVar287._16_4_ * fVar296;
      fVar298 = auVar165._20_4_;
      auVar57._20_4_ = auVar287._20_4_ * fVar298;
      fVar300 = auVar165._24_4_;
      auVar57._24_4_ = auVar287._24_4_ * fVar300;
      auVar57._28_4_ = auVar287._28_4_;
      auVar331._8_4_ = 0x3f800000;
      auVar331._0_8_ = &DAT_3f8000003f800000;
      auVar331._12_4_ = 0x3f800000;
      auVar331._16_4_ = 0x3f800000;
      auVar331._20_4_ = 0x3f800000;
      auVar331._24_4_ = 0x3f800000;
      auVar331._28_4_ = 0x3f800000;
      auVar163 = vsubps_avx(auVar331,auVar57);
      fVar280 = fVar280 + fVar280 * auVar163._0_4_;
      fVar291 = fVar291 + fVar291 * auVar163._4_4_;
      fVar292 = fVar292 + fVar292 * auVar163._8_4_;
      fVar294 = fVar294 + fVar294 * auVar163._12_4_;
      fVar296 = fVar296 + fVar296 * auVar163._16_4_;
      fVar298 = fVar298 + fVar298 * auVar163._20_4_;
      fVar300 = fVar300 + fVar300 * auVar163._24_4_;
      auVar308._0_8_ = CONCAT44(fVar433,fVar424) ^ 0x8000000080000000;
      auVar308._8_4_ = -auVar429._8_4_;
      auVar308._12_4_ = -auVar429._12_4_;
      auVar308._16_4_ = -auVar429._16_4_;
      auVar308._20_4_ = -auVar429._20_4_;
      auVar308._24_4_ = -auVar429._24_4_;
      auVar308._28_4_ = -auVar429._28_4_;
      auVar202 = vsubps_avx(auVar308,auVar166);
      fVar424 = auVar202._0_4_ * fVar280;
      fVar433 = auVar202._4_4_ * fVar291;
      auVar58._4_4_ = fVar433;
      auVar58._0_4_ = fVar424;
      fVar316 = auVar202._8_4_ * fVar292;
      auVar58._8_4_ = fVar316;
      fVar318 = auVar202._12_4_ * fVar294;
      auVar58._12_4_ = fVar318;
      fVar320 = auVar202._16_4_ * fVar296;
      auVar58._16_4_ = fVar320;
      fVar322 = auVar202._20_4_ * fVar298;
      auVar58._20_4_ = fVar322;
      fVar324 = auVar202._24_4_ * fVar300;
      auVar58._24_4_ = fVar324;
      auVar58._28_4_ = auVar202._28_4_;
      auVar166 = vsubps_avx(auVar166,auVar429);
      fVar280 = auVar166._0_4_ * fVar280;
      fVar291 = auVar166._4_4_ * fVar291;
      auVar59._4_4_ = fVar291;
      auVar59._0_4_ = fVar280;
      fVar292 = auVar166._8_4_ * fVar292;
      auVar59._8_4_ = fVar292;
      fVar294 = auVar166._12_4_ * fVar294;
      auVar59._12_4_ = fVar294;
      fVar296 = auVar166._16_4_ * fVar296;
      auVar59._16_4_ = fVar296;
      fVar298 = auVar166._20_4_ * fVar298;
      auVar59._20_4_ = fVar298;
      fVar300 = auVar166._24_4_ * fVar300;
      auVar59._24_4_ = fVar300;
      auVar59._28_4_ = auVar166._28_4_;
      fStack_664 = local_540._28_4_ + auVar165._28_4_ + auVar163._28_4_;
      local_680[0] = fVar250 * (local_540._0_4_ + local_520 * fVar424);
      local_680[1] = fVar274 * (local_540._4_4_ + fStack_51c * fVar433);
      local_680[2] = fVar355 * (local_540._8_4_ + fStack_518 * fVar316);
      local_680[3] = fVar404 * (local_540._12_4_ + fStack_514 * fVar318);
      fStack_670 = fVar423 * (local_540._16_4_ + fStack_510 * fVar320);
      fStack_66c = fVar277 * (local_540._20_4_ + fStack_50c * fVar322);
      fStack_668 = fVar279 * (local_540._24_4_ + fStack_508 * fVar324);
      local_6a0[0] = fVar250 * (local_540._0_4_ + local_520 * fVar280);
      local_6a0[1] = fVar274 * (local_540._4_4_ + fStack_51c * fVar291);
      local_6a0[2] = fVar355 * (local_540._8_4_ + fStack_518 * fVar292);
      local_6a0[3] = fVar404 * (local_540._12_4_ + fStack_514 * fVar294);
      fStack_690 = fVar423 * (local_540._16_4_ + fStack_510 * fVar296);
      fStack_68c = fVar277 * (local_540._20_4_ + fStack_50c * fVar298);
      fStack_688 = fVar279 * (local_540._24_4_ + fStack_508 * fVar300);
      fStack_684 = local_540._28_4_ + fStack_664;
      auVar288._8_4_ = 0x7f800000;
      auVar288._0_8_ = 0x7f8000007f800000;
      auVar288._12_4_ = 0x7f800000;
      auVar288._16_4_ = 0x7f800000;
      auVar288._20_4_ = 0x7f800000;
      auVar288._24_4_ = 0x7f800000;
      auVar288._28_4_ = 0x7f800000;
      auVar225 = vblendvps_avx(auVar288,auVar58,auVar164);
      auVar309._8_4_ = 0x7fffffff;
      auVar309._0_8_ = 0x7fffffff7fffffff;
      auVar309._12_4_ = 0x7fffffff;
      auVar309._16_4_ = 0x7fffffff;
      auVar309._20_4_ = 0x7fffffff;
      auVar309._24_4_ = 0x7fffffff;
      auVar309._28_4_ = 0x7fffffff;
      auVar163 = vandps_avx(local_2a0,auVar309);
      auVar163 = vmaxps_avx(local_4c0,auVar163);
      auVar335 = ZEXT3264(CONCAT428(0x36000000,
                                    CONCAT424(0x36000000,
                                              CONCAT420(0x36000000,
                                                        CONCAT416(0x36000000,
                                                                  CONCAT412(0x36000000,
                                                                            CONCAT48(0x36000000,
                                                                                                                                                                          
                                                  0x3600000036000000)))))));
      auVar60._4_4_ = auVar163._4_4_ * 1.9073486e-06;
      auVar60._0_4_ = auVar163._0_4_ * 1.9073486e-06;
      auVar60._8_4_ = auVar163._8_4_ * 1.9073486e-06;
      auVar60._12_4_ = auVar163._12_4_ * 1.9073486e-06;
      auVar60._16_4_ = auVar163._16_4_ * 1.9073486e-06;
      auVar60._20_4_ = auVar163._20_4_ * 1.9073486e-06;
      auVar60._24_4_ = auVar163._24_4_ * 1.9073486e-06;
      auVar60._28_4_ = auVar163._28_4_;
      auVar163 = vandps_avx(auVar129,auVar309);
      auVar163 = vcmpps_avx(auVar163,auVar60,1);
      auVar431 = ZEXT3264(auVar163);
      auVar289._8_4_ = 0xff800000;
      auVar289._0_8_ = 0xff800000ff800000;
      auVar289._12_4_ = 0xff800000;
      auVar289._16_4_ = 0xff800000;
      auVar289._20_4_ = 0xff800000;
      auVar289._24_4_ = 0xff800000;
      auVar289._28_4_ = 0xff800000;
      auVar440 = vblendvps_avx(auVar289,auVar59,auVar164);
      auVar165 = auVar164 & auVar163;
      if ((((((((auVar165 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar165 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar165 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar165 >> 0x7f,0) != '\0') ||
            (auVar165 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar165 >> 0xbf,0) != '\0') ||
          (auVar165 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar165[0x1f] < '\0') {
        auVar128 = vandps_avx(auVar163,auVar164);
        auVar236 = vpackssdw_avx(auVar128._0_16_,auVar128._16_16_);
        auVar163 = vcmpps_avx(auVar12,ZEXT832(0) << 0x20,2);
        auVar333._8_4_ = 0xff800000;
        auVar333._0_8_ = 0xff800000ff800000;
        auVar333._12_4_ = 0xff800000;
        auVar333._16_4_ = 0xff800000;
        auVar333._20_4_ = 0xff800000;
        auVar333._24_4_ = 0xff800000;
        auVar333._28_4_ = 0xff800000;
        auVar335 = ZEXT3264(auVar333);
        auVar430._8_4_ = 0x7f800000;
        auVar430._0_8_ = 0x7f8000007f800000;
        auVar430._12_4_ = 0x7f800000;
        auVar430._16_4_ = 0x7f800000;
        auVar430._20_4_ = 0x7f800000;
        auVar430._24_4_ = 0x7f800000;
        auVar430._28_4_ = 0x7f800000;
        auVar431 = ZEXT3264(auVar430);
        auVar12 = vblendvps_avx(auVar430,auVar333,auVar163);
        auVar214 = vpmovsxwd_avx(auVar236);
        auVar236 = vpunpckhwd_avx(auVar236,auVar236);
        auVar271._16_16_ = auVar236;
        auVar271._0_16_ = auVar214;
        auVar225 = vblendvps_avx(auVar225,auVar12,auVar271);
        auVar12 = vblendvps_avx(auVar333,auVar430,auVar163);
        auVar440 = vblendvps_avx(auVar440,auVar12,auVar271);
        auVar12 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
        auVar181._0_4_ = auVar128._0_4_ ^ auVar12._0_4_;
        auVar181._4_4_ = auVar128._4_4_ ^ auVar12._4_4_;
        auVar181._8_4_ = auVar128._8_4_ ^ auVar12._8_4_;
        auVar181._12_4_ = auVar128._12_4_ ^ auVar12._12_4_;
        auVar181._16_4_ = auVar128._16_4_ ^ auVar12._16_4_;
        auVar181._20_4_ = auVar128._20_4_ ^ auVar12._20_4_;
        auVar181._24_4_ = auVar128._24_4_ ^ auVar12._24_4_;
        auVar181._28_4_ = auVar128._28_4_ ^ auVar12._28_4_;
        auVar128 = vorps_avx(auVar163,auVar181);
        auVar128 = vandps_avx(auVar164,auVar128);
      }
    }
    auVar12 = local_4a0 & auVar128;
    auVar290 = ZEXT1664(local_ae0);
    if ((((((((auVar12 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar12 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar12 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar12 >> 0x7f,0) == '\0') &&
          (auVar12 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar12 >> 0xbf,0) == '\0') &&
        (auVar12 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar12[0x1f]) {
LAB_01152426:
      auVar245._8_4_ = 0x3f800000;
      auVar245._0_8_ = &DAT_3f8000003f800000;
      auVar245._12_4_ = 0x3f800000;
      auVar245._16_4_ = 0x3f800000;
      auVar245._20_4_ = 0x3f800000;
      auVar245._24_4_ = 0x3f800000;
      auVar245._28_4_ = 0x3f800000;
      fVar228 = fStack_9e4;
      fVar229 = fStack_9e8;
      fVar230 = fStack_9ec;
      fVar231 = fStack_9f0;
      fVar232 = fStack_9f4;
      fVar233 = fStack_9f8;
      fVar234 = (float)local_a00._4_4_;
      fVar249 = (float)local_a00._0_4_;
    }
    else {
      fStack_504 = fStack_844 + fStack_864 + fStack_884;
      auVar236 = vshufps_avx(ZEXT416((uint)(*(float *)(ray + k * 4 + 0x100) - (float)local_940._0_4_
                                           )),
                             ZEXT416((uint)(*(float *)(ray + k * 4 + 0x100) - (float)local_940._0_4_
                                           )),0);
      auVar204._16_16_ = auVar236;
      auVar204._0_16_ = auVar236;
      auVar164 = vminps_avx(auVar204,auVar440);
      auVar431 = ZEXT3264(_local_880);
      auVar134._0_4_ =
           (float)local_860._0_4_ * fVar301 +
           (float)local_880._0_4_ * fVar326 + (float)local_8a0._0_4_ * fVar406;
      auVar134._4_4_ =
           (float)local_860._4_4_ * fVar314 +
           (float)local_880._4_4_ * fVar336 + (float)local_8a0._4_4_ * fVar412;
      auVar134._8_4_ = fStack_858 * fVar315 + fStack_878 * fVar339 + fStack_898 * fVar414;
      auVar134._12_4_ = fStack_854 * fVar317 + fStack_874 * fVar342 + fStack_894 * fVar416;
      auVar134._16_4_ = fStack_850 * fVar319 + fStack_870 * fVar345 + fStack_890 * fVar418;
      auVar134._20_4_ = fStack_84c * fVar321 + fStack_86c * fVar348 + fStack_88c * fVar420;
      auVar134._24_4_ = fStack_848 * fVar323 + fStack_868 * fVar351 + fStack_888 * fVar422;
      auVar134._28_4_ = fVar325 + fVar354 + auVar28._28_4_;
      auVar12 = vrcpps_avx(auVar134);
      fVar325 = auVar12._0_4_;
      fVar424 = auVar12._4_4_;
      auVar61._4_4_ = auVar134._4_4_ * fVar424;
      auVar61._0_4_ = auVar134._0_4_ * fVar325;
      fVar433 = auVar12._8_4_;
      auVar61._8_4_ = auVar134._8_4_ * fVar433;
      fVar280 = auVar12._12_4_;
      auVar61._12_4_ = auVar134._12_4_ * fVar280;
      fVar291 = auVar12._16_4_;
      auVar61._16_4_ = auVar134._16_4_ * fVar291;
      fVar292 = auVar12._20_4_;
      auVar61._20_4_ = auVar134._20_4_ * fVar292;
      fVar294 = auVar12._24_4_;
      auVar61._24_4_ = auVar134._24_4_ * fVar294;
      auVar61._28_4_ = fVar354;
      auVar395._8_4_ = 0x3f800000;
      auVar395._0_8_ = &DAT_3f8000003f800000;
      auVar395._12_4_ = 0x3f800000;
      auVar395._16_4_ = 0x3f800000;
      auVar395._20_4_ = 0x3f800000;
      auVar395._24_4_ = 0x3f800000;
      auVar395._28_4_ = 0x3f800000;
      auVar165 = vsubps_avx(auVar395,auVar61);
      auVar310._8_4_ = 0x7fffffff;
      auVar310._0_8_ = 0x7fffffff7fffffff;
      auVar310._12_4_ = 0x7fffffff;
      auVar310._16_4_ = 0x7fffffff;
      auVar310._20_4_ = 0x7fffffff;
      auVar310._24_4_ = 0x7fffffff;
      auVar310._28_4_ = 0x7fffffff;
      auVar12 = vandps_avx(auVar134,auVar310);
      auVar363._8_4_ = 0x219392ef;
      auVar363._0_8_ = 0x219392ef219392ef;
      auVar363._12_4_ = 0x219392ef;
      auVar363._16_4_ = 0x219392ef;
      auVar363._20_4_ = 0x219392ef;
      auVar363._24_4_ = 0x219392ef;
      auVar363._28_4_ = 0x219392ef;
      auVar163 = vcmpps_avx(auVar12,auVar363,1);
      auVar335 = ZEXT3264(CONCAT428(0x80000000,
                                    CONCAT424(0x80000000,
                                              CONCAT420(0x80000000,
                                                        CONCAT416(0x80000000,
                                                                  CONCAT412(0x80000000,
                                                                            CONCAT48(0x80000000,
                                                                                                                                                                          
                                                  0x8000000080000000)))))));
      auVar62._4_4_ =
           (fVar424 + fVar424 * auVar165._4_4_) *
           -(fVar314 * fVar338 + fVar336 * fVar273 + fVar412 * fVar272);
      auVar62._0_4_ =
           (fVar325 + fVar325 * auVar165._0_4_) *
           -(fVar301 * fVar328 + fVar326 * fVar249 + fVar406 * fVar234);
      auVar62._8_4_ =
           (fVar433 + fVar433 * auVar165._8_4_) *
           -(fVar315 * fVar341 + fVar339 * fVar299 + fVar414 * fVar297);
      auVar62._12_4_ =
           (fVar280 + fVar280 * auVar165._12_4_) *
           -(fVar317 * fVar344 + fVar342 * fVar398 + fVar416 * fVar385);
      auVar62._16_4_ =
           (fVar291 + fVar291 * auVar165._16_4_) *
           -(fVar319 * fVar347 + fVar345 * fVar421 + fVar418 * fVar419);
      auVar62._20_4_ =
           (fVar292 + fVar292 * auVar165._20_4_) *
           -(fVar321 * fVar350 + fVar348 * fVar19 + fVar420 * fVar438);
      auVar62._24_4_ =
           (fVar294 + fVar294 * auVar165._24_4_) *
           -(fVar323 * fVar353 + fVar351 * fVar26 + fVar422 * fVar25);
      auVar62._28_4_ = -(auVar28._28_4_ + auVar225._28_4_ + auVar27._28_4_);
      auVar85 = ZEXT812(0);
      auVar360 = ZEXT1228(auVar85) << 0x20;
      auVar12 = vcmpps_avx(auVar134,ZEXT1232(auVar85) << 0x20,1);
      auVar12 = vorps_avx(auVar163,auVar12);
      auVar402._8_4_ = 0xff800000;
      auVar402._0_8_ = 0xff800000ff800000;
      auVar402._12_4_ = 0xff800000;
      auVar402._16_4_ = 0xff800000;
      auVar402._20_4_ = 0xff800000;
      auVar402._24_4_ = 0xff800000;
      auVar402._28_4_ = 0xff800000;
      auVar403 = ZEXT3264(auVar402);
      auVar12 = vblendvps_avx(auVar62,auVar402,auVar12);
      auVar28 = vcmpps_avx(auVar134,ZEXT1232(auVar85) << 0x20,6);
      auVar28 = vorps_avx(auVar163,auVar28);
      auVar409._8_4_ = 0x7f800000;
      auVar409._0_8_ = 0x7f8000007f800000;
      auVar409._12_4_ = 0x7f800000;
      auVar409._16_4_ = 0x7f800000;
      auVar409._20_4_ = 0x7f800000;
      auVar409._24_4_ = 0x7f800000;
      auVar409._28_4_ = 0x7f800000;
      auVar410 = ZEXT3264(auVar409);
      auVar28 = vblendvps_avx(auVar62,auVar409,auVar28);
      auVar163 = vmaxps_avx(local_260,auVar225);
      auVar163 = vmaxps_avx(auVar163,auVar12);
      auVar28 = vminps_avx(auVar164,auVar28);
      uStack_b44 = auVar16._28_4_;
      auVar165 = ZEXT1232(auVar85) << 0x20;
      auVar12 = vsubps_avx(auVar165,local_a60);
      auVar14 = vsubps_avx(auVar165,auVar14);
      auVar63._4_4_ = auVar14._4_4_ * -fVar337;
      auVar63._0_4_ = auVar14._0_4_ * -fVar327;
      auVar63._8_4_ = auVar14._8_4_ * -fVar340;
      auVar63._12_4_ = auVar14._12_4_ * -fVar343;
      auVar63._16_4_ = auVar14._16_4_ * -fVar346;
      auVar63._20_4_ = auVar14._20_4_ * -fVar349;
      auVar63._24_4_ = auVar14._24_4_ * -fVar352;
      auVar63._28_4_ = auVar14._28_4_;
      auVar64._4_4_ = fVar254 * auVar12._4_4_;
      auVar64._0_4_ = fVar232 * auVar12._0_4_;
      auVar64._8_4_ = fVar293 * auVar12._8_4_;
      auVar64._12_4_ = fVar377 * auVar12._12_4_;
      auVar64._16_4_ = fVar415 * auVar12._16_4_;
      auVar64._20_4_ = fVar436 * auVar12._20_4_;
      auVar64._24_4_ = fVar23 * auVar12._24_4_;
      auVar64._28_4_ = auVar12._28_4_;
      auVar12 = vsubps_avx(auVar63,auVar64);
      auVar14 = vsubps_avx(auVar165,auVar364);
      auVar65._4_4_ = fVar255 * auVar14._4_4_;
      auVar65._0_4_ = fVar233 * auVar14._0_4_;
      auVar65._8_4_ = fVar295 * auVar14._8_4_;
      auVar65._12_4_ = fVar381 * auVar14._12_4_;
      auVar65._16_4_ = fVar417 * auVar14._16_4_;
      auVar65._20_4_ = fVar437 * auVar14._20_4_;
      uVar1 = auVar14._28_4_;
      auVar65._24_4_ = fVar24 * auVar14._24_4_;
      auVar65._28_4_ = uVar1;
      auVar364 = vsubps_avx(auVar12,auVar65);
      auVar66._4_4_ = (float)local_8a0._4_4_ * -fVar337;
      auVar66._0_4_ = (float)local_8a0._0_4_ * -fVar327;
      auVar66._8_4_ = fStack_898 * -fVar340;
      auVar66._12_4_ = fStack_894 * -fVar343;
      auVar66._16_4_ = fStack_890 * -fVar346;
      auVar66._20_4_ = fStack_88c * -fVar349;
      auVar66._24_4_ = fStack_888 * -fVar352;
      auVar66._28_4_ = uStack_b44 ^ 0x80000000;
      auVar67._4_4_ = (float)local_880._4_4_ * fVar254;
      auVar67._0_4_ = (float)local_880._0_4_ * fVar232;
      auVar67._8_4_ = fStack_878 * fVar293;
      auVar67._12_4_ = fStack_874 * fVar377;
      auVar67._16_4_ = fStack_870 * fVar415;
      auVar67._20_4_ = fStack_86c * fVar436;
      auVar67._24_4_ = fStack_868 * fVar23;
      auVar67._28_4_ = uVar1;
      auVar245._8_4_ = 0x3f800000;
      auVar245._0_8_ = &DAT_3f8000003f800000;
      auVar245._12_4_ = 0x3f800000;
      auVar245._16_4_ = 0x3f800000;
      auVar245._20_4_ = 0x3f800000;
      auVar245._24_4_ = 0x3f800000;
      auVar245._28_4_ = 0x3f800000;
      auVar397 = ZEXT3264(auVar245);
      auVar12 = vsubps_avx(auVar66,auVar67);
      auVar68._4_4_ = fVar255 * (float)local_860._4_4_;
      auVar68._0_4_ = fVar233 * (float)local_860._0_4_;
      auVar68._8_4_ = fVar295 * fStack_858;
      auVar68._12_4_ = fVar381 * fStack_854;
      auVar68._16_4_ = fVar417 * fStack_850;
      auVar68._20_4_ = fVar437 * fStack_84c;
      auVar68._24_4_ = fVar24 * fStack_848;
      auVar68._28_4_ = uVar1;
      auVar16 = vsubps_avx(auVar12,auVar68);
      auVar12 = vrcpps_avx(auVar16);
      fVar232 = auVar12._0_4_;
      fVar233 = auVar12._4_4_;
      auVar69._4_4_ = auVar16._4_4_ * fVar233;
      auVar69._0_4_ = auVar16._0_4_ * fVar232;
      fVar234 = auVar12._8_4_;
      auVar69._8_4_ = auVar16._8_4_ * fVar234;
      fVar249 = auVar12._12_4_;
      auVar69._12_4_ = auVar16._12_4_ * fVar249;
      fVar254 = auVar12._16_4_;
      auVar69._16_4_ = auVar16._16_4_ * fVar254;
      fVar255 = auVar12._20_4_;
      auVar69._20_4_ = auVar16._20_4_ * fVar255;
      fVar272 = auVar12._24_4_;
      auVar69._24_4_ = auVar16._24_4_ * fVar272;
      auVar69._28_4_ = fStack_844;
      auVar164 = vsubps_avx(auVar245,auVar69);
      auVar12 = vandps_avx(auVar16,auVar310);
      auVar311._8_4_ = 0x219392ef;
      auVar311._0_8_ = 0x219392ef219392ef;
      auVar311._12_4_ = 0x219392ef;
      auVar311._16_4_ = 0x219392ef;
      auVar311._20_4_ = 0x219392ef;
      auVar311._24_4_ = 0x219392ef;
      auVar311._28_4_ = 0x219392ef;
      auVar14 = vcmpps_avx(auVar12,auVar311,1);
      auVar70._4_4_ = (fVar233 + fVar233 * auVar164._4_4_) * -auVar364._4_4_;
      auVar70._0_4_ = (fVar232 + fVar232 * auVar164._0_4_) * -auVar364._0_4_;
      auVar70._8_4_ = (fVar234 + fVar234 * auVar164._8_4_) * -auVar364._8_4_;
      auVar70._12_4_ = (fVar249 + fVar249 * auVar164._12_4_) * -auVar364._12_4_;
      auVar70._16_4_ = (fVar254 + fVar254 * auVar164._16_4_) * -auVar364._16_4_;
      auVar70._20_4_ = (fVar255 + fVar255 * auVar164._20_4_) * -auVar364._20_4_;
      auVar70._24_4_ = (fVar272 + fVar272 * auVar164._24_4_) * -auVar364._24_4_;
      auVar70._28_4_ = auVar364._28_4_ ^ 0x80000000;
      auVar12 = vcmpps_avx(auVar16,auVar165,1);
      auVar12 = vorps_avx(auVar14,auVar12);
      auVar12 = vblendvps_avx(auVar70,auVar402,auVar12);
      _local_760 = vmaxps_avx(auVar163,auVar12);
      auVar364 = ZEXT1232(auVar85) << 0x20;
      auVar12 = vcmpps_avx(auVar16,auVar364,6);
      auVar12 = vorps_avx(auVar14,auVar12);
      auVar12 = vblendvps_avx(auVar70,auVar409,auVar12);
      auVar128 = vandps_avx(auVar128,local_4a0);
      local_2c0 = vminps_avx(auVar28,auVar12);
      auVar12 = vcmpps_avx(_local_760,local_2c0,2);
      auVar14 = auVar128 & auVar12;
      if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar14 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar14 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar14 >> 0x7f,0) != '\0') ||
            (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar14 >> 0xbf,0) != '\0') ||
          (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar14[0x1f] < '\0') {
        auVar14 = vminps_avx(local_840,auVar167);
        auVar16 = vminps_avx(auVar15,auVar17);
        auVar14 = vminps_avx(auVar14,auVar16);
        auVar13 = vsubps_avx(auVar14,auVar13);
        auVar128 = vandps_avx(auVar12,auVar128);
        auVar107._4_4_ = local_680[1];
        auVar107._0_4_ = local_680[0];
        auVar107._8_4_ = local_680[2];
        auVar107._12_4_ = local_680[3];
        auVar107._16_4_ = fStack_670;
        auVar107._20_4_ = fStack_66c;
        auVar107._24_4_ = fStack_668;
        auVar107._28_4_ = fStack_664;
        auVar12 = vminps_avx(auVar107,auVar245);
        auVar12 = vmaxps_avx(auVar12,ZEXT832(0) << 0x20);
        local_680[0] = fVar116 + fVar148 * (auVar12._0_4_ + 0.0) * 0.125;
        local_680[1] = fVar146 + fVar183 * (auVar12._4_4_ + 1.0) * 0.125;
        local_680[2] = fVar147 + fVar185 * (auVar12._8_4_ + 2.0) * 0.125;
        local_680[3] = fStack_be4 + fVar187 * (auVar12._12_4_ + 3.0) * 0.125;
        fStack_670 = fVar116 + fVar148 * (auVar12._16_4_ + 4.0) * 0.125;
        fStack_66c = fVar146 + fVar183 * (auVar12._20_4_ + 5.0) * 0.125;
        fStack_668 = fVar147 + fVar185 * (auVar12._24_4_ + 6.0) * 0.125;
        fStack_664 = fStack_be4 + auVar12._28_4_ + 7.0;
        auVar106._4_4_ = local_6a0[1];
        auVar106._0_4_ = local_6a0[0];
        auVar106._8_4_ = local_6a0[2];
        auVar106._12_4_ = local_6a0[3];
        auVar106._16_4_ = fStack_690;
        auVar106._20_4_ = fStack_68c;
        auVar106._24_4_ = fStack_688;
        auVar106._28_4_ = fStack_684;
        auVar12 = vminps_avx(auVar106,auVar245);
        auVar12 = vmaxps_avx(auVar12,ZEXT832(0) << 0x20);
        local_6a0[0] = fVar116 + fVar148 * (auVar12._0_4_ + 0.0) * 0.125;
        local_6a0[1] = fVar146 + fVar183 * (auVar12._4_4_ + 1.0) * 0.125;
        local_6a0[2] = fVar147 + fVar185 * (auVar12._8_4_ + 2.0) * 0.125;
        local_6a0[3] = fStack_be4 + fVar187 * (auVar12._12_4_ + 3.0) * 0.125;
        fStack_690 = fVar116 + fVar148 * (auVar12._16_4_ + 4.0) * 0.125;
        fStack_68c = fVar146 + fVar183 * (auVar12._20_4_ + 5.0) * 0.125;
        fStack_688 = fVar147 + fVar185 * (auVar12._24_4_ + 6.0) * 0.125;
        fStack_684 = fStack_be4 + auVar12._28_4_ + 7.0;
        auVar71._4_4_ = auVar13._4_4_ * 0.99999976;
        auVar71._0_4_ = auVar13._0_4_ * 0.99999976;
        auVar71._8_4_ = auVar13._8_4_ * 0.99999976;
        auVar71._12_4_ = auVar13._12_4_ * 0.99999976;
        auVar71._16_4_ = auVar13._16_4_ * 0.99999976;
        auVar71._20_4_ = auVar13._20_4_ * 0.99999976;
        auVar71._24_4_ = auVar13._24_4_ * 0.99999976;
        auVar71._28_4_ = 0x3f7ffffc;
        auVar12 = vmaxps_avx(auVar364,auVar71);
        auVar72._4_4_ = auVar12._4_4_ * auVar12._4_4_;
        auVar72._0_4_ = auVar12._0_4_ * auVar12._0_4_;
        auVar72._8_4_ = auVar12._8_4_ * auVar12._8_4_;
        auVar72._12_4_ = auVar12._12_4_ * auVar12._12_4_;
        auVar72._16_4_ = auVar12._16_4_ * auVar12._16_4_;
        auVar72._20_4_ = auVar12._20_4_ * auVar12._20_4_;
        auVar72._24_4_ = auVar12._24_4_ * auVar12._24_4_;
        auVar72._28_4_ = auVar12._28_4_;
        auVar13 = vsubps_avx(auVar130,auVar72);
        auVar73._4_4_ = auVar13._4_4_ * fVar186 * 4.0;
        auVar73._0_4_ = auVar13._0_4_ * fVar184 * 4.0;
        auVar73._8_4_ = auVar13._8_4_ * fVar188 * 4.0;
        auVar73._12_4_ = auVar13._12_4_ * fVar189 * 4.0;
        auVar73._16_4_ = auVar13._16_4_ * fVar190 * 4.0;
        auVar73._20_4_ = auVar13._20_4_ * fVar191 * 4.0;
        auVar73._24_4_ = auVar13._24_4_ * fVar389 * 4.0;
        auVar73._28_4_ = auVar12._28_4_;
        auVar14 = vsubps_avx(auVar55,auVar73);
        _local_900 = ZEXT432(0) << 0x20;
        auVar12 = vcmpps_avx(auVar14,ZEXT832(0) << 0x20,5);
        if ((((((((auVar12 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar12 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar12 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar12 >> 0x7f,0) == '\0') &&
              (auVar12 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar12 >> 0xbf,0) == '\0') &&
            (auVar12 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar12[0x1f]) {
          _local_920 = ZEXT832(0) << 0x20;
          auVar219 = SUB6428(ZEXT864(0),0) << 0x20;
          auVar244 = ZEXT828(0) << 0x20;
          auVar205._8_4_ = 0x7f800000;
          auVar205._0_8_ = 0x7f8000007f800000;
          auVar205._12_4_ = 0x7f800000;
          auVar205._16_4_ = 0x7f800000;
          auVar205._20_4_ = 0x7f800000;
          auVar205._24_4_ = 0x7f800000;
          auVar205._28_4_ = 0x7f800000;
          auVar265._8_4_ = 0xff800000;
          auVar265._0_8_ = 0xff800000ff800000;
          auVar265._12_4_ = 0xff800000;
          auVar265._16_4_ = 0xff800000;
          auVar265._20_4_ = 0xff800000;
          auVar265._24_4_ = 0xff800000;
          auVar265._28_4_ = 0xff800000;
          _local_7e0 = _local_920;
        }
        else {
          auVar17 = vsqrtps_avx(auVar14);
          auVar246._0_4_ = fVar184 + fVar184;
          auVar246._4_4_ = fVar186 + fVar186;
          auVar246._8_4_ = fVar188 + fVar188;
          auVar246._12_4_ = fVar189 + fVar189;
          auVar246._16_4_ = fVar190 + fVar190;
          auVar246._20_4_ = fVar191 + fVar191;
          auVar246._24_4_ = fVar389 + fVar389;
          auVar246._28_4_ = fVar228 + fVar228;
          auVar16 = vrcpps_avx(auVar246);
          fVar228 = auVar16._0_4_;
          fVar232 = auVar16._4_4_;
          auVar74._4_4_ = auVar246._4_4_ * fVar232;
          auVar74._0_4_ = auVar246._0_4_ * fVar228;
          fVar233 = auVar16._8_4_;
          auVar74._8_4_ = auVar246._8_4_ * fVar233;
          fVar234 = auVar16._12_4_;
          auVar74._12_4_ = auVar246._12_4_ * fVar234;
          fVar249 = auVar16._16_4_;
          auVar74._16_4_ = auVar246._16_4_ * fVar249;
          fVar254 = auVar16._20_4_;
          auVar74._20_4_ = auVar246._20_4_ * fVar254;
          fVar255 = auVar16._24_4_;
          auVar74._24_4_ = auVar246._24_4_ * fVar255;
          auVar74._28_4_ = auVar246._28_4_;
          auVar28 = vsubps_avx(auVar245,auVar74);
          fVar228 = fVar228 + fVar228 * auVar28._0_4_;
          fVar232 = fVar232 + fVar232 * auVar28._4_4_;
          fVar233 = fVar233 + fVar233 * auVar28._8_4_;
          fVar234 = fVar234 + fVar234 * auVar28._12_4_;
          fVar249 = fVar249 + fVar249 * auVar28._16_4_;
          fVar254 = fVar254 + fVar254 * auVar28._20_4_;
          fVar255 = fVar255 + fVar255 * auVar28._24_4_;
          fVar272 = auVar16._28_4_ + auVar28._28_4_;
          auVar266._0_8_ = auVar429._0_8_ ^ 0x8000000080000000;
          auVar266._8_4_ = -auVar429._8_4_;
          auVar266._12_4_ = -auVar429._12_4_;
          auVar266._16_4_ = -auVar429._16_4_;
          auVar266._20_4_ = -auVar429._20_4_;
          auVar266._24_4_ = -auVar429._24_4_;
          auVar266._28_4_ = -auVar429._28_4_;
          auVar16 = vsubps_avx(auVar266,auVar17);
          fVar385 = auVar16._0_4_ * fVar228;
          fVar398 = auVar16._4_4_ * fVar232;
          auVar75._4_4_ = fVar398;
          auVar75._0_4_ = fVar385;
          fVar415 = auVar16._8_4_ * fVar233;
          auVar75._8_4_ = fVar415;
          fVar417 = auVar16._12_4_ * fVar234;
          auVar75._12_4_ = fVar417;
          fVar419 = auVar16._16_4_ * fVar249;
          auVar75._16_4_ = fVar419;
          fVar421 = auVar16._20_4_ * fVar254;
          auVar75._20_4_ = fVar421;
          fVar436 = auVar16._24_4_ * fVar255;
          auVar75._24_4_ = fVar436;
          auVar75._28_4_ = fStack_864;
          auVar431 = ZEXT3264(auVar75);
          auVar17 = vsubps_avx(auVar17,auVar429);
          fVar228 = auVar17._0_4_ * fVar228;
          fVar232 = auVar17._4_4_ * fVar232;
          auVar76._4_4_ = fVar232;
          auVar76._0_4_ = fVar228;
          fVar233 = auVar17._8_4_ * fVar233;
          auVar76._8_4_ = fVar233;
          fVar234 = auVar17._12_4_ * fVar234;
          auVar76._12_4_ = fVar234;
          fVar249 = auVar17._16_4_ * fVar249;
          auVar76._16_4_ = fVar249;
          fVar254 = auVar17._20_4_ * fVar254;
          auVar76._20_4_ = fVar254;
          fVar255 = auVar17._24_4_ * fVar255;
          auVar76._24_4_ = fVar255;
          auVar76._28_4_ = 0x7f800000;
          auVar410 = ZEXT3264(auVar76);
          fVar273 = (fVar385 * local_520 + local_540._0_4_) * fVar250;
          fVar293 = (fVar398 * fStack_51c + local_540._4_4_) * fVar274;
          fVar295 = (fVar415 * fStack_518 + local_540._8_4_) * fVar355;
          fVar297 = (fVar417 * fStack_514 + local_540._12_4_) * fVar404;
          fVar299 = (fVar419 * fStack_510 + local_540._16_4_) * fVar423;
          fVar377 = (fVar421 * fStack_50c + local_540._20_4_) * fVar277;
          fVar381 = (fVar436 * fStack_508 + local_540._24_4_) * fVar279;
          auVar226._0_4_ = fVar356 + fVar231 * fVar273;
          auVar226._4_4_ = fVar366 + fVar253 * fVar293;
          auVar226._8_4_ = fVar370 + fVar278 * fVar295;
          auVar226._12_4_ = fVar374 + fVar373 * fVar297;
          auVar226._16_4_ = fVar378 + fVar413 * fVar299;
          auVar226._20_4_ = fVar382 + fVar435 * fVar377;
          auVar226._24_4_ = fVar386 + fVar22 * fVar381;
          auVar226._28_4_ = fVar390 + auVar17._28_4_ + local_540._28_4_;
          auVar77._4_4_ = (float)local_860._4_4_ * fVar398;
          auVar77._0_4_ = (float)local_860._0_4_ * fVar385;
          auVar77._8_4_ = fStack_858 * fVar415;
          auVar77._12_4_ = fStack_854 * fVar417;
          auVar77._16_4_ = fStack_850 * fVar419;
          auVar77._20_4_ = fStack_84c * fVar421;
          auVar77._24_4_ = fStack_848 * fVar436;
          auVar77._28_4_ = fVar272;
          auVar17 = vsubps_avx(auVar77,auVar226);
          auVar247._0_4_ = fVar357 + fVar229 * fVar273;
          auVar247._4_4_ = fVar367 + fVar251 * fVar293;
          auVar247._8_4_ = fVar371 + fVar275 * fVar295;
          auVar247._12_4_ = fVar375 + fVar365 * fVar297;
          auVar247._16_4_ = fVar379 + fVar405 * fVar299;
          auVar247._20_4_ = fVar383 + fVar432 * fVar377;
          auVar247._24_4_ = fVar387 + fVar20 * fVar381;
          auVar247._28_4_ = fVar391 + fVar272;
          auVar78._4_4_ = (float)local_880._4_4_ * fVar398;
          auVar78._0_4_ = (float)local_880._0_4_ * fVar385;
          auVar78._8_4_ = fStack_878 * fVar415;
          auVar78._12_4_ = fStack_874 * fVar417;
          auVar78._16_4_ = fStack_870 * fVar419;
          auVar78._20_4_ = fStack_86c * fVar421;
          auVar78._24_4_ = fStack_868 * fVar436;
          auVar78._28_4_ = fStack_9e4;
          auVar28 = vsubps_avx(auVar78,auVar247);
          auVar267._0_4_ = fVar358 + fVar230 * fVar273;
          auVar267._4_4_ = fVar368 + fVar252 * fVar293;
          auVar267._8_4_ = fVar372 + fVar276 * fVar295;
          auVar267._12_4_ = fVar376 + fVar369 * fVar297;
          auVar267._16_4_ = fVar380 + fVar411 * fVar299;
          auVar267._20_4_ = fVar384 + fVar434 * fVar377;
          auVar267._24_4_ = fVar388 + fVar21 * fVar381;
          auVar267._28_4_ = fVar392 + auVar16._28_4_;
          auVar79._4_4_ = (float)local_8a0._4_4_ * fVar398;
          auVar79._0_4_ = (float)local_8a0._0_4_ * fVar385;
          auVar79._8_4_ = fStack_898 * fVar415;
          auVar79._12_4_ = fStack_894 * fVar417;
          auVar79._16_4_ = fStack_890 * fVar419;
          auVar79._20_4_ = fStack_88c * fVar421;
          auVar79._24_4_ = fStack_888 * fVar436;
          auVar79._28_4_ = fStack_9e4;
          local_960 = vsubps_avx(auVar79,auVar267);
          fVar250 = (fVar228 * local_520 + local_540._0_4_) * fVar250;
          fVar274 = (fVar232 * fStack_51c + local_540._4_4_) * fVar274;
          fVar355 = (fVar233 * fStack_518 + local_540._8_4_) * fVar355;
          fVar404 = (fVar234 * fStack_514 + local_540._12_4_) * fVar404;
          fVar423 = (fVar249 * fStack_510 + local_540._16_4_) * fVar423;
          fVar277 = (fVar254 * fStack_50c + local_540._20_4_) * fVar277;
          fVar279 = (fVar255 * fStack_508 + local_540._24_4_) * fVar279;
          auVar312._0_4_ = fVar356 + fVar231 * fVar250;
          auVar312._4_4_ = fVar366 + fVar253 * fVar274;
          auVar312._8_4_ = fVar370 + fVar278 * fVar355;
          auVar312._12_4_ = fVar374 + fVar373 * fVar404;
          auVar312._16_4_ = fVar378 + fVar413 * fVar423;
          auVar312._20_4_ = fVar382 + fVar435 * fVar277;
          auVar312._24_4_ = fVar386 + fVar22 * fVar279;
          auVar312._28_4_ = fVar390 + fStack_9e4;
          auVar80._4_4_ = (float)local_860._4_4_ * fVar232;
          auVar80._0_4_ = (float)local_860._0_4_ * fVar228;
          auVar80._8_4_ = fStack_858 * fVar233;
          auVar80._12_4_ = fStack_854 * fVar234;
          auVar80._16_4_ = fStack_850 * fVar249;
          auVar80._20_4_ = fStack_84c * fVar254;
          auVar80._24_4_ = fStack_848 * fVar255;
          auVar80._28_4_ = fStack_844;
          _local_900 = vsubps_avx(auVar80,auVar312);
          auVar313._0_4_ = fVar357 + fVar229 * fVar250;
          auVar313._4_4_ = fVar367 + fVar251 * fVar274;
          auVar313._8_4_ = fVar371 + fVar275 * fVar355;
          auVar313._12_4_ = fVar375 + fVar365 * fVar404;
          auVar313._16_4_ = fVar379 + fVar405 * fVar423;
          auVar313._20_4_ = fVar383 + fVar432 * fVar277;
          auVar313._24_4_ = fVar387 + fVar20 * fVar279;
          auVar313._28_4_ = fVar391 + local_900._28_4_;
          auVar81._4_4_ = (float)local_880._4_4_ * fVar232;
          auVar81._0_4_ = (float)local_880._0_4_ * fVar228;
          auVar81._8_4_ = fStack_878 * fVar233;
          auVar81._12_4_ = fStack_874 * fVar234;
          auVar81._16_4_ = fStack_870 * fVar249;
          auVar81._20_4_ = fStack_86c * fVar254;
          auVar81._24_4_ = fStack_868 * fVar255;
          auVar81._28_4_ = fStack_844;
          _local_920 = vsubps_avx(auVar81,auVar313);
          auVar268._0_4_ = fVar358 + fVar230 * fVar250;
          auVar268._4_4_ = fVar368 + fVar252 * fVar274;
          auVar268._8_4_ = fVar372 + fVar276 * fVar355;
          auVar268._12_4_ = fVar376 + fVar369 * fVar404;
          auVar268._16_4_ = fVar380 + fVar411 * fVar423;
          auVar268._20_4_ = fVar384 + fVar434 * fVar277;
          auVar268._24_4_ = fVar388 + fVar21 * fVar279;
          auVar268._28_4_ = fVar392 + local_960._28_4_ + local_540._28_4_;
          auVar82._4_4_ = (float)local_8a0._4_4_ * fVar232;
          auVar82._0_4_ = (float)local_8a0._0_4_ * fVar228;
          auVar82._8_4_ = fStack_898 * fVar233;
          auVar82._12_4_ = fStack_894 * fVar234;
          auVar82._16_4_ = fStack_890 * fVar249;
          auVar82._20_4_ = fStack_88c * fVar254;
          auVar82._24_4_ = fStack_888 * fVar255;
          auVar82._28_4_ = local_920._28_4_;
          _local_7e0 = vsubps_avx(auVar82,auVar268);
          auVar364 = vcmpps_avx(auVar14,auVar364,5);
          auVar206._8_4_ = 0x7f800000;
          auVar206._0_8_ = 0x7f8000007f800000;
          auVar206._12_4_ = 0x7f800000;
          auVar206._16_4_ = 0x7f800000;
          auVar206._20_4_ = 0x7f800000;
          auVar206._24_4_ = 0x7f800000;
          auVar206._28_4_ = 0x7f800000;
          auVar205 = vblendvps_avx(auVar206,auVar75,auVar364);
          auVar332._8_4_ = 0x7fffffff;
          auVar332._0_8_ = 0x7fffffff7fffffff;
          auVar332._12_4_ = 0x7fffffff;
          auVar332._16_4_ = 0x7fffffff;
          auVar332._20_4_ = 0x7fffffff;
          auVar332._24_4_ = 0x7fffffff;
          auVar332._28_4_ = 0x7fffffff;
          auVar14 = vandps_avx(auVar332,local_2a0);
          auVar14 = vmaxps_avx(local_4c0,auVar14);
          auVar396._8_4_ = 0x36000000;
          auVar396._0_8_ = 0x3600000036000000;
          auVar396._12_4_ = 0x36000000;
          auVar396._16_4_ = 0x36000000;
          auVar396._20_4_ = 0x36000000;
          auVar396._24_4_ = 0x36000000;
          auVar396._28_4_ = 0x36000000;
          auVar83._4_4_ = auVar14._4_4_ * 1.9073486e-06;
          auVar83._0_4_ = auVar14._0_4_ * 1.9073486e-06;
          auVar83._8_4_ = auVar14._8_4_ * 1.9073486e-06;
          auVar83._12_4_ = auVar14._12_4_ * 1.9073486e-06;
          auVar83._16_4_ = auVar14._16_4_ * 1.9073486e-06;
          auVar83._20_4_ = auVar14._20_4_ * 1.9073486e-06;
          auVar83._24_4_ = auVar14._24_4_ * 1.9073486e-06;
          auVar83._28_4_ = auVar14._28_4_;
          auVar14 = vandps_avx(auVar332,auVar129);
          auVar14 = vcmpps_avx(auVar14,auVar83,1);
          auVar269._8_4_ = 0xff800000;
          auVar269._0_8_ = 0xff800000ff800000;
          auVar269._12_4_ = 0xff800000;
          auVar269._16_4_ = 0xff800000;
          auVar269._20_4_ = 0xff800000;
          auVar269._24_4_ = 0xff800000;
          auVar269._28_4_ = 0xff800000;
          auVar265 = vblendvps_avx(auVar269,auVar76,auVar364);
          auVar16 = auVar364 & auVar14;
          if ((((((((auVar16 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar16 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar16 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar16 >> 0x7f,0) != '\0') ||
                (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar16 >> 0xbf,0) != '\0') ||
              (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar16[0x1f] < '\0') {
            auVar12 = vandps_avx(auVar14,auVar364);
            auVar236 = vpackssdw_avx(auVar12._0_16_,auVar12._16_16_);
            auVar85 = ZEXT412(0);
            auVar431 = ZEXT1264(auVar85) << 0x20;
            auVar396 = vcmpps_avx(auVar13,ZEXT1232(auVar85) << 0x20,2);
            auVar441._8_4_ = 0xff800000;
            auVar441._0_8_ = 0xff800000ff800000;
            auVar441._12_4_ = 0xff800000;
            auVar441._16_4_ = 0xff800000;
            auVar441._20_4_ = 0xff800000;
            auVar441._24_4_ = 0xff800000;
            auVar441._28_4_ = 0xff800000;
            auVar442._8_4_ = 0x7f800000;
            auVar442._0_8_ = 0x7f8000007f800000;
            auVar442._12_4_ = 0x7f800000;
            auVar442._16_4_ = 0x7f800000;
            auVar442._20_4_ = 0x7f800000;
            auVar442._24_4_ = 0x7f800000;
            auVar442._28_4_ = 0x7f800000;
            auVar136 = vblendvps_avx(auVar442,auVar441,auVar396);
            auVar214 = vpmovsxwd_avx(auVar236);
            auVar410 = ZEXT1664(auVar214);
            auVar236 = vpunpckhwd_avx(auVar236,auVar236);
            auVar334._16_16_ = auVar236;
            auVar334._0_16_ = auVar214;
            auVar205 = vblendvps_avx(auVar205,auVar136,auVar334);
            auVar136 = vblendvps_avx(auVar441,auVar442,auVar396);
            auVar265 = vblendvps_avx(auVar265,auVar136,auVar334);
            auVar13 = vcmpps_avx(ZEXT1232(auVar85) << 0x20,ZEXT1232(auVar85) << 0x20,0xf);
            auVar182._0_4_ = auVar13._0_4_ ^ auVar12._0_4_;
            auVar182._4_4_ = auVar13._4_4_ ^ auVar12._4_4_;
            auVar182._8_4_ = auVar13._8_4_ ^ auVar12._8_4_;
            auVar182._12_4_ = auVar13._12_4_ ^ auVar12._12_4_;
            auVar182._16_4_ = auVar13._16_4_ ^ auVar12._16_4_;
            auVar182._20_4_ = auVar13._20_4_ ^ auVar12._20_4_;
            auVar182._24_4_ = auVar13._24_4_ ^ auVar12._24_4_;
            auVar182._28_4_ = auVar13._28_4_ ^ auVar12._28_4_;
            auVar12 = vorps_avx(auVar396,auVar182);
            auVar12 = vandps_avx(auVar364,auVar12);
          }
          auVar403 = ZEXT3264(auVar136);
          auVar397 = ZEXT3264(auVar396);
          auVar219 = auVar17._0_28_;
          auVar244 = auVar28._0_28_;
          auVar360 = local_960._0_28_;
          local_a60 = auVar128;
        }
        auVar335 = ZEXT3264(_local_760);
        _local_320 = _local_760;
        local_300 = vminps_avx(local_2c0,auVar205);
        local_8c0 = vmaxps_avx(_local_760,auVar265);
        _local_2e0 = local_8c0;
        auVar136 = vcmpps_avx(_local_760,local_300,2);
        local_6c0 = vandps_avx(auVar136,auVar128);
        auVar136 = vcmpps_avx(local_8c0,local_2c0,2);
        local_7a0 = vandps_avx(auVar136,auVar128);
        auVar128 = vorps_avx(local_7a0,local_6c0);
        if ((((((((auVar128 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar128 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar128 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar128 >> 0x7f,0) != '\0') ||
              (auVar128 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar128 >> 0xbf,0) != '\0') ||
            (auVar128 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar128[0x1f] < '\0') {
          local_a20 = vcmpps_avx(ZEXT1632(ZEXT816(0) << 0x20),ZEXT1632(ZEXT816(0) << 0x20),0xf);
          local_740._0_4_ = auVar12._0_4_ ^ local_a20._0_4_;
          local_740._4_4_ = auVar12._4_4_ ^ local_a20._4_4_;
          local_740._8_4_ = auVar12._8_4_ ^ local_a20._8_4_;
          local_740._12_4_ = auVar12._12_4_ ^ local_a20._12_4_;
          local_740._16_4_ = auVar12._16_4_ ^ local_a20._16_4_;
          local_740._20_4_ = auVar12._20_4_ ^ local_a20._20_4_;
          local_740._24_4_ = auVar12._24_4_ ^ local_a20._24_4_;
          local_740._28_4_ = (uint)auVar12._28_4_ ^ (uint)local_a20._28_4_;
          auVar137._0_4_ =
               auVar219._0_4_ * (float)local_860._0_4_ +
               auVar244._0_4_ * (float)local_880._0_4_ + auVar360._0_4_ * (float)local_8a0._0_4_;
          auVar137._4_4_ =
               auVar219._4_4_ * (float)local_860._4_4_ +
               auVar244._4_4_ * (float)local_880._4_4_ + auVar360._4_4_ * (float)local_8a0._4_4_;
          auVar137._8_4_ =
               auVar219._8_4_ * fStack_858 +
               auVar244._8_4_ * fStack_878 + auVar360._8_4_ * fStack_898;
          auVar137._12_4_ =
               auVar219._12_4_ * fStack_854 +
               auVar244._12_4_ * fStack_874 + auVar360._12_4_ * fStack_894;
          auVar137._16_4_ =
               auVar219._16_4_ * fStack_850 +
               auVar244._16_4_ * fStack_870 + auVar360._16_4_ * fStack_890;
          auVar137._20_4_ =
               auVar219._20_4_ * fStack_84c +
               auVar244._20_4_ * fStack_86c + auVar360._20_4_ * fStack_88c;
          auVar137._24_4_ =
               auVar219._24_4_ * fStack_848 +
               auVar244._24_4_ * fStack_868 + auVar360._24_4_ * fStack_888;
          auVar137._28_4_ = local_a20._28_4_ + auVar12._28_4_ + local_6c0._28_4_;
          auVar168._8_4_ = 0x7fffffff;
          auVar168._0_8_ = 0x7fffffff7fffffff;
          auVar168._12_4_ = 0x7fffffff;
          auVar168._16_4_ = 0x7fffffff;
          auVar168._20_4_ = 0x7fffffff;
          auVar168._24_4_ = 0x7fffffff;
          auVar168._28_4_ = 0x7fffffff;
          auVar128 = vandps_avx(auVar137,auVar168);
          auVar169._8_4_ = 0x3e99999a;
          auVar169._0_8_ = 0x3e99999a3e99999a;
          auVar169._12_4_ = 0x3e99999a;
          auVar169._16_4_ = 0x3e99999a;
          auVar169._20_4_ = 0x3e99999a;
          auVar169._24_4_ = 0x3e99999a;
          auVar169._28_4_ = 0x3e99999a;
          auVar128 = vcmpps_avx(auVar128,auVar169,1);
          auVar128 = vorps_avx(auVar128,local_740);
          auVar170._8_4_ = 3;
          auVar170._0_8_ = 0x300000003;
          auVar170._12_4_ = 3;
          auVar170._16_4_ = 3;
          auVar170._20_4_ = 3;
          auVar170._24_4_ = 3;
          auVar170._28_4_ = 3;
          auVar208._8_4_ = 2;
          auVar208._0_8_ = 0x200000002;
          auVar208._12_4_ = 2;
          auVar208._16_4_ = 2;
          auVar208._20_4_ = 2;
          auVar208._24_4_ = 2;
          auVar208._28_4_ = 2;
          auVar128 = vblendvps_avx(auVar208,auVar170,auVar128);
          local_720 = ZEXT432((uint)uVar113);
          local_800 = vpshufd_avx(ZEXT416((uint)uVar113),0);
          auVar236 = vpcmpgtd_avx(auVar128._16_16_,local_800);
          auStack_7f0 = auVar27._16_16_;
          auVar214 = vpcmpgtd_avx(auVar128._0_16_,local_800);
          auVar171._16_16_ = auVar236;
          auVar171._0_16_ = auVar214;
          local_6e0 = vblendps_avx(ZEXT1632(auVar214),auVar171,0xf0);
          auVar128 = vandnps_avx(local_6e0,local_6c0);
          auVar136 = local_6c0 & ~local_6e0;
          auVar290 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
          auStack_7b8 = auVar15._8_24_;
          local_7c0 = uVar113;
          local_780 = auVar128;
          local_700 = local_7a0;
          if ((((((((auVar136 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar136 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar136 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar136 >> 0x7f,0) != '\0') ||
                (auVar136 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar136 >> 0xbf,0) != '\0') ||
              (auVar136 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar136[0x1f] < '\0') {
            local_8e0._4_4_ = (float)local_760._4_4_ + (float)local_a00._4_4_;
            local_8e0._0_4_ = (float)local_760._0_4_ + (float)local_a00._0_4_;
            fStack_8d8 = fStack_758 + fStack_9f8;
            fStack_8d4 = fStack_754 + fStack_9f4;
            fStack_8d0 = fStack_750 + fStack_9f0;
            fStack_8cc = fStack_74c + fStack_9ec;
            fStack_8c8 = fStack_748 + fStack_9e8;
            fStack_8c4 = fStack_744 + fStack_9e4;
            do {
              auVar235 = auVar290._0_16_;
              auVar172._8_4_ = 0x7f800000;
              auVar172._0_8_ = 0x7f8000007f800000;
              auVar172._12_4_ = 0x7f800000;
              auVar172._16_4_ = 0x7f800000;
              auVar172._20_4_ = 0x7f800000;
              auVar172._24_4_ = 0x7f800000;
              auVar172._28_4_ = 0x7f800000;
              auVar136 = vblendvps_avx(auVar172,_local_760,auVar128);
              auVar12 = vshufps_avx(auVar136,auVar136,0xb1);
              auVar12 = vminps_avx(auVar136,auVar12);
              auVar13 = vshufpd_avx(auVar12,auVar12,5);
              auVar12 = vminps_avx(auVar12,auVar13);
              auVar13 = vperm2f128_avx(auVar12,auVar12,1);
              auVar12 = vminps_avx(auVar12,auVar13);
              auVar12 = vcmpps_avx(auVar136,auVar12,0);
              auVar13 = auVar128 & auVar12;
              auVar136 = auVar128;
              if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar13 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar13 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar13 >> 0x7f,0) != '\0') ||
                    (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar13 >> 0xbf,0) != '\0') ||
                  (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar13[0x1f] < '\0') {
                auVar136 = vandps_avx(auVar12,auVar128);
              }
              uVar110 = vmovmskps_avx(auVar136);
              uVar10 = 0;
              if (uVar110 != 0) {
                for (; (uVar110 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
                }
              }
              uVar113 = (ulong)uVar10;
              local_780 = auVar128;
              *(undefined4 *)(local_780 + uVar113 * 4) = 0;
              fVar228 = local_680[uVar113];
              uVar10 = *(uint *)(local_320 + uVar113 * 4);
              fVar229 = auVar151._0_4_;
              if ((float)local_980._0_4_ < 0.0) {
                fVar229 = sqrtf((float)local_980._0_4_);
                auVar235._8_4_ = 0x7fffffff;
                auVar235._0_8_ = 0x7fffffff7fffffff;
                auVar235._12_4_ = 0x7fffffff;
              }
              auVar410 = ZEXT464(uVar10);
              auVar403 = ZEXT464((uint)fVar228);
              auVar214 = vminps_avx(_local_aa0,_local_ac0);
              auVar236 = vmaxps_avx(_local_aa0,_local_ac0);
              auVar156 = vminps_avx(_local_ab0,_local_ad0);
              auVar120 = vminps_avx(auVar214,auVar156);
              auVar214 = vmaxps_avx(_local_ab0,_local_ad0);
              auVar156 = vmaxps_avx(auVar236,auVar214);
              auVar236 = vandps_avx(auVar120,auVar235);
              auVar214 = vandps_avx(auVar156,auVar235);
              auVar236 = vmaxps_avx(auVar236,auVar214);
              auVar214 = vmovshdup_avx(auVar236);
              auVar214 = vmaxss_avx(auVar214,auVar236);
              auVar236 = vshufpd_avx(auVar236,auVar236,1);
              auVar236 = vmaxss_avx(auVar236,auVar214);
              local_a60._0_4_ = auVar236._0_4_ * 1.9073486e-06;
              local_820._0_4_ = fVar229 * 1.9073486e-06;
              local_840._0_16_ = vshufps_avx(auVar156,auVar156,0xff);
              lVar111 = 4;
              do {
                auVar236 = vshufps_avx(auVar410._0_16_,auVar410._0_16_,0);
                auVar119._0_4_ = auVar236._0_4_ * (float)local_970._0_4_ + 0.0;
                auVar119._4_4_ = auVar236._4_4_ * (float)local_970._4_4_ + 0.0;
                auVar119._8_4_ = auVar236._8_4_ * fStack_968 + 0.0;
                auVar119._12_4_ = auVar236._12_4_ * fStack_964 + 0.0;
                fVar230 = auVar403._0_4_;
                fVar229 = 1.0 - fVar230;
                fVar228 = fVar230 * 3.0;
                auVar236 = ZEXT416((uint)(fVar230 * fVar230 * -fVar229 * 0.5));
                auVar236 = vshufps_avx(auVar236,auVar236,0);
                auVar214 = ZEXT416((uint)((fVar229 * fVar229 * (fVar229 * 3.0 + -5.0) + 2.0) * 0.5))
                ;
                auVar214 = vshufps_avx(auVar214,auVar214,0);
                auVar156 = ZEXT416((uint)((fVar230 * fVar230 * (fVar228 + -5.0) + 2.0) * 0.5));
                auVar156 = vshufps_avx(auVar156,auVar156,0);
                auVar120 = ZEXT416((uint)(fVar229 * fVar229 * -fVar230 * 0.5));
                auVar120 = vshufps_avx(auVar120,auVar120,0);
                auVar193._0_4_ =
                     auVar120._0_4_ * (float)local_aa0._0_4_ +
                     auVar156._0_4_ * (float)local_ac0._0_4_ +
                     auVar214._0_4_ * (float)local_ab0._0_4_ +
                     auVar236._0_4_ * (float)local_ad0._0_4_;
                auVar193._4_4_ =
                     auVar120._4_4_ * (float)local_aa0._4_4_ +
                     auVar156._4_4_ * (float)local_ac0._4_4_ +
                     auVar214._4_4_ * (float)local_ab0._4_4_ +
                     auVar236._4_4_ * (float)local_ad0._4_4_;
                auVar193._8_4_ =
                     auVar120._8_4_ * fStack_a98 +
                     auVar156._8_4_ * fStack_ab8 +
                     auVar214._8_4_ * fStack_aa8 + auVar236._8_4_ * fStack_ac8;
                auVar193._12_4_ =
                     auVar120._12_4_ * fStack_a94 +
                     auVar156._12_4_ * fStack_ab4 +
                     auVar214._12_4_ * fStack_aa4 + auVar236._12_4_ * fStack_ac4;
                local_960._0_16_ = auVar193;
                auVar214 = vsubps_avx(auVar119,auVar193);
                auVar236 = vdpps_avx(auVar214,auVar214,0x7f);
                fVar231 = auVar236._0_4_;
                local_c80 = auVar410._0_4_;
                if (fVar231 < 0.0) {
                  local_9a0._0_4_ = fVar228;
                  local_9c0._0_4_ = fVar230 * 9.0;
                  local_9e0._0_4_ = fVar229 * -2.0;
                  fVar232 = sqrtf(fVar231);
                  fVar249 = (float)local_9c0._0_4_;
                  fVar233 = (float)local_9e0._0_4_;
                  fVar234 = (float)local_9a0._0_4_;
                }
                else {
                  auVar156 = vsqrtss_avx(auVar236,auVar236);
                  fVar232 = auVar156._0_4_;
                  fVar249 = fVar230 * 9.0;
                  fVar233 = fVar229 * -2.0;
                  fVar234 = fVar228;
                }
                auVar156 = ZEXT416((uint)((fVar230 * fVar230 + fVar233 * fVar230) * 0.5));
                auVar156 = vshufps_avx(auVar156,auVar156,0);
                auVar120 = ZEXT416((uint)(((fVar229 + fVar229) * (fVar234 + 2.0) +
                                          fVar229 * fVar229 * -3.0) * 0.5));
                auVar120 = vshufps_avx(auVar120,auVar120,0);
                auVar194 = ZEXT416((uint)(((fVar230 + fVar230) * (fVar228 + -5.0) +
                                          fVar230 * fVar234) * 0.5));
                auVar194 = vshufps_avx(auVar194,auVar194,0);
                auVar152 = ZEXT416((uint)((fVar230 * (fVar229 + fVar229) - fVar229 * fVar229) * 0.5)
                                  );
                auVar152 = vshufps_avx(auVar152,auVar152,0);
                auVar425._0_4_ =
                     (float)local_aa0._0_4_ * auVar152._0_4_ +
                     (float)local_ac0._0_4_ * auVar194._0_4_ +
                     (float)local_ad0._0_4_ * auVar156._0_4_ +
                     (float)local_ab0._0_4_ * auVar120._0_4_;
                auVar425._4_4_ =
                     (float)local_aa0._4_4_ * auVar152._4_4_ +
                     (float)local_ac0._4_4_ * auVar194._4_4_ +
                     (float)local_ad0._4_4_ * auVar156._4_4_ +
                     (float)local_ab0._4_4_ * auVar120._4_4_;
                auVar425._8_4_ =
                     fStack_a98 * auVar152._8_4_ +
                     fStack_ab8 * auVar194._8_4_ +
                     fStack_ac8 * auVar156._8_4_ + fStack_aa8 * auVar120._8_4_;
                auVar425._12_4_ =
                     fStack_a94 * auVar152._12_4_ +
                     fStack_ab4 * auVar194._12_4_ +
                     fStack_ac4 * auVar156._12_4_ + fStack_aa4 * auVar120._12_4_;
                auVar152 = vpermilps_avx(ZEXT416((uint)(fVar228 + -1.0)),0);
                auVar155 = vpermilps_avx(ZEXT416((uint)(fVar230 * -9.0 + 4.0)),0);
                auVar156 = vshufps_avx(ZEXT416((uint)(fVar249 + -5.0)),
                                       ZEXT416((uint)(fVar249 + -5.0)),0);
                auVar120 = ZEXT416((uint)(fVar230 * -3.0 + 2.0));
                auVar194 = vshufps_avx(auVar120,auVar120,0);
                auVar120 = vdpps_avx(auVar425,auVar425,0x7f);
                auVar153._0_4_ =
                     (float)local_aa0._0_4_ * auVar194._0_4_ +
                     (float)local_ac0._0_4_ * auVar156._0_4_ +
                     (float)local_ab0._0_4_ * auVar155._0_4_ +
                     (float)local_ad0._0_4_ * auVar152._0_4_;
                auVar153._4_4_ =
                     (float)local_aa0._4_4_ * auVar194._4_4_ +
                     (float)local_ac0._4_4_ * auVar156._4_4_ +
                     (float)local_ab0._4_4_ * auVar155._4_4_ +
                     (float)local_ad0._4_4_ * auVar152._4_4_;
                auVar153._8_4_ =
                     fStack_a98 * auVar194._8_4_ +
                     fStack_ab8 * auVar156._8_4_ +
                     fStack_aa8 * auVar155._8_4_ + fStack_ac8 * auVar152._8_4_;
                auVar153._12_4_ =
                     fStack_a94 * auVar194._12_4_ +
                     fStack_ab4 * auVar156._12_4_ +
                     fStack_aa4 * auVar155._12_4_ + fStack_ac4 * auVar152._12_4_;
                auVar156 = vblendps_avx(auVar120,_DAT_01feba10,0xe);
                auVar194 = vrsqrtss_avx(auVar156,auVar156);
                fVar229 = auVar194._0_4_;
                fVar228 = auVar120._0_4_;
                auVar194 = vdpps_avx(auVar425,auVar153,0x7f);
                auVar152 = vshufps_avx(auVar120,auVar120,0);
                auVar154._0_4_ = auVar153._0_4_ * auVar152._0_4_;
                auVar154._4_4_ = auVar153._4_4_ * auVar152._4_4_;
                auVar154._8_4_ = auVar153._8_4_ * auVar152._8_4_;
                auVar154._12_4_ = auVar153._12_4_ * auVar152._12_4_;
                auVar194 = vshufps_avx(auVar194,auVar194,0);
                auVar237._0_4_ = auVar425._0_4_ * auVar194._0_4_;
                auVar237._4_4_ = auVar425._4_4_ * auVar194._4_4_;
                auVar237._8_4_ = auVar425._8_4_ * auVar194._8_4_;
                auVar237._12_4_ = auVar425._12_4_ * auVar194._12_4_;
                auVar155 = vsubps_avx(auVar154,auVar237);
                auVar194 = vrcpss_avx(auVar156,auVar156);
                auVar156 = vmaxss_avx(ZEXT416((uint)local_a60._0_4_),
                                      ZEXT416((uint)(local_c80 * (float)local_820._0_4_)));
                auVar397 = ZEXT1664(auVar156);
                auVar194 = ZEXT416((uint)(auVar194._0_4_ * (2.0 - fVar228 * auVar194._0_4_)));
                auVar194 = vshufps_avx(auVar194,auVar194,0);
                uVar113 = CONCAT44(auVar425._4_4_,auVar425._0_4_);
                auVar259._0_8_ = uVar113 ^ 0x8000000080000000;
                auVar259._8_4_ = -auVar425._8_4_;
                auVar259._12_4_ = -auVar425._12_4_;
                auVar152 = ZEXT416((uint)(fVar229 * 1.5 +
                                         fVar228 * -0.5 * fVar229 * fVar229 * fVar229));
                auVar152 = vshufps_avx(auVar152,auVar152,0);
                auVar215._0_4_ = auVar152._0_4_ * auVar155._0_4_ * auVar194._0_4_;
                auVar215._4_4_ = auVar152._4_4_ * auVar155._4_4_ * auVar194._4_4_;
                auVar215._8_4_ = auVar152._8_4_ * auVar155._8_4_ * auVar194._8_4_;
                auVar215._12_4_ = auVar152._12_4_ * auVar155._12_4_ * auVar194._12_4_;
                auVar282._0_4_ = auVar425._0_4_ * auVar152._0_4_;
                auVar282._4_4_ = auVar425._4_4_ * auVar152._4_4_;
                auVar282._8_4_ = auVar425._8_4_ * auVar152._8_4_;
                auVar282._12_4_ = auVar425._12_4_ * auVar152._12_4_;
                if (fVar228 < 0.0) {
                  fVar228 = sqrtf(fVar228);
                  auVar397 = ZEXT464(auVar156._0_4_);
                }
                else {
                  auVar120 = vsqrtss_avx(auVar120,auVar120);
                  fVar228 = auVar120._0_4_;
                }
                auVar120 = vdpps_avx(auVar214,auVar282,0x7f);
                fVar228 = ((float)local_a60._0_4_ / fVar228) * (fVar232 + 1.0) +
                          auVar397._0_4_ + fVar232 * (float)local_a60._0_4_;
                auVar194 = vdpps_avx(auVar259,auVar282,0x7f);
                auVar152 = vdpps_avx(auVar214,auVar215,0x7f);
                auVar155 = vdpps_avx(_local_970,auVar282,0x7f);
                auVar3 = vdpps_avx(auVar214,auVar259,0x7f);
                fVar229 = auVar194._0_4_ + auVar152._0_4_;
                fVar232 = auVar120._0_4_;
                auVar121._0_4_ = fVar232 * fVar232;
                auVar121._4_4_ = auVar120._4_4_ * auVar120._4_4_;
                auVar121._8_4_ = auVar120._8_4_ * auVar120._8_4_;
                auVar121._12_4_ = auVar120._12_4_ * auVar120._12_4_;
                auVar152 = vsubps_avx(auVar236,auVar121);
                auVar194 = vdpps_avx(auVar214,_local_970,0x7f);
                fVar233 = auVar3._0_4_ - fVar232 * fVar229;
                fVar234 = auVar194._0_4_ - fVar232 * auVar155._0_4_;
                auVar194 = vrsqrtss_avx(auVar152,auVar152);
                fVar249 = auVar152._0_4_;
                fVar232 = auVar194._0_4_;
                fVar232 = fVar232 * 1.5 + fVar249 * -0.5 * fVar232 * fVar232 * fVar232;
                if (fVar249 < 0.0) {
                  local_9a0._0_4_ = fVar233;
                  local_9c0._0_4_ = fVar234;
                  local_9e0._0_4_ = fVar232;
                  fVar249 = sqrtf(fVar249);
                  auVar397 = ZEXT464(auVar156._0_4_);
                  fVar232 = (float)local_9e0._0_4_;
                  fVar233 = (float)local_9a0._0_4_;
                  fVar234 = (float)local_9c0._0_4_;
                }
                else {
                  auVar156 = vsqrtss_avx(auVar152,auVar152);
                  fVar249 = auVar156._0_4_;
                }
                auVar431 = ZEXT1664(auVar120);
                auVar335 = ZEXT1664(auVar236);
                auVar194 = vpermilps_avx(local_960._0_16_,0xff);
                auVar3 = vshufps_avx(auVar425,auVar425,0xff);
                fVar233 = fVar233 * fVar232 - auVar3._0_4_;
                auVar238._0_8_ = auVar155._0_8_ ^ 0x8000000080000000;
                auVar238._8_4_ = auVar155._8_4_ ^ 0x80000000;
                auVar238._12_4_ = auVar155._12_4_ ^ 0x80000000;
                auVar260._0_4_ = -fVar233;
                auVar260._4_4_ = 0x80000000;
                auVar260._8_4_ = 0x80000000;
                auVar260._12_4_ = 0x80000000;
                auVar156 = vinsertps_avx(ZEXT416((uint)(fVar234 * fVar232)),auVar238,0x10);
                auVar152 = vmovsldup_avx(ZEXT416((uint)(fVar229 * fVar234 * fVar232 -
                                                       auVar155._0_4_ * fVar233)));
                auVar156 = vdivps_avx(auVar156,auVar152);
                auVar155 = ZEXT416((uint)(fVar249 - auVar194._0_4_));
                auVar194 = vinsertps_avx(auVar120,auVar155,0x10);
                auVar216._0_4_ = auVar194._0_4_ * auVar156._0_4_;
                auVar216._4_4_ = auVar194._4_4_ * auVar156._4_4_;
                auVar216._8_4_ = auVar194._8_4_ * auVar156._8_4_;
                auVar216._12_4_ = auVar194._12_4_ * auVar156._12_4_;
                auVar156 = vinsertps_avx(auVar260,ZEXT416((uint)fVar229),0x1c);
                auVar156 = vdivps_avx(auVar156,auVar152);
                auVar195._0_4_ = auVar194._0_4_ * auVar156._0_4_;
                auVar195._4_4_ = auVar194._4_4_ * auVar156._4_4_;
                auVar195._8_4_ = auVar194._8_4_ * auVar156._8_4_;
                auVar195._12_4_ = auVar194._12_4_ * auVar156._12_4_;
                auVar156 = vhaddps_avx(auVar216,auVar216);
                auVar194 = vhaddps_avx(auVar195,auVar195);
                fVar230 = fVar230 - auVar156._0_4_;
                local_c80 = local_c80 - auVar194._0_4_;
                auVar410 = ZEXT464((uint)local_c80);
                auVar239._8_4_ = 0x7fffffff;
                auVar239._0_8_ = 0x7fffffff7fffffff;
                auVar239._12_4_ = 0x7fffffff;
                auVar290 = ZEXT1664(auVar239);
                auVar156 = vandps_avx(auVar120,auVar239);
                if (fVar228 <= auVar156._0_4_) {
LAB_0115357f:
                  bVar84 = false;
                }
                else {
                  auVar156 = vandps_avx(auVar155,auVar239);
                  if ((float)local_840._0_4_ * 1.9073486e-06 + auVar397._0_4_ + fVar228 <=
                      auVar156._0_4_) goto LAB_0115357f;
                  local_c80 = local_c80 + (float)local_940._0_4_;
                  auVar410 = ZEXT464((uint)local_c80);
                  bVar84 = true;
                  if (((fVar212 <= local_c80) &&
                      (fVar228 = *(float *)(ray + k * 4 + 0x100), local_c80 <= fVar228)) &&
                     ((0.0 <= fVar230 && (fVar230 <= 1.0)))) {
                    auVar156 = vrsqrtss_avx(auVar236,auVar236);
                    fVar229 = auVar156._0_4_;
                    pGVar7 = (context->scene->geometries).items[uVar108].ptr;
                    if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                      auVar156 = ZEXT416((uint)(fVar229 * 1.5 +
                                               fVar231 * -0.5 * fVar229 * fVar229 * fVar229));
                      auVar156 = vshufps_avx(auVar156,auVar156,0);
                      local_c00._0_4_ = auVar214._0_4_;
                      local_c00._4_4_ = auVar214._4_4_;
                      fStack_bf8 = auVar214._8_4_;
                      fStack_bf4 = auVar214._12_4_;
                      auVar157._0_4_ = auVar156._0_4_ * (float)local_c00._0_4_;
                      auVar157._4_4_ = auVar156._4_4_ * (float)local_c00._4_4_;
                      auVar157._8_4_ = auVar156._8_4_ * fStack_bf8;
                      auVar157._12_4_ = auVar156._12_4_ * fStack_bf4;
                      auVar122._0_4_ = auVar425._0_4_ + auVar3._0_4_ * auVar157._0_4_;
                      auVar122._4_4_ = auVar425._4_4_ + auVar3._4_4_ * auVar157._4_4_;
                      auVar122._8_4_ = auVar425._8_4_ + auVar3._8_4_ * auVar157._8_4_;
                      auVar122._12_4_ = auVar425._12_4_ + auVar3._12_4_ * auVar157._12_4_;
                      auVar214 = vshufps_avx(auVar157,auVar157,0xc9);
                      auVar156 = vshufps_avx(auVar425,auVar425,0xc9);
                      auVar158._0_4_ = auVar156._0_4_ * auVar157._0_4_;
                      auVar158._4_4_ = auVar156._4_4_ * auVar157._4_4_;
                      auVar158._8_4_ = auVar156._8_4_ * auVar157._8_4_;
                      auVar158._12_4_ = auVar156._12_4_ * auVar157._12_4_;
                      auVar196._0_4_ = auVar425._0_4_ * auVar214._0_4_;
                      auVar196._4_4_ = auVar425._4_4_ * auVar214._4_4_;
                      auVar196._8_4_ = auVar425._8_4_ * auVar214._8_4_;
                      auVar196._12_4_ = auVar425._12_4_ * auVar214._12_4_;
                      auVar194 = vsubps_avx(auVar196,auVar158);
                      auVar214 = vshufps_avx(auVar194,auVar194,0xc9);
                      auVar156 = vshufps_avx(auVar122,auVar122,0xc9);
                      auVar197._0_4_ = auVar156._0_4_ * auVar214._0_4_;
                      auVar197._4_4_ = auVar156._4_4_ * auVar214._4_4_;
                      auVar197._8_4_ = auVar156._8_4_ * auVar214._8_4_;
                      auVar197._12_4_ = auVar156._12_4_ * auVar214._12_4_;
                      auVar214 = vshufps_avx(auVar194,auVar194,0xd2);
                      auVar123._0_4_ = auVar122._0_4_ * auVar214._0_4_;
                      auVar123._4_4_ = auVar122._4_4_ * auVar214._4_4_;
                      auVar123._8_4_ = auVar122._8_4_ * auVar214._8_4_;
                      auVar123._12_4_ = auVar122._12_4_ * auVar214._12_4_;
                      auVar214 = vsubps_avx(auVar197,auVar123);
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x100) = local_c80;
                        uVar1 = vextractps_avx(auVar214,1);
                        *(undefined4 *)(ray + k * 4 + 0x180) = uVar1;
                        uVar1 = vextractps_avx(auVar214,2);
                        *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar1;
                        *(int *)(ray + k * 4 + 0x1c0) = auVar214._0_4_;
                        *(float *)(ray + k * 4 + 0x1e0) = fVar230;
                        *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                        *(uint *)(ray + k * 4 + 0x220) = uVar109;
                        *(uint *)(ray + k * 4 + 0x240) = uVar108;
                        *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                      }
                      else {
                        pRVar9 = context->user;
                        auStack_5f0 = vshufps_avx(ZEXT416((uint)fVar230),ZEXT416((uint)fVar230),0);
                        auStack_650 = vshufps_avx(auVar214,auVar214,0x55);
                        auStack_630 = vshufps_avx(auVar214,auVar214,0xaa);
                        auStack_610 = vshufps_avx(auVar214,auVar214,0);
                        local_660 = (RTCHitN  [16])auStack_650;
                        local_640 = auStack_630;
                        local_620 = auStack_610;
                        local_600 = auStack_5f0;
                        local_5e0 = ZEXT832(0) << 0x20;
                        local_5c0 = local_500._0_8_;
                        uStack_5b8 = local_500._8_8_;
                        uStack_5b0 = local_500._16_8_;
                        uStack_5a8 = local_500._24_8_;
                        local_5a0 = local_4e0._0_8_;
                        uStack_598 = local_4e0._8_8_;
                        uStack_590 = local_4e0._16_8_;
                        uStack_588 = local_4e0._24_8_;
                        local_a28[1] = local_a20;
                        *local_a28 = local_a20;
                        local_580 = pRVar9->instID[0];
                        uStack_57c = local_580;
                        uStack_578 = local_580;
                        uStack_574 = local_580;
                        uStack_570 = local_580;
                        uStack_56c = local_580;
                        uStack_568 = local_580;
                        uStack_564 = local_580;
                        local_560 = pRVar9->instPrimID[0];
                        uStack_55c = local_560;
                        uStack_558 = local_560;
                        uStack_554 = local_560;
                        uStack_550 = local_560;
                        uStack_54c = local_560;
                        uStack_548 = local_560;
                        uStack_544 = local_560;
                        *(float *)(ray + k * 4 + 0x100) = local_c80;
                        local_b00 = *local_a30;
                        uStack_af8 = local_a30[1];
                        local_af0 = *local_a38;
                        uStack_ae8 = local_a38[1];
                        local_a90.valid = (int *)&local_b00;
                        local_a90.geometryUserPtr = pGVar7->userPtr;
                        local_a90.context = context->user;
                        local_a90.hit = local_660;
                        local_a90.N = 8;
                        local_a90.ray = (RTCRayN *)ray;
                        if (pGVar7->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar335 = ZEXT1664(auVar236);
                          auVar397 = ZEXT1664(auVar397._0_16_);
                          auVar431 = ZEXT1664(auVar120);
                          (*pGVar7->intersectionFilterN)(&local_a90);
                        }
                        auVar98._8_8_ = uStack_af8;
                        auVar98._0_8_ = local_b00;
                        auVar236 = vpcmpeqd_avx((undefined1  [16])0x0,auVar98);
                        auVar102._8_8_ = uStack_ae8;
                        auVar102._0_8_ = local_af0;
                        auVar214 = vpcmpeqd_avx((undefined1  [16])0x0,auVar102);
                        auVar138._16_16_ = auVar214;
                        auVar138._0_16_ = auVar236;
                        auVar128 = local_a20 & ~auVar138;
                        if ((((((((auVar128 >> 0x1f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0 &&
                                 (auVar128 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                 ) && (auVar128 >> 0x5f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) && SUB321(auVar128 >> 0x7f,0) == '\0')
                              && (auVar128 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0
                              ) && SUB321(auVar128 >> 0xbf,0) == '\0') &&
                            (auVar128 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                            -1 < auVar128[0x1f]) {
                          auVar139._0_4_ = auVar236._0_4_ ^ local_a20._0_4_;
                          auVar139._4_4_ = auVar236._4_4_ ^ local_a20._4_4_;
                          auVar139._8_4_ = auVar236._8_4_ ^ local_a20._8_4_;
                          auVar139._12_4_ = auVar236._12_4_ ^ local_a20._12_4_;
                          auVar139._16_4_ = auVar214._0_4_ ^ local_a20._16_4_;
                          auVar139._20_4_ = auVar214._4_4_ ^ local_a20._20_4_;
                          auVar139._24_4_ = auVar214._8_4_ ^ local_a20._24_4_;
                          auVar139._28_4_ = auVar214._12_4_ ^ local_a20._28_4_;
                          auVar290 = ZEXT1664(CONCAT412(0x7fffffff,
                                                        CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                        }
                        else {
                          p_Var8 = context->args->filter;
                          auVar290 = ZEXT1664(CONCAT412(0x7fffffff,
                                                        CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                          if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar335 = ZEXT1664(auVar335._0_16_);
                            auVar397 = ZEXT1664(auVar397._0_16_);
                            auVar431 = ZEXT1664(auVar431._0_16_);
                            (*p_Var8)(&local_a90);
                            auVar290 = ZEXT1664(CONCAT412(0x7fffffff,
                                                          CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                          }
                          auVar99._8_8_ = uStack_af8;
                          auVar99._0_8_ = local_b00;
                          auVar236 = vpcmpeqd_avx((undefined1  [16])0x0,auVar99);
                          auVar103._8_8_ = uStack_ae8;
                          auVar103._0_8_ = local_af0;
                          auVar214 = vpcmpeqd_avx((undefined1  [16])0x0,auVar103);
                          auVar173._16_16_ = auVar214;
                          auVar173._0_16_ = auVar236;
                          auVar139._0_4_ = auVar236._0_4_ ^ local_a20._0_4_;
                          auVar139._4_4_ = auVar236._4_4_ ^ local_a20._4_4_;
                          auVar139._8_4_ = auVar236._8_4_ ^ local_a20._8_4_;
                          auVar139._12_4_ = auVar236._12_4_ ^ local_a20._12_4_;
                          auVar139._16_4_ = auVar214._0_4_ ^ local_a20._16_4_;
                          auVar139._20_4_ = auVar214._4_4_ ^ local_a20._20_4_;
                          auVar139._24_4_ = auVar214._8_4_ ^ local_a20._24_4_;
                          auVar139._28_4_ = auVar214._12_4_ ^ local_a20._28_4_;
                          auVar128 = local_a20 & ~auVar173;
                          if ((((((((auVar128 >> 0x1f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0 ||
                                   (auVar128 >> 0x3f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar128 >> 0x5f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) || SUB321(auVar128 >> 0x7f,0) != '\0') ||
                                (auVar128 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0)
                               || SUB321(auVar128 >> 0xbf,0) != '\0') ||
                              (auVar128 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0)
                              || auVar128[0x1f] < '\0') {
                            auVar128 = vmaskmovps_avx(auVar139,*(undefined1 (*) [32])local_a90.hit);
                            *(undefined1 (*) [32])(local_a90.ray + 0x180) = auVar128;
                            auVar128 = vmaskmovps_avx(auVar139,*(undefined1 (*) [32])
                                                                (local_a90.hit + 0x20));
                            *(undefined1 (*) [32])(local_a90.ray + 0x1a0) = auVar128;
                            auVar128 = vmaskmovps_avx(auVar139,*(undefined1 (*) [32])
                                                                (local_a90.hit + 0x40));
                            *(undefined1 (*) [32])(local_a90.ray + 0x1c0) = auVar128;
                            auVar128 = vmaskmovps_avx(auVar139,*(undefined1 (*) [32])
                                                                (local_a90.hit + 0x60));
                            *(undefined1 (*) [32])(local_a90.ray + 0x1e0) = auVar128;
                            auVar128 = vmaskmovps_avx(auVar139,*(undefined1 (*) [32])
                                                                (local_a90.hit + 0x80));
                            *(undefined1 (*) [32])(local_a90.ray + 0x200) = auVar128;
                            auVar128 = vmaskmovps_avx(auVar139,*(undefined1 (*) [32])
                                                                (local_a90.hit + 0xa0));
                            *(undefined1 (*) [32])(local_a90.ray + 0x220) = auVar128;
                            auVar128 = vmaskmovps_avx(auVar139,*(undefined1 (*) [32])
                                                                (local_a90.hit + 0xc0));
                            *(undefined1 (*) [32])(local_a90.ray + 0x240) = auVar128;
                            auVar128 = vmaskmovps_avx(auVar139,*(undefined1 (*) [32])
                                                                (local_a90.hit + 0xe0));
                            *(undefined1 (*) [32])(local_a90.ray + 0x260) = auVar128;
                            auVar128 = vmaskmovps_avx(auVar139,*(undefined1 (*) [32])
                                                                (local_a90.hit + 0x100));
                            *(undefined1 (*) [32])(local_a90.ray + 0x280) = auVar128;
                          }
                        }
                        auVar410 = ZEXT464((uint)local_c80);
                        if ((((((((auVar139 >> 0x1f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0 &&
                                 (auVar139 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                 ) && (auVar139 >> 0x5f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) && SUB321(auVar139 >> 0x7f,0) == '\0')
                              && (auVar139 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0
                              ) && SUB321(auVar139 >> 0xbf,0) == '\0') &&
                            (auVar139 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                            -1 < auVar139[0x1f]) {
                          *(float *)(ray + k * 4 + 0x100) = fVar228;
                        }
                      }
                    }
                  }
                }
                auVar403 = ZEXT464((uint)fVar230);
                bVar115 = lVar111 != 0;
                lVar111 = lVar111 + -1;
              } while ((!bVar84) && (bVar115));
              uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar140._4_4_ = uVar1;
              auVar140._0_4_ = uVar1;
              auVar140._8_4_ = uVar1;
              auVar140._12_4_ = uVar1;
              auVar140._16_4_ = uVar1;
              auVar140._20_4_ = uVar1;
              auVar140._24_4_ = uVar1;
              auVar140._28_4_ = uVar1;
              auVar136 = vcmpps_avx(_local_8e0,auVar140,2);
              auVar128 = vandps_avx(auVar136,local_780);
              auVar136 = local_780 & auVar136;
              uVar113 = local_7c0;
              local_780 = auVar128;
            } while ((((((((auVar136 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar136 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar136 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar136 >> 0x7f,0) != '\0') ||
                       (auVar136 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar136 >> 0xbf,0) != '\0') ||
                     (auVar136 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar136[0x1f] < '\0');
          }
          auVar141._0_4_ =
               (float)local_900._0_4_ * (float)local_860._0_4_ +
               (float)local_920._0_4_ * (float)local_880._0_4_ +
               (float)local_7e0._0_4_ * (float)local_8a0._0_4_;
          auVar141._4_4_ =
               (float)local_900._4_4_ * (float)local_860._4_4_ +
               (float)local_920._4_4_ * (float)local_880._4_4_ +
               (float)local_7e0._4_4_ * (float)local_8a0._4_4_;
          auVar141._8_4_ =
               fStack_8f8 * fStack_858 + fStack_918 * fStack_878 + fStack_7d8 * fStack_898;
          auVar141._12_4_ =
               fStack_8f4 * fStack_854 + fStack_914 * fStack_874 + fStack_7d4 * fStack_894;
          auVar141._16_4_ =
               fStack_8f0 * fStack_850 + fStack_910 * fStack_870 + fStack_7d0 * fStack_890;
          auVar141._20_4_ =
               fStack_8ec * fStack_84c + fStack_90c * fStack_86c + fStack_7cc * fStack_88c;
          auVar141._24_4_ =
               fStack_8e8 * fStack_848 + fStack_908 * fStack_868 + fStack_7c8 * fStack_888;
          auVar141._28_4_ = fStack_8e4 + fStack_904 + fStack_7c4;
          auVar174._8_4_ = 0x7fffffff;
          auVar174._0_8_ = 0x7fffffff7fffffff;
          auVar174._12_4_ = 0x7fffffff;
          auVar174._16_4_ = 0x7fffffff;
          auVar174._20_4_ = 0x7fffffff;
          auVar174._24_4_ = 0x7fffffff;
          auVar174._28_4_ = 0x7fffffff;
          auVar128 = vandps_avx(auVar141,auVar174);
          auVar175._8_4_ = 0x3e99999a;
          auVar175._0_8_ = 0x3e99999a3e99999a;
          auVar175._12_4_ = 0x3e99999a;
          auVar175._16_4_ = 0x3e99999a;
          auVar175._20_4_ = 0x3e99999a;
          auVar175._24_4_ = 0x3e99999a;
          auVar175._28_4_ = 0x3e99999a;
          auVar128 = vcmpps_avx(auVar128,auVar175,1);
          auVar136 = vorps_avx(auVar128,local_740);
          auVar176._0_4_ = local_8c0._0_4_ + (float)local_a00._0_4_;
          auVar176._4_4_ = local_8c0._4_4_ + (float)local_a00._4_4_;
          auVar176._8_4_ = local_8c0._8_4_ + fStack_9f8;
          auVar176._12_4_ = local_8c0._12_4_ + fStack_9f4;
          auVar176._16_4_ = local_8c0._16_4_ + fStack_9f0;
          auVar176._20_4_ = local_8c0._20_4_ + fStack_9ec;
          auVar176._24_4_ = local_8c0._24_4_ + fStack_9e8;
          auVar176._28_4_ = local_8c0._28_4_ + fStack_9e4;
          uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar209._4_4_ = uVar1;
          auVar209._0_4_ = uVar1;
          auVar209._8_4_ = uVar1;
          auVar209._12_4_ = uVar1;
          auVar209._16_4_ = uVar1;
          auVar209._20_4_ = uVar1;
          auVar209._24_4_ = uVar1;
          auVar209._28_4_ = uVar1;
          auVar128 = vcmpps_avx(auVar176,auVar209,2);
          _local_900 = vandps_avx(auVar128,local_700);
          auVar177._8_4_ = 3;
          auVar177._0_8_ = 0x300000003;
          auVar177._12_4_ = 3;
          auVar177._16_4_ = 3;
          auVar177._20_4_ = 3;
          auVar177._24_4_ = 3;
          auVar177._28_4_ = 3;
          auVar210._8_4_ = 2;
          auVar210._0_8_ = 0x200000002;
          auVar210._12_4_ = 2;
          auVar210._16_4_ = 2;
          auVar210._20_4_ = 2;
          auVar210._24_4_ = 2;
          auVar210._28_4_ = 2;
          auVar128 = vblendvps_avx(auVar210,auVar177,auVar136);
          auVar236 = vpcmpgtd_avx(auVar128._16_16_,local_800);
          auVar214 = vpshufd_avx(local_720._0_16_,0);
          auVar214 = vpcmpgtd_avx(auVar128._0_16_,auVar214);
          auVar178._16_16_ = auVar236;
          auVar178._0_16_ = auVar214;
          _local_920 = vblendps_avx(ZEXT1632(auVar214),auVar178,0xf0);
          auVar128 = vandnps_avx(_local_920,_local_900);
          auVar136 = _local_900 & ~_local_920;
          if ((((((((auVar136 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar136 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar136 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar136 >> 0x7f,0) != '\0') ||
                (auVar136 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar136 >> 0xbf,0) != '\0') ||
              (auVar136 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar136[0x1f] < '\0') {
            local_8c0 = _local_2e0;
            local_8e0._4_4_ = (float)local_2e0._4_4_ + (float)local_a00._4_4_;
            local_8e0._0_4_ = (float)local_2e0._0_4_ + (float)local_a00._0_4_;
            fStack_8d8 = fStack_2d8 + fStack_9f8;
            fStack_8d4 = fStack_2d4 + fStack_9f4;
            fStack_8d0 = fStack_2d0 + fStack_9f0;
            fStack_8cc = fStack_2cc + fStack_9ec;
            fStack_8c8 = fStack_2c8 + fStack_9e8;
            fStack_8c4 = fStack_2c4 + fStack_9e4;
            do {
              auVar240 = auVar290._0_16_;
              auVar179._8_4_ = 0x7f800000;
              auVar179._0_8_ = 0x7f8000007f800000;
              auVar179._12_4_ = 0x7f800000;
              auVar179._16_4_ = 0x7f800000;
              auVar179._20_4_ = 0x7f800000;
              auVar179._24_4_ = 0x7f800000;
              auVar179._28_4_ = 0x7f800000;
              auVar136 = vblendvps_avx(auVar179,local_8c0,auVar128);
              auVar12 = vshufps_avx(auVar136,auVar136,0xb1);
              auVar12 = vminps_avx(auVar136,auVar12);
              auVar13 = vshufpd_avx(auVar12,auVar12,5);
              auVar12 = vminps_avx(auVar12,auVar13);
              auVar13 = vperm2f128_avx(auVar12,auVar12,1);
              auVar12 = vminps_avx(auVar12,auVar13);
              auVar12 = vcmpps_avx(auVar136,auVar12,0);
              auVar13 = auVar128 & auVar12;
              auVar136 = auVar128;
              if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar13 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar13 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar13 >> 0x7f,0) != '\0') ||
                    (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar13 >> 0xbf,0) != '\0') ||
                  (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar13[0x1f] < '\0') {
                auVar136 = vandps_avx(auVar12,auVar128);
              }
              uVar110 = vmovmskps_avx(auVar136);
              uVar10 = 0;
              if (uVar110 != 0) {
                for (; (uVar110 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
                }
              }
              uVar113 = (ulong)uVar10;
              local_7a0 = auVar128;
              *(undefined4 *)(local_7a0 + uVar113 * 4) = 0;
              fVar228 = local_6a0[uVar113];
              uVar10 = *(uint *)(local_2c0 + uVar113 * 4);
              fVar229 = auVar18._0_4_;
              if ((float)local_980._0_4_ < 0.0) {
                fVar229 = sqrtf((float)local_980._0_4_);
                auVar240._8_4_ = 0x7fffffff;
                auVar240._0_8_ = 0x7fffffff7fffffff;
                auVar240._12_4_ = 0x7fffffff;
              }
              auVar410 = ZEXT464(uVar10);
              auVar403 = ZEXT464((uint)fVar228);
              auVar214 = vminps_avx(_local_aa0,_local_ac0);
              auVar236 = vmaxps_avx(_local_aa0,_local_ac0);
              auVar156 = vminps_avx(_local_ab0,_local_ad0);
              auVar120 = vminps_avx(auVar214,auVar156);
              auVar214 = vmaxps_avx(_local_ab0,_local_ad0);
              auVar156 = vmaxps_avx(auVar236,auVar214);
              auVar236 = vandps_avx(auVar120,auVar240);
              auVar214 = vandps_avx(auVar156,auVar240);
              auVar236 = vmaxps_avx(auVar236,auVar214);
              auVar214 = vmovshdup_avx(auVar236);
              auVar214 = vmaxss_avx(auVar214,auVar236);
              auVar236 = vshufpd_avx(auVar236,auVar236,1);
              auVar236 = vmaxss_avx(auVar236,auVar214);
              local_a60._0_4_ = auVar236._0_4_ * 1.9073486e-06;
              local_820._0_4_ = fVar229 * 1.9073486e-06;
              local_840._0_16_ = vshufps_avx(auVar156,auVar156,0xff);
              lVar111 = 4;
              do {
                auVar236 = vshufps_avx(auVar410._0_16_,auVar410._0_16_,0);
                auVar124._0_4_ = auVar236._0_4_ * (float)local_970._0_4_ + 0.0;
                auVar124._4_4_ = auVar236._4_4_ * (float)local_970._4_4_ + 0.0;
                auVar124._8_4_ = auVar236._8_4_ * fStack_968 + 0.0;
                auVar124._12_4_ = auVar236._12_4_ * fStack_964 + 0.0;
                fVar230 = auVar403._0_4_;
                fVar229 = 1.0 - fVar230;
                fVar228 = fVar230 * 3.0;
                auVar236 = ZEXT416((uint)(fVar230 * fVar230 * -fVar229 * 0.5));
                auVar236 = vshufps_avx(auVar236,auVar236,0);
                auVar214 = ZEXT416((uint)((fVar229 * fVar229 * (fVar229 * 3.0 + -5.0) + 2.0) * 0.5))
                ;
                auVar214 = vshufps_avx(auVar214,auVar214,0);
                auVar156 = ZEXT416((uint)((fVar230 * fVar230 * (fVar228 + -5.0) + 2.0) * 0.5));
                auVar156 = vshufps_avx(auVar156,auVar156,0);
                auVar120 = ZEXT416((uint)(fVar229 * fVar229 * -fVar230 * 0.5));
                auVar120 = vshufps_avx(auVar120,auVar120,0);
                auVar198._0_4_ =
                     auVar120._0_4_ * (float)local_aa0._0_4_ +
                     auVar156._0_4_ * (float)local_ac0._0_4_ +
                     auVar214._0_4_ * (float)local_ab0._0_4_ +
                     auVar236._0_4_ * (float)local_ad0._0_4_;
                auVar198._4_4_ =
                     auVar120._4_4_ * (float)local_aa0._4_4_ +
                     auVar156._4_4_ * (float)local_ac0._4_4_ +
                     auVar214._4_4_ * (float)local_ab0._4_4_ +
                     auVar236._4_4_ * (float)local_ad0._4_4_;
                auVar198._8_4_ =
                     auVar120._8_4_ * fStack_a98 +
                     auVar156._8_4_ * fStack_ab8 +
                     auVar214._8_4_ * fStack_aa8 + auVar236._8_4_ * fStack_ac8;
                auVar198._12_4_ =
                     auVar120._12_4_ * fStack_a94 +
                     auVar156._12_4_ * fStack_ab4 +
                     auVar214._12_4_ * fStack_aa4 + auVar236._12_4_ * fStack_ac4;
                local_960._0_16_ = auVar198;
                auVar214 = vsubps_avx(auVar124,auVar198);
                auVar236 = vdpps_avx(auVar214,auVar214,0x7f);
                fVar231 = auVar236._0_4_;
                local_c80 = auVar410._0_4_;
                if (fVar231 < 0.0) {
                  local_9a0._0_4_ = fVar228;
                  local_9c0._0_4_ = fVar230 * 9.0;
                  local_9e0._0_4_ = fVar229 * -2.0;
                  fVar232 = sqrtf(fVar231);
                  fVar249 = (float)local_9c0._0_4_;
                  fVar233 = (float)local_9e0._0_4_;
                  fVar234 = (float)local_9a0._0_4_;
                }
                else {
                  auVar156 = vsqrtss_avx(auVar236,auVar236);
                  fVar232 = auVar156._0_4_;
                  fVar249 = fVar230 * 9.0;
                  fVar233 = fVar229 * -2.0;
                  fVar234 = fVar228;
                }
                auVar156 = ZEXT416((uint)((fVar230 * fVar230 + fVar233 * fVar230) * 0.5));
                auVar156 = vshufps_avx(auVar156,auVar156,0);
                auVar120 = ZEXT416((uint)(((fVar229 + fVar229) * (fVar234 + 2.0) +
                                          fVar229 * fVar229 * -3.0) * 0.5));
                auVar120 = vshufps_avx(auVar120,auVar120,0);
                auVar194 = ZEXT416((uint)(((fVar230 + fVar230) * (fVar228 + -5.0) +
                                          fVar230 * fVar234) * 0.5));
                auVar194 = vshufps_avx(auVar194,auVar194,0);
                auVar152 = ZEXT416((uint)((fVar230 * (fVar229 + fVar229) - fVar229 * fVar229) * 0.5)
                                  );
                auVar152 = vshufps_avx(auVar152,auVar152,0);
                auVar426._0_4_ =
                     (float)local_aa0._0_4_ * auVar152._0_4_ +
                     (float)local_ac0._0_4_ * auVar194._0_4_ +
                     (float)local_ad0._0_4_ * auVar156._0_4_ +
                     (float)local_ab0._0_4_ * auVar120._0_4_;
                auVar426._4_4_ =
                     (float)local_aa0._4_4_ * auVar152._4_4_ +
                     (float)local_ac0._4_4_ * auVar194._4_4_ +
                     (float)local_ad0._4_4_ * auVar156._4_4_ +
                     (float)local_ab0._4_4_ * auVar120._4_4_;
                auVar426._8_4_ =
                     fStack_a98 * auVar152._8_4_ +
                     fStack_ab8 * auVar194._8_4_ +
                     fStack_ac8 * auVar156._8_4_ + fStack_aa8 * auVar120._8_4_;
                auVar426._12_4_ =
                     fStack_a94 * auVar152._12_4_ +
                     fStack_ab4 * auVar194._12_4_ +
                     fStack_ac4 * auVar156._12_4_ + fStack_aa4 * auVar120._12_4_;
                auVar152 = vpermilps_avx(ZEXT416((uint)(fVar228 + -1.0)),0);
                auVar155 = vpermilps_avx(ZEXT416((uint)(fVar230 * -9.0 + 4.0)),0);
                auVar156 = vshufps_avx(ZEXT416((uint)(fVar249 + -5.0)),
                                       ZEXT416((uint)(fVar249 + -5.0)),0);
                auVar120 = ZEXT416((uint)(fVar230 * -3.0 + 2.0));
                auVar194 = vshufps_avx(auVar120,auVar120,0);
                auVar120 = vdpps_avx(auVar426,auVar426,0x7f);
                auVar159._0_4_ =
                     (float)local_aa0._0_4_ * auVar194._0_4_ +
                     (float)local_ac0._0_4_ * auVar156._0_4_ +
                     (float)local_ab0._0_4_ * auVar155._0_4_ +
                     (float)local_ad0._0_4_ * auVar152._0_4_;
                auVar159._4_4_ =
                     (float)local_aa0._4_4_ * auVar194._4_4_ +
                     (float)local_ac0._4_4_ * auVar156._4_4_ +
                     (float)local_ab0._4_4_ * auVar155._4_4_ +
                     (float)local_ad0._4_4_ * auVar152._4_4_;
                auVar159._8_4_ =
                     fStack_a98 * auVar194._8_4_ +
                     fStack_ab8 * auVar156._8_4_ +
                     fStack_aa8 * auVar155._8_4_ + fStack_ac8 * auVar152._8_4_;
                auVar159._12_4_ =
                     fStack_a94 * auVar194._12_4_ +
                     fStack_ab4 * auVar156._12_4_ +
                     fStack_aa4 * auVar155._12_4_ + fStack_ac4 * auVar152._12_4_;
                auVar156 = vblendps_avx(auVar120,_DAT_01feba10,0xe);
                auVar194 = vrsqrtss_avx(auVar156,auVar156);
                fVar229 = auVar194._0_4_;
                fVar228 = auVar120._0_4_;
                auVar194 = vdpps_avx(auVar426,auVar159,0x7f);
                auVar152 = vshufps_avx(auVar120,auVar120,0);
                auVar160._0_4_ = auVar159._0_4_ * auVar152._0_4_;
                auVar160._4_4_ = auVar159._4_4_ * auVar152._4_4_;
                auVar160._8_4_ = auVar159._8_4_ * auVar152._8_4_;
                auVar160._12_4_ = auVar159._12_4_ * auVar152._12_4_;
                auVar194 = vshufps_avx(auVar194,auVar194,0);
                auVar241._0_4_ = auVar426._0_4_ * auVar194._0_4_;
                auVar241._4_4_ = auVar426._4_4_ * auVar194._4_4_;
                auVar241._8_4_ = auVar426._8_4_ * auVar194._8_4_;
                auVar241._12_4_ = auVar426._12_4_ * auVar194._12_4_;
                auVar155 = vsubps_avx(auVar160,auVar241);
                auVar194 = vrcpss_avx(auVar156,auVar156);
                auVar156 = vmaxss_avx(ZEXT416((uint)local_a60._0_4_),
                                      ZEXT416((uint)(local_c80 * (float)local_820._0_4_)));
                auVar397 = ZEXT1664(auVar156);
                auVar194 = ZEXT416((uint)(auVar194._0_4_ * (2.0 - fVar228 * auVar194._0_4_)));
                auVar194 = vshufps_avx(auVar194,auVar194,0);
                uVar113 = CONCAT44(auVar426._4_4_,auVar426._0_4_);
                auVar261._0_8_ = uVar113 ^ 0x8000000080000000;
                auVar261._8_4_ = -auVar426._8_4_;
                auVar261._12_4_ = -auVar426._12_4_;
                auVar152 = ZEXT416((uint)(fVar229 * 1.5 +
                                         fVar228 * -0.5 * fVar229 * fVar229 * fVar229));
                auVar152 = vshufps_avx(auVar152,auVar152,0);
                auVar217._0_4_ = auVar152._0_4_ * auVar155._0_4_ * auVar194._0_4_;
                auVar217._4_4_ = auVar152._4_4_ * auVar155._4_4_ * auVar194._4_4_;
                auVar217._8_4_ = auVar152._8_4_ * auVar155._8_4_ * auVar194._8_4_;
                auVar217._12_4_ = auVar152._12_4_ * auVar155._12_4_ * auVar194._12_4_;
                auVar283._0_4_ = auVar426._0_4_ * auVar152._0_4_;
                auVar283._4_4_ = auVar426._4_4_ * auVar152._4_4_;
                auVar283._8_4_ = auVar426._8_4_ * auVar152._8_4_;
                auVar283._12_4_ = auVar426._12_4_ * auVar152._12_4_;
                if (fVar228 < 0.0) {
                  fVar228 = sqrtf(fVar228);
                  auVar397 = ZEXT464(auVar156._0_4_);
                }
                else {
                  auVar120 = vsqrtss_avx(auVar120,auVar120);
                  fVar228 = auVar120._0_4_;
                }
                auVar120 = vdpps_avx(auVar214,auVar283,0x7f);
                fVar228 = ((float)local_a60._0_4_ / fVar228) * (fVar232 + 1.0) +
                          auVar397._0_4_ + fVar232 * (float)local_a60._0_4_;
                auVar194 = vdpps_avx(auVar261,auVar283,0x7f);
                auVar152 = vdpps_avx(auVar214,auVar217,0x7f);
                auVar155 = vdpps_avx(_local_970,auVar283,0x7f);
                auVar3 = vdpps_avx(auVar214,auVar261,0x7f);
                fVar229 = auVar194._0_4_ + auVar152._0_4_;
                fVar232 = auVar120._0_4_;
                auVar125._0_4_ = fVar232 * fVar232;
                auVar125._4_4_ = auVar120._4_4_ * auVar120._4_4_;
                auVar125._8_4_ = auVar120._8_4_ * auVar120._8_4_;
                auVar125._12_4_ = auVar120._12_4_ * auVar120._12_4_;
                auVar152 = vsubps_avx(auVar236,auVar125);
                auVar194 = vdpps_avx(auVar214,_local_970,0x7f);
                fVar233 = auVar3._0_4_ - fVar232 * fVar229;
                fVar234 = auVar194._0_4_ - fVar232 * auVar155._0_4_;
                auVar194 = vrsqrtss_avx(auVar152,auVar152);
                fVar249 = auVar152._0_4_;
                fVar232 = auVar194._0_4_;
                fVar232 = fVar232 * 1.5 + fVar249 * -0.5 * fVar232 * fVar232 * fVar232;
                if (fVar249 < 0.0) {
                  local_9a0._0_4_ = fVar233;
                  local_9c0._0_4_ = fVar234;
                  local_9e0._0_4_ = fVar232;
                  fVar249 = sqrtf(fVar249);
                  auVar397 = ZEXT464(auVar156._0_4_);
                  fVar232 = (float)local_9e0._0_4_;
                  fVar233 = (float)local_9a0._0_4_;
                  fVar234 = (float)local_9c0._0_4_;
                }
                else {
                  auVar156 = vsqrtss_avx(auVar152,auVar152);
                  fVar249 = auVar156._0_4_;
                }
                auVar431 = ZEXT1664(auVar120);
                auVar335 = ZEXT1664(auVar236);
                auVar194 = vpermilps_avx(local_960._0_16_,0xff);
                auVar3 = vshufps_avx(auVar426,auVar426,0xff);
                fVar233 = fVar233 * fVar232 - auVar3._0_4_;
                auVar242._0_8_ = auVar155._0_8_ ^ 0x8000000080000000;
                auVar242._8_4_ = auVar155._8_4_ ^ 0x80000000;
                auVar242._12_4_ = auVar155._12_4_ ^ 0x80000000;
                auVar262._0_4_ = -fVar233;
                auVar262._4_4_ = 0x80000000;
                auVar262._8_4_ = 0x80000000;
                auVar262._12_4_ = 0x80000000;
                auVar156 = vinsertps_avx(ZEXT416((uint)(fVar234 * fVar232)),auVar242,0x10);
                auVar152 = vmovsldup_avx(ZEXT416((uint)(fVar229 * fVar234 * fVar232 -
                                                       auVar155._0_4_ * fVar233)));
                auVar156 = vdivps_avx(auVar156,auVar152);
                auVar155 = ZEXT416((uint)(fVar249 - auVar194._0_4_));
                auVar194 = vinsertps_avx(auVar120,auVar155,0x10);
                auVar218._0_4_ = auVar194._0_4_ * auVar156._0_4_;
                auVar218._4_4_ = auVar194._4_4_ * auVar156._4_4_;
                auVar218._8_4_ = auVar194._8_4_ * auVar156._8_4_;
                auVar218._12_4_ = auVar194._12_4_ * auVar156._12_4_;
                auVar156 = vinsertps_avx(auVar262,ZEXT416((uint)fVar229),0x1c);
                auVar156 = vdivps_avx(auVar156,auVar152);
                auVar199._0_4_ = auVar194._0_4_ * auVar156._0_4_;
                auVar199._4_4_ = auVar194._4_4_ * auVar156._4_4_;
                auVar199._8_4_ = auVar194._8_4_ * auVar156._8_4_;
                auVar199._12_4_ = auVar194._12_4_ * auVar156._12_4_;
                auVar156 = vhaddps_avx(auVar218,auVar218);
                auVar194 = vhaddps_avx(auVar199,auVar199);
                fVar230 = fVar230 - auVar156._0_4_;
                local_c80 = local_c80 - auVar194._0_4_;
                auVar410 = ZEXT464((uint)local_c80);
                auVar243._8_4_ = 0x7fffffff;
                auVar243._0_8_ = 0x7fffffff7fffffff;
                auVar243._12_4_ = 0x7fffffff;
                auVar290 = ZEXT1664(auVar243);
                auVar156 = vandps_avx(auVar120,auVar243);
                if (fVar228 <= auVar156._0_4_) {
LAB_01154314:
                  bVar84 = false;
                }
                else {
                  auVar156 = vandps_avx(auVar155,auVar243);
                  if ((float)local_840._0_4_ * 1.9073486e-06 + auVar397._0_4_ + fVar228 <=
                      auVar156._0_4_) goto LAB_01154314;
                  local_c80 = local_c80 + (float)local_940._0_4_;
                  auVar410 = ZEXT464((uint)local_c80);
                  bVar84 = true;
                  if ((((fVar212 <= local_c80) &&
                       (fVar228 = *(float *)(ray + k * 4 + 0x100), local_c80 <= fVar228)) &&
                      (0.0 <= fVar230)) && (fVar230 <= 1.0)) {
                    auVar156 = vrsqrtss_avx(auVar236,auVar236);
                    fVar229 = auVar156._0_4_;
                    pGVar7 = (context->scene->geometries).items[uVar108].ptr;
                    if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                      auVar156 = ZEXT416((uint)(fVar229 * 1.5 +
                                               fVar231 * -0.5 * fVar229 * fVar229 * fVar229));
                      auVar156 = vshufps_avx(auVar156,auVar156,0);
                      local_c00._0_4_ = auVar214._0_4_;
                      local_c00._4_4_ = auVar214._4_4_;
                      fStack_bf8 = auVar214._8_4_;
                      fStack_bf4 = auVar214._12_4_;
                      auVar161._0_4_ = auVar156._0_4_ * (float)local_c00._0_4_;
                      auVar161._4_4_ = auVar156._4_4_ * (float)local_c00._4_4_;
                      auVar161._8_4_ = auVar156._8_4_ * fStack_bf8;
                      auVar161._12_4_ = auVar156._12_4_ * fStack_bf4;
                      auVar126._0_4_ = auVar426._0_4_ + auVar3._0_4_ * auVar161._0_4_;
                      auVar126._4_4_ = auVar426._4_4_ + auVar3._4_4_ * auVar161._4_4_;
                      auVar126._8_4_ = auVar426._8_4_ + auVar3._8_4_ * auVar161._8_4_;
                      auVar126._12_4_ = auVar426._12_4_ + auVar3._12_4_ * auVar161._12_4_;
                      auVar214 = vshufps_avx(auVar161,auVar161,0xc9);
                      auVar156 = vshufps_avx(auVar426,auVar426,0xc9);
                      auVar162._0_4_ = auVar156._0_4_ * auVar161._0_4_;
                      auVar162._4_4_ = auVar156._4_4_ * auVar161._4_4_;
                      auVar162._8_4_ = auVar156._8_4_ * auVar161._8_4_;
                      auVar162._12_4_ = auVar156._12_4_ * auVar161._12_4_;
                      auVar200._0_4_ = auVar426._0_4_ * auVar214._0_4_;
                      auVar200._4_4_ = auVar426._4_4_ * auVar214._4_4_;
                      auVar200._8_4_ = auVar426._8_4_ * auVar214._8_4_;
                      auVar200._12_4_ = auVar426._12_4_ * auVar214._12_4_;
                      auVar194 = vsubps_avx(auVar200,auVar162);
                      auVar214 = vshufps_avx(auVar194,auVar194,0xc9);
                      auVar156 = vshufps_avx(auVar126,auVar126,0xc9);
                      auVar201._0_4_ = auVar156._0_4_ * auVar214._0_4_;
                      auVar201._4_4_ = auVar156._4_4_ * auVar214._4_4_;
                      auVar201._8_4_ = auVar156._8_4_ * auVar214._8_4_;
                      auVar201._12_4_ = auVar156._12_4_ * auVar214._12_4_;
                      auVar214 = vshufps_avx(auVar194,auVar194,0xd2);
                      auVar127._0_4_ = auVar126._0_4_ * auVar214._0_4_;
                      auVar127._4_4_ = auVar126._4_4_ * auVar214._4_4_;
                      auVar127._8_4_ = auVar126._8_4_ * auVar214._8_4_;
                      auVar127._12_4_ = auVar126._12_4_ * auVar214._12_4_;
                      auVar214 = vsubps_avx(auVar201,auVar127);
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x100) = local_c80;
                        uVar1 = vextractps_avx(auVar214,1);
                        *(undefined4 *)(ray + k * 4 + 0x180) = uVar1;
                        uVar1 = vextractps_avx(auVar214,2);
                        *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar1;
                        *(int *)(ray + k * 4 + 0x1c0) = auVar214._0_4_;
                        *(float *)(ray + k * 4 + 0x1e0) = fVar230;
                        *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                        *(uint *)(ray + k * 4 + 0x220) = uVar109;
                        *(uint *)(ray + k * 4 + 0x240) = uVar108;
                        *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                      }
                      else {
                        pRVar9 = context->user;
                        auStack_5f0 = vshufps_avx(ZEXT416((uint)fVar230),ZEXT416((uint)fVar230),0);
                        auStack_650 = vshufps_avx(auVar214,auVar214,0x55);
                        auStack_630 = vshufps_avx(auVar214,auVar214,0xaa);
                        auStack_610 = vshufps_avx(auVar214,auVar214,0);
                        local_660 = (RTCHitN  [16])auStack_650;
                        local_640 = auStack_630;
                        local_620 = auStack_610;
                        local_600 = auStack_5f0;
                        local_5e0 = ZEXT832(0) << 0x20;
                        local_5c0 = local_500._0_8_;
                        uStack_5b8 = local_500._8_8_;
                        uStack_5b0 = local_500._16_8_;
                        uStack_5a8 = local_500._24_8_;
                        local_5a0 = local_4e0._0_8_;
                        uStack_598 = local_4e0._8_8_;
                        uStack_590 = local_4e0._16_8_;
                        uStack_588 = local_4e0._24_8_;
                        local_a28[1] = local_a20;
                        *local_a28 = local_a20;
                        local_580 = pRVar9->instID[0];
                        uStack_57c = local_580;
                        uStack_578 = local_580;
                        uStack_574 = local_580;
                        uStack_570 = local_580;
                        uStack_56c = local_580;
                        uStack_568 = local_580;
                        uStack_564 = local_580;
                        local_560 = pRVar9->instPrimID[0];
                        uStack_55c = local_560;
                        uStack_558 = local_560;
                        uStack_554 = local_560;
                        uStack_550 = local_560;
                        uStack_54c = local_560;
                        uStack_548 = local_560;
                        uStack_544 = local_560;
                        *(float *)(ray + k * 4 + 0x100) = local_c80;
                        local_b00 = *local_a30;
                        uStack_af8 = local_a30[1];
                        local_af0 = *local_a38;
                        uStack_ae8 = local_a38[1];
                        local_a90.valid = (int *)&local_b00;
                        local_a90.geometryUserPtr = pGVar7->userPtr;
                        local_a90.context = context->user;
                        local_a90.hit = local_660;
                        local_a90.N = 8;
                        local_a90.ray = (RTCRayN *)ray;
                        if (pGVar7->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar335 = ZEXT1664(auVar236);
                          auVar397 = ZEXT1664(auVar397._0_16_);
                          auVar431 = ZEXT1664(auVar120);
                          (*pGVar7->intersectionFilterN)(&local_a90);
                        }
                        auVar100._8_8_ = uStack_af8;
                        auVar100._0_8_ = local_b00;
                        auVar236 = vpcmpeqd_avx((undefined1  [16])0x0,auVar100);
                        auVar104._8_8_ = uStack_ae8;
                        auVar104._0_8_ = local_af0;
                        auVar214 = vpcmpeqd_avx((undefined1  [16])0x0,auVar104);
                        auVar142._16_16_ = auVar214;
                        auVar142._0_16_ = auVar236;
                        auVar128 = local_a20 & ~auVar142;
                        if ((((((((auVar128 >> 0x1f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0 &&
                                 (auVar128 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                 ) && (auVar128 >> 0x5f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) && SUB321(auVar128 >> 0x7f,0) == '\0')
                              && (auVar128 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0
                              ) && SUB321(auVar128 >> 0xbf,0) == '\0') &&
                            (auVar128 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                            -1 < auVar128[0x1f]) {
                          auVar143._0_4_ = auVar236._0_4_ ^ local_a20._0_4_;
                          auVar143._4_4_ = auVar236._4_4_ ^ local_a20._4_4_;
                          auVar143._8_4_ = auVar236._8_4_ ^ local_a20._8_4_;
                          auVar143._12_4_ = auVar236._12_4_ ^ local_a20._12_4_;
                          auVar143._16_4_ = auVar214._0_4_ ^ local_a20._16_4_;
                          auVar143._20_4_ = auVar214._4_4_ ^ local_a20._20_4_;
                          auVar143._24_4_ = auVar214._8_4_ ^ local_a20._24_4_;
                          auVar143._28_4_ = auVar214._12_4_ ^ local_a20._28_4_;
                          auVar290 = ZEXT1664(CONCAT412(0x7fffffff,
                                                        CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                        }
                        else {
                          p_Var8 = context->args->filter;
                          auVar290 = ZEXT1664(CONCAT412(0x7fffffff,
                                                        CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                          if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar335 = ZEXT1664(auVar335._0_16_);
                            auVar397 = ZEXT1664(auVar397._0_16_);
                            auVar431 = ZEXT1664(auVar431._0_16_);
                            (*p_Var8)(&local_a90);
                            auVar290 = ZEXT1664(CONCAT412(0x7fffffff,
                                                          CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                          }
                          auVar101._8_8_ = uStack_af8;
                          auVar101._0_8_ = local_b00;
                          auVar236 = vpcmpeqd_avx((undefined1  [16])0x0,auVar101);
                          auVar105._8_8_ = uStack_ae8;
                          auVar105._0_8_ = local_af0;
                          auVar214 = vpcmpeqd_avx((undefined1  [16])0x0,auVar105);
                          auVar180._16_16_ = auVar214;
                          auVar180._0_16_ = auVar236;
                          auVar143._0_4_ = auVar236._0_4_ ^ local_a20._0_4_;
                          auVar143._4_4_ = auVar236._4_4_ ^ local_a20._4_4_;
                          auVar143._8_4_ = auVar236._8_4_ ^ local_a20._8_4_;
                          auVar143._12_4_ = auVar236._12_4_ ^ local_a20._12_4_;
                          auVar143._16_4_ = auVar214._0_4_ ^ local_a20._16_4_;
                          auVar143._20_4_ = auVar214._4_4_ ^ local_a20._20_4_;
                          auVar143._24_4_ = auVar214._8_4_ ^ local_a20._24_4_;
                          auVar143._28_4_ = auVar214._12_4_ ^ local_a20._28_4_;
                          auVar128 = local_a20 & ~auVar180;
                          if ((((((((auVar128 >> 0x1f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0 ||
                                   (auVar128 >> 0x3f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar128 >> 0x5f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) || SUB321(auVar128 >> 0x7f,0) != '\0') ||
                                (auVar128 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0)
                               || SUB321(auVar128 >> 0xbf,0) != '\0') ||
                              (auVar128 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0)
                              || auVar128[0x1f] < '\0') {
                            auVar128 = vmaskmovps_avx(auVar143,*(undefined1 (*) [32])local_a90.hit);
                            *(undefined1 (*) [32])(local_a90.ray + 0x180) = auVar128;
                            auVar128 = vmaskmovps_avx(auVar143,*(undefined1 (*) [32])
                                                                (local_a90.hit + 0x20));
                            *(undefined1 (*) [32])(local_a90.ray + 0x1a0) = auVar128;
                            auVar128 = vmaskmovps_avx(auVar143,*(undefined1 (*) [32])
                                                                (local_a90.hit + 0x40));
                            *(undefined1 (*) [32])(local_a90.ray + 0x1c0) = auVar128;
                            auVar128 = vmaskmovps_avx(auVar143,*(undefined1 (*) [32])
                                                                (local_a90.hit + 0x60));
                            *(undefined1 (*) [32])(local_a90.ray + 0x1e0) = auVar128;
                            auVar128 = vmaskmovps_avx(auVar143,*(undefined1 (*) [32])
                                                                (local_a90.hit + 0x80));
                            *(undefined1 (*) [32])(local_a90.ray + 0x200) = auVar128;
                            auVar128 = vmaskmovps_avx(auVar143,*(undefined1 (*) [32])
                                                                (local_a90.hit + 0xa0));
                            *(undefined1 (*) [32])(local_a90.ray + 0x220) = auVar128;
                            auVar128 = vmaskmovps_avx(auVar143,*(undefined1 (*) [32])
                                                                (local_a90.hit + 0xc0));
                            *(undefined1 (*) [32])(local_a90.ray + 0x240) = auVar128;
                            auVar128 = vmaskmovps_avx(auVar143,*(undefined1 (*) [32])
                                                                (local_a90.hit + 0xe0));
                            *(undefined1 (*) [32])(local_a90.ray + 0x260) = auVar128;
                            auVar128 = vmaskmovps_avx(auVar143,*(undefined1 (*) [32])
                                                                (local_a90.hit + 0x100));
                            *(undefined1 (*) [32])(local_a90.ray + 0x280) = auVar128;
                          }
                        }
                        auVar410 = ZEXT464((uint)local_c80);
                        if ((((((((auVar143 >> 0x1f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0 &&
                                 (auVar143 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                 ) && (auVar143 >> 0x5f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) && SUB321(auVar143 >> 0x7f,0) == '\0')
                              && (auVar143 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0
                              ) && SUB321(auVar143 >> 0xbf,0) == '\0') &&
                            (auVar143 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                            -1 < auVar143[0x1f]) {
                          *(float *)(ray + k * 4 + 0x100) = fVar228;
                        }
                      }
                    }
                  }
                }
                auVar403 = ZEXT464((uint)fVar230);
                bVar115 = lVar111 != 0;
                lVar111 = lVar111 + -1;
              } while ((!bVar84) && (bVar115));
              uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar144._4_4_ = uVar1;
              auVar144._0_4_ = uVar1;
              auVar144._8_4_ = uVar1;
              auVar144._12_4_ = uVar1;
              auVar144._16_4_ = uVar1;
              auVar144._20_4_ = uVar1;
              auVar144._24_4_ = uVar1;
              auVar144._28_4_ = uVar1;
              auVar136 = vcmpps_avx(_local_8e0,auVar144,2);
              auVar128 = vandps_avx(auVar136,local_7a0);
              local_7a0 = local_7a0 & auVar136;
              uVar113 = local_7c0;
            } while ((((((((local_7a0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (local_7a0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (local_7a0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(local_7a0 >> 0x7f,0) != '\0') ||
                       (local_7a0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(local_7a0 >> 0xbf,0) != '\0') ||
                     (local_7a0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     local_7a0[0x1f] < '\0');
          }
          auVar290 = ZEXT1664(local_ae0);
          auVar128 = vandps_avx(local_6e0,local_6c0);
          auVar136 = vandps_avx(_local_920,_local_900);
          auVar211._0_4_ = (float)local_a00._0_4_ + local_320._0_4_;
          auVar211._4_4_ = (float)local_a00._4_4_ + local_320._4_4_;
          auVar211._8_4_ = fStack_9f8 + local_320._8_4_;
          auVar211._12_4_ = fStack_9f4 + local_320._12_4_;
          auVar211._16_4_ = fStack_9f0 + local_320._16_4_;
          auVar211._20_4_ = fStack_9ec + local_320._20_4_;
          auVar211._24_4_ = fStack_9e8 + local_320._24_4_;
          auVar211._28_4_ = fStack_9e4 + local_320._28_4_;
          uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar248._4_4_ = uVar1;
          auVar248._0_4_ = uVar1;
          auVar248._8_4_ = uVar1;
          auVar248._12_4_ = uVar1;
          auVar248._16_4_ = uVar1;
          auVar248._20_4_ = uVar1;
          auVar248._24_4_ = uVar1;
          auVar248._28_4_ = uVar1;
          auVar12 = vcmpps_avx(auVar211,auVar248,2);
          auVar128 = vandps_avx(auVar12,auVar128);
          auVar270._0_4_ = (float)local_a00._0_4_ + local_2e0._0_4_;
          auVar270._4_4_ = (float)local_a00._4_4_ + local_2e0._4_4_;
          auVar270._8_4_ = fStack_9f8 + local_2e0._8_4_;
          auVar270._12_4_ = fStack_9f4 + local_2e0._12_4_;
          auVar270._16_4_ = fStack_9f0 + local_2e0._16_4_;
          auVar270._20_4_ = fStack_9ec + local_2e0._20_4_;
          auVar270._24_4_ = fStack_9e8 + local_2e0._24_4_;
          auVar270._28_4_ = fStack_9e4 + local_2e0._28_4_;
          auVar12 = vcmpps_avx(auVar270,auVar248,2);
          auVar136 = vandps_avx(auVar12,auVar136);
          auVar136 = vorps_avx(auVar128,auVar136);
          if ((((((((auVar136 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar136 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar136 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar136 >> 0x7f,0) != '\0') ||
                (auVar136 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar136 >> 0xbf,0) != '\0') ||
              (auVar136 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar136[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar112 * 0x60) = auVar136;
            auVar128 = vblendvps_avx(_local_2e0,_local_320,auVar128);
            *(undefined1 (*) [32])(auStack_160 + uVar112 * 0x60) = auVar128;
            uVar2 = vmovlps_avx(local_ae0);
            *(undefined8 *)(afStack_140 + uVar112 * 0x18) = uVar2;
            auStack_138[uVar112 * 0x18] = (int)uVar113 + 1;
            uVar112 = (ulong)((int)uVar112 + 1);
          }
          goto LAB_01152426;
        }
        auVar245._8_4_ = 0x3f800000;
        auVar245._0_8_ = &DAT_3f8000003f800000;
        auVar245._12_4_ = 0x3f800000;
        auVar245._16_4_ = 0x3f800000;
        auVar245._20_4_ = 0x3f800000;
        auVar245._24_4_ = 0x3f800000;
        auVar245._28_4_ = 0x3f800000;
      }
      auVar290 = ZEXT1664(local_ae0);
      fVar228 = fStack_9e4;
      fVar229 = fStack_9e8;
      fVar230 = fStack_9ec;
      fVar231 = fStack_9f0;
      fVar232 = fStack_9f4;
      fVar233 = fStack_9f8;
      fVar234 = (float)local_a00._4_4_;
      fVar249 = (float)local_a00._0_4_;
    }
    do {
      if ((int)uVar112 == 0) {
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar145._4_4_ = uVar1;
        auVar145._0_4_ = uVar1;
        auVar145._8_4_ = uVar1;
        auVar145._12_4_ = uVar1;
        auVar145._16_4_ = uVar1;
        auVar145._20_4_ = uVar1;
        auVar145._24_4_ = uVar1;
        auVar145._28_4_ = uVar1;
        auVar128 = vcmpps_avx(local_280,auVar145,2);
        uVar108 = vmovmskps_avx(auVar128);
        uVar108 = (uint)local_928 & uVar108;
        if (uVar108 == 0) {
          return;
        }
        goto LAB_0115189c;
      }
      uVar114 = (ulong)((int)uVar112 - 1);
      lVar111 = uVar114 * 0x60;
      auVar128 = *(undefined1 (*) [32])(auStack_160 + lVar111);
      auVar135._0_4_ = fVar249 + auVar128._0_4_;
      auVar135._4_4_ = fVar234 + auVar128._4_4_;
      auVar135._8_4_ = fVar233 + auVar128._8_4_;
      auVar135._12_4_ = fVar232 + auVar128._12_4_;
      auVar135._16_4_ = fVar231 + auVar128._16_4_;
      auVar135._20_4_ = fVar230 + auVar128._20_4_;
      auVar135._24_4_ = fVar229 + auVar128._24_4_;
      auVar135._28_4_ = fVar228 + auVar128._28_4_;
      uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar227._4_4_ = uVar1;
      auVar227._0_4_ = uVar1;
      auVar227._8_4_ = uVar1;
      auVar227._12_4_ = uVar1;
      auVar227._16_4_ = uVar1;
      auVar227._20_4_ = uVar1;
      auVar227._24_4_ = uVar1;
      auVar227._28_4_ = uVar1;
      auVar12 = vcmpps_avx(auVar135,auVar227,2);
      auVar136 = vandps_avx(auVar12,*(undefined1 (*) [32])(auStack_180 + lVar111));
      _local_660 = auVar136;
      auVar12 = *(undefined1 (*) [32])(auStack_180 + lVar111) & auVar12;
      bVar90 = (auVar12 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar91 = (auVar12 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar89 = (auVar12 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar88 = SUB321(auVar12 >> 0x7f,0) == '\0';
      bVar87 = (auVar12 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar86 = SUB321(auVar12 >> 0xbf,0) == '\0';
      bVar115 = (auVar12 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar84 = -1 < auVar12[0x1f];
      if (((((((!bVar90 || !bVar91) || !bVar89) || !bVar88) || !bVar87) || !bVar86) || !bVar115) ||
          !bVar84) {
        auVar207._8_4_ = 0x7f800000;
        auVar207._0_8_ = 0x7f8000007f800000;
        auVar207._12_4_ = 0x7f800000;
        auVar207._16_4_ = 0x7f800000;
        auVar207._20_4_ = 0x7f800000;
        auVar207._24_4_ = 0x7f800000;
        auVar207._28_4_ = 0x7f800000;
        auVar128 = vblendvps_avx(auVar207,auVar128,auVar136);
        auVar12 = vshufps_avx(auVar128,auVar128,0xb1);
        auVar12 = vminps_avx(auVar128,auVar12);
        auVar13 = vshufpd_avx(auVar12,auVar12,5);
        auVar12 = vminps_avx(auVar12,auVar13);
        auVar13 = vperm2f128_avx(auVar12,auVar12,1);
        auVar12 = vminps_avx(auVar12,auVar13);
        auVar128 = vcmpps_avx(auVar128,auVar12,0);
        auVar12 = auVar136 & auVar128;
        if ((((((((auVar12 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar12 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar12 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar12 >> 0x7f,0) != '\0') ||
              (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar12 >> 0xbf,0) != '\0') ||
            (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar12[0x1f] < '\0') {
          auVar136 = vandps_avx(auVar128,auVar136);
        }
        fVar250 = afStack_140[uVar114 * 0x18 + 1];
        uVar113 = (ulong)auStack_138[uVar114 * 0x18];
        uVar110 = vmovmskps_avx(auVar136);
        uVar10 = 0;
        if (uVar110 != 0) {
          for (; (uVar110 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
          }
        }
        fVar251 = afStack_140[uVar114 * 0x18];
        *(undefined4 *)(local_660 + (ulong)uVar10 * 4) = 0;
        if ((((((((_local_660 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (_local_660 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (_local_660 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(_local_660 >> 0x7f,0) != '\0') ||
              (_local_660 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(_local_660 >> 0xbf,0) != '\0') ||
            (_local_660 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            local_660[0x1f] < '\0') {
          uVar114 = uVar112;
        }
        *(undefined1 (*) [32])(auStack_180 + lVar111) = _local_660;
        auVar236 = vshufps_avx(ZEXT416((uint)(fVar250 - fVar251)),ZEXT416((uint)(fVar250 - fVar251))
                               ,0);
        local_320._4_4_ = fVar251 + auVar236._4_4_ * 0.14285715;
        local_320._0_4_ = fVar251 + auVar236._0_4_ * 0.0;
        fStack_318 = fVar251 + auVar236._8_4_ * 0.2857143;
        fStack_314 = fVar251 + auVar236._12_4_ * 0.42857146;
        fStack_310 = fVar251 + auVar236._0_4_ * 0.5714286;
        fStack_30c = fVar251 + auVar236._4_4_ * 0.71428573;
        fStack_308 = fVar251 + auVar236._8_4_ * 0.8571429;
        fStack_304 = fVar251 + auVar236._12_4_;
        auVar290 = ZEXT864(*(ulong *)(local_320 + (ulong)uVar10 * 4));
      }
      uVar112 = uVar114;
    } while (((((((bVar90 && bVar91) && bVar89) && bVar88) && bVar87) && bVar86) && bVar115) &&
             bVar84);
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }